

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_extrap_vel_to_faces_box.cpp
# Opt level: O1

void EBMOL::ExtrapVelToFacesBox
               (Box *ubx,Box *vbx,Box *wbx,Array4<double> *u,Array4<double> *v,Array4<double> *w,
               Array4<const_double> *vcc,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,Array4<const_double> *vfrac,Geometry *geom,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *d_bcrec)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar233 [12];
  undefined1 auVar234 [12];
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  pointer pBVar33;
  double *pdVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  EBCellFlag *pEVar39;
  long lVar40;
  long lVar41;
  double *pdVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  double *pdVar46;
  long lVar47;
  long lVar48;
  double *pdVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  double *pdVar55;
  long lVar56;
  double *pdVar57;
  long lVar58;
  long lVar59;
  undefined8 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  uint uVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  long lVar103;
  double *pdVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  double *pdVar125;
  Long *pLVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  uint uVar132;
  long lVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  int iVar138;
  int iVar139;
  long lVar140;
  long lVar141;
  long lVar142;
  long lVar143;
  int kk_13;
  int iVar144;
  int iVar145;
  int iVar146;
  long lVar147;
  char cVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  long lVar152;
  int iVar153;
  long lVar154;
  long lVar155;
  uint uVar156;
  int iVar157;
  long lVar158;
  long lVar159;
  long lVar160;
  int iVar161;
  int iVar162;
  long lVar163;
  long lVar164;
  long lVar165;
  double **ppdVar166;
  long lVar167;
  long lVar168;
  long lVar169;
  int kk_11;
  int iVar170;
  int iVar171;
  long lVar172;
  long lVar173;
  long lVar174;
  long lVar175;
  int iVar176;
  long lVar177;
  int kk;
  int iVar178;
  int iVar179;
  int iVar180;
  int iVar181;
  long lVar182;
  char cVar183;
  int iVar184;
  long lVar185;
  long lVar186;
  long lVar187;
  int iVar188;
  int iVar189;
  int iVar190;
  int iVar191;
  bool bVar192;
  ulong uVar193;
  double dVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  double dVar199;
  double dVar200;
  ulong uVar201;
  double dVar202;
  double dVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  double dVar214;
  double dVar215;
  double dVar216;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  int cuts_x_1;
  int cuts_x;
  int cuts_z;
  Real A [27] [3];
  Real du [27];
  double local_a48;
  double local_a28;
  double local_9f8;
  double local_9b8;
  double local_978;
  double local_8d8;
  double local_878;
  double local_438;
  double local_430;
  double local_428;
  double local_418;
  double dStack_410;
  double local_3f8;
  double *local_3f0;
  double *local_3e8;
  ulong local_3e0;
  double *local_3d8;
  long local_3d0;
  double *local_3c8;
  ulong local_3c0;
  long local_3b8;
  int local_3b0;
  int local_3ac;
  long local_3a8;
  long local_3a0;
  anon_class_552_16_5c7b231c local_398;
  double adStack_108 [27];
  
  auVar196 = _DAT_0077bb60;
  auVar198 = _DAT_0077bb40;
  iVar189 = (geom->domain).smallend.vect[0];
  iVar150 = (geom->domain).smallend.vect[1];
  iVar98 = (geom->domain).bigend.vect[0];
  iVar8 = (geom->domain).bigend.vect[1];
  iVar9 = (geom->domain).smallend.vect[2];
  iVar139 = (geom->domain).bigend.vect[2];
  pBVar33 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((((((pBVar33->bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar189)) ||
        ((0xfffffffd < pBVar33->bc[3] - 5U && (iVar98 <= (ubx->bigend).vect[0])))) ||
       ((pBVar33->bc[1] - 3U < 2 && ((vbx->smallend).vect[1] + -1 <= iVar150)))) ||
      ((0xfffffffd < pBVar33->bc[4] - 5U && (iVar8 <= (vbx->bigend).vect[1])))) ||
     (((pBVar33->bc[2] - 3U < 2 && ((wbx->smallend).vect[2] + -1 <= iVar9)) ||
      ((0xfffffffd < pBVar33->bc[5] - 5U && (iVar139 <= (wbx->bigend).vect[2])))))) {
    iVar10 = (ubx->smallend).vect[0];
    iVar11 = (ubx->smallend).vect[1];
    iVar149 = (ubx->smallend).vect[2];
    iVar12 = (ubx->bigend).vect[0];
    iVar13 = (ubx->bigend).vect[1];
    uVar60 = *(undefined8 *)&(u->begin).z;
    uVar61 = (u->end).y;
    iVar14 = (ubx->bigend).vect[2];
    local_398.u.end.y = uVar61;
    local_398.u._52_8_ = *(undefined8 *)&(u->end).z;
    local_398.u.begin.x = (u->begin).x;
    local_398.u.begin.y = (u->begin).y;
    local_398.u.begin.z = (int)uVar60;
    local_398.u.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.u.kstride = u->kstride;
    local_398.u.nstride = u->nstride;
    local_398.u.p = u->p;
    local_398.u.jstride = u->jstride;
    uVar60 = *(undefined8 *)&(vcc->begin).z;
    uVar62 = (vcc->end).y;
    local_398.vcc.end.y = uVar62;
    local_398.vcc._52_8_ = *(undefined8 *)&(vcc->end).z;
    local_398.vcc.begin.x = (vcc->begin).x;
    local_398.vcc.begin.y = (vcc->begin).y;
    local_398.vcc.begin.z = (int)uVar60;
    local_398.vcc.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.vcc.kstride = vcc->kstride;
    local_398.vcc.nstride = vcc->nstride;
    local_398.vcc.p = vcc->p;
    local_398.vcc.jstride = vcc->jstride;
    uVar63 = (flag->end).x;
    uVar64 = (flag->end).y;
    local_398.flag.p = flag->p;
    local_398.flag.jstride = flag->jstride;
    local_398.flag.kstride = flag->kstride;
    local_398.flag.nstride = flag->nstride;
    local_398.flag.begin.x = (flag->begin).x;
    local_398.flag.begin.y = (flag->begin).y;
    local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
    local_398.flag.end.x = uVar63;
    local_398.flag.end.y = uVar64;
    local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    uVar65 = (ccc->end).x;
    uVar66 = (ccc->end).y;
    local_398.ccc.p = ccc->p;
    local_398.ccc.jstride = ccc->jstride;
    local_398.ccc.kstride = ccc->kstride;
    local_398.ccc.nstride = ccc->nstride;
    local_398.ccc.begin.x = (ccc->begin).x;
    local_398.ccc.begin.y = (ccc->begin).y;
    local_398.ccc.begin.z = (int)*(undefined8 *)&(ccc->begin).z;
    local_398.ccc.end.x = uVar65;
    local_398.ccc.end.y = uVar66;
    local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    uVar67 = (vfrac->end).x;
    uVar68 = (vfrac->end).y;
    local_398.vfrac.p = vfrac->p;
    local_398.vfrac.jstride = vfrac->jstride;
    local_398.vfrac.kstride = vfrac->kstride;
    local_398.vfrac.nstride = vfrac->nstride;
    local_398.vfrac.begin.x = (vfrac->begin).x;
    local_398.vfrac.begin.y = (vfrac->begin).y;
    local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
    local_398.vfrac.end.x = uVar67;
    local_398.vfrac.end.y = uVar68;
    local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_398.d_bcrec = d_bcrec;
    uVar60 = *(undefined8 *)&(fcx->begin).z;
    uVar69 = (fcx->end).y;
    local_398.fcx.end.y = uVar69;
    local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_398.fcx.begin.x = (fcx->begin).x;
    local_398.fcx.begin.y = (fcx->begin).y;
    local_398.fcx.begin.z = (int)uVar60;
    local_398.fcx.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.fcx.kstride = fcx->kstride;
    local_398.fcx.nstride = fcx->nstride;
    local_398.fcx.p = fcx->p;
    local_398.fcx.jstride = fcx->jstride;
    uVar60 = *(undefined8 *)&(fcy->begin).z;
    uVar70 = (fcy->end).y;
    local_398.fcy.end.y = uVar70;
    local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_398.fcy.begin.x = (fcy->begin).x;
    local_398.fcy.begin.y = (fcy->begin).y;
    local_398.fcy.begin.z = (int)uVar60;
    local_398.fcy.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.fcy.kstride = fcy->kstride;
    local_398.fcy.nstride = fcy->nstride;
    local_398.fcy.p = fcy->p;
    local_398.fcy.jstride = fcy->jstride;
    auVar233._0_4_ = (fcz->begin).x;
    auVar233._4_4_ = (fcz->begin).y;
    auVar233._8_4_ = (fcz->begin).z;
    uVar71 = (fcz->end).x;
    uVar72 = (fcz->end).y;
    local_398.fcz.p = fcz->p;
    local_398.fcz.jstride = fcz->jstride;
    local_398.fcz.kstride = fcz->kstride;
    local_398.fcz.nstride = fcz->nstride;
    local_398.fcz.begin._0_8_ = auVar233._0_8_;
    local_398.fcz.begin.z = auVar233._8_4_;
    local_398.fcz.end.x = uVar71;
    local_398.fcz.end.y = uVar72;
    local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_398.domain_ilo = iVar189;
    local_398.domain_jlo = iVar150;
    local_398.domain_klo = iVar9;
    local_398.domain_ihi = iVar98;
    local_398.domain_jhi = iVar8;
    local_398.domain_khi = iVar139;
    local_398.order = 2;
    if (iVar149 <= iVar14) {
      do {
        iVar184 = iVar11;
        if (iVar11 <= iVar13) {
          do {
            iVar188 = iVar10;
            if (iVar10 <= iVar12) {
              do {
                ExtrapVelToFacesBox::anon_class_552_16_5c7b231c::operator()
                          (&local_398,iVar188,iVar184,iVar149);
                iVar188 = iVar188 + 1;
              } while (iVar12 + 1 != iVar188);
            }
            bVar192 = iVar184 != iVar13;
            iVar184 = iVar184 + 1;
          } while (bVar192);
        }
        bVar192 = iVar149 != iVar14;
        iVar149 = iVar149 + 1;
      } while (bVar192);
    }
  }
  else {
    iVar10 = (ubx->smallend).vect[2];
    iVar11 = (ubx->bigend).vect[2];
    if (iVar10 <= iVar11) {
      pdVar34 = u->p;
      lVar38 = u->jstride;
      lVar40 = u->kstride;
      iVar149 = (u->begin).x;
      iVar12 = (u->begin).y;
      iVar13 = (u->begin).z;
      pdVar36 = ccc->p;
      lVar41 = ccc->nstride;
      iVar14 = (ccc->begin).x;
      lVar107 = (long)iVar14;
      uVar26 = (vfrac->begin).y;
      uVar27 = (vfrac->begin).z;
      uVar31 = (vcc->begin).x;
      iVar161 = iVar98 + 1;
      iVar184 = (ubx->smallend).vect[0];
      iVar170 = iVar184 + -1;
      iVar188 = (ccc->begin).z;
      iVar15 = (ccc->begin).y;
      iVar16 = (ubx->smallend).vect[1];
      iVar17 = (ubx->bigend).vect[0];
      iVar18 = (ubx->bigend).vect[1];
      pdVar42 = vcc->p;
      lVar43 = vcc->jstride;
      lVar44 = vcc->kstride;
      iVar19 = (vcc->begin).y;
      iVar20 = (vcc->begin).z;
      pEVar39 = flag->p;
      lVar45 = flag->jstride;
      lVar47 = flag->kstride;
      iVar21 = (flag->begin).x;
      iVar22 = (flag->begin).y;
      iVar23 = (flag->begin).z;
      pdVar46 = fcx->p;
      lVar48 = fcx->jstride;
      lVar50 = fcx->kstride;
      lVar51 = fcx->nstride;
      iVar24 = (fcx->begin).x;
      iVar25 = (fcx->begin).y;
      iVar28 = (fcx->begin).z;
      pdVar49 = fcy->p;
      lVar52 = fcy->jstride;
      lVar53 = fcy->kstride;
      lVar54 = fcy->nstride;
      iVar29 = (fcy->begin).x;
      iVar30 = (fcy->begin).y;
      iVar157 = (fcy->begin).z;
      pdVar55 = fcz->p;
      lVar56 = fcz->jstride;
      lVar58 = fcz->kstride;
      lVar59 = fcz->nstride;
      iVar130 = (fcz->begin).x;
      iVar131 = (fcz->begin).y;
      iVar145 = (fcz->begin).z;
      lVar172 = ccc->jstride;
      lVar140 = ccc->kstride;
      pdVar57 = vfrac->p;
      lVar105 = vfrac->jstride;
      lVar106 = vfrac->kstride;
      iVar153 = (vfrac->begin).x;
      lVar35 = lVar140 * 8;
      lVar37 = lVar172 * 8;
      auVar206 = _DAT_0077bb30;
      do {
        if (iVar16 <= iVar18) {
          lVar108 = (long)iVar10;
          lVar118 = (~(long)iVar188 + lVar108) * lVar35;
          lVar112 = (lVar108 - iVar23) * lVar47;
          lVar113 = (lVar108 - iVar28) * lVar50;
          iVar171 = iVar10 - iVar188;
          lVar114 = iVar171 * lVar140;
          iVar127 = iVar10 - iVar20;
          lVar116 = iVar127 * lVar44;
          lVar117 = lVar106 * (int)(iVar10 - uVar27);
          lVar173 = (int)((iVar10 + -1) - uVar27) * lVar106;
          lVar186 = (int)((iVar10 + 1) - uVar27) * lVar106;
          lVar115 = ((iVar10 + -1) - iVar20) * lVar44;
          lVar133 = ((iVar10 + 1) - iVar20) * lVar44;
          lVar134 = (iVar10 - iVar157) * lVar53;
          iVar191 = iVar10 - iVar145;
          lVar158 = (iVar191 + 1) * lVar58;
          lVar109 = iVar191 * lVar58;
          lVar110 = (int)(~uVar27 + iVar10) * lVar106;
          lVar111 = (int)((iVar10 - uVar27) + 1) * lVar106;
          iVar191 = iVar16;
          do {
            if (iVar184 <= iVar17) {
              lVar119 = (long)iVar191;
              lVar124 = (~(long)iVar15 + lVar119) * lVar37;
              lVar141 = (lVar119 - iVar22) * lVar45;
              lVar147 = (lVar119 - iVar25) * lVar48;
              iVar102 = iVar191 - iVar15;
              lVar152 = iVar102 * lVar172;
              iVar146 = iVar191 - iVar19;
              lVar155 = iVar146 * lVar43;
              lVar159 = lVar105 * (int)(iVar191 - uVar26);
              lVar174 = (int)((iVar191 + -1) - uVar26) * lVar105;
              lVar142 = (int)((iVar191 + 1) - uVar26) * lVar105;
              lVar164 = ((iVar191 + -1) - iVar19) * lVar43;
              lVar168 = ((iVar191 + 1) - iVar19) * lVar43;
              iVar138 = iVar191 - iVar30;
              lVar121 = (iVar138 + 1) * lVar52;
              lVar169 = iVar138 * lVar52;
              lVar120 = (iVar191 - iVar131) * lVar56;
              lVar135 = (int)(~uVar26 + iVar191) * lVar105;
              lVar136 = (int)((iVar191 - uVar26) + 1) * lVar105;
              iVar101 = iVar170;
              iVar179 = iVar184;
              iVar138 = iVar170 - iVar14;
              iVar128 = iVar170 - uVar31;
              iVar99 = iVar184 - uVar31;
              iVar100 = (iVar184 - uVar31) + -2;
              do {
                lVar167 = (long)(iVar179 - iVar21);
                uVar32 = pEVar39[lVar141 + lVar112 + lVar167].flag;
                dVar203 = 0.0;
                if ((uVar32 >> 0x11 & 1) != 0) {
                  lVar123 = (long)iVar101;
                  lVar187 = (long)pdVar36 + lVar123 * 8 + lVar124 + lVar118 + lVar107 * -8 + -8;
                  lVar122 = (long)pdVar36 +
                            lVar123 * 8 + lVar124 + lVar118 + lVar41 * 8 + lVar107 * -8 + -8;
                  lVar123 = (long)pdVar36 +
                            lVar123 * 8 + lVar124 + lVar118 + lVar41 * 0x10 + lVar107 * -8 + -8;
                  iVar162 = iVar179 - iVar24;
                  pdVar2 = pdVar46 + lVar147 + lVar113 + iVar162;
                  dVar203 = pdVar46[lVar147 + lVar113 + iVar162];
                  dVar207 = pdVar2[lVar51];
                  lVar137 = iVar179 - lVar107;
                  pdVar3 = pdVar36 + lVar152 + lVar114 + lVar137;
                  dVar202 = pdVar36[lVar152 + lVar114 + lVar137];
                  dVar209 = pdVar3[lVar41];
                  dVar5 = pdVar3[lVar41 * 2];
                  iVar181 = iVar179 + -1;
                  lVar137 = (long)(int)(iVar181 - uVar31);
                  dVar6 = pdVar42[lVar155 + lVar137 + lVar116];
                  lVar143 = (long)(int)(iVar179 - uVar31);
                  dVar7 = pdVar42[lVar155 + lVar143 + lVar116];
                  lVar160 = -1;
                  cVar148 = '\x05';
                  lVar165 = 0;
                  do {
                    iVar176 = (int)lVar160;
                    lVar177 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar129 = (int)lVar177;
                      iVar180 = (int)lVar165;
                      ppdVar166 = &local_398.u.p + (long)iVar180 * 3;
                      lVar165 = 0;
                      do {
                        iVar151 = (int)lVar165;
                        if ((iVar151 == 1 && (iVar129 == 0 && iVar176 == 0)) ||
                           ((1 << (cVar183 + (char)lVar165 & 0x1fU) & uVar32) == 0)) {
                          *ppdVar166 = (double *)0x0;
                          ppdVar166[1] = (double *)0x0;
                          ppdVar166[2] = (double *)0x0;
                        }
                        else {
                          pdVar104 = pdVar36 + (iVar171 + iVar176) * lVar140 +
                                               (iVar102 + iVar129) * lVar172 +
                                               (long)(iVar138 + iVar151);
                          dVar194 = pdVar104[lVar41];
                          *ppdVar166 = (double *)((*pdVar104 + (double)(iVar151 + -1)) - dVar202);
                          ppdVar166[1] = (double *)((dVar194 + (double)iVar129) - dVar209);
                          ppdVar166[2] = (double *)
                                         ((pdVar104[lVar41 * 2] + (double)iVar176) - dVar5);
                        }
                        lVar165 = lVar165 + 1;
                        ppdVar166 = ppdVar166 + 3;
                      } while (lVar165 != 3);
                      lVar177 = lVar177 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar165 = (long)iVar180 + 3;
                    } while (lVar177 != 2);
                    lVar160 = lVar160 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar165 = (long)iVar180 + 3;
                  } while (lVar160 != 2);
                  lVar160 = -1;
                  cVar148 = '\x05';
                  lVar165 = 0;
                  do {
                    lVar177 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar176 = (int)lVar165;
                      lVar165 = 0;
                      do {
                        dVar194 = 0.0;
                        if (((int)lVar165 != 1 || ((int)lVar177 != 0 || (int)lVar160 != 0)) &&
                           ((1 << (cVar183 + (char)lVar165 & 0x1fU) & uVar32) != 0)) {
                          dVar194 = pdVar42[(iVar127 + (int)lVar160) * lVar44 +
                                            (iVar146 + (int)lVar177) * lVar43 +
                                            (long)(iVar128 + (int)lVar165)] - dVar7;
                        }
                        adStack_108[iVar176 + lVar165] = dVar194;
                        lVar165 = lVar165 + 1;
                      } while (lVar165 != 3);
                      lVar177 = lVar177 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar165 = (long)iVar176 + 3;
                    } while (lVar177 != 2);
                    lVar160 = lVar160 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar165 = (long)iVar176 + 3;
                  } while (lVar160 != 2);
                  pdVar104 = &local_438;
                  lVar165 = 0;
                  do {
                    lVar160 = 0;
                    auVar205 = auVar206;
                    do {
                      auVar204 = auVar205 ^ auVar198;
                      if (auVar204._4_4_ == -0x80000000 && auVar204._0_4_ < -0x7ffffffd) {
                        *(undefined8 *)((long)pdVar104 + lVar160) = 0;
                        *(undefined8 *)((long)pdVar104 + lVar160 + 0x18) = 0;
                      }
                      lVar177 = auVar205._8_8_;
                      lVar182 = auVar196._0_8_;
                      auVar205._0_8_ = auVar205._0_8_ + lVar182;
                      lVar175 = auVar196._8_8_;
                      auVar205._8_8_ = lVar177 + lVar175;
                      lVar160 = lVar160 + 0x30;
                    } while (lVar160 != 0x60);
                    lVar165 = lVar165 + 1;
                    pdVar104 = pdVar104 + 1;
                  } while (lVar165 != 3);
                  dVar194 = dVar6;
                  if (dVar6 <= dVar7) {
                    dVar194 = dVar7;
                  }
                  dVar214 = 0.0;
                  dVar229 = 0.0;
                  dVar221 = 0.0;
                  pLVar126 = &local_398.u.kstride;
                  lVar165 = 0;
                  dVar228 = local_3f8;
                  dVar230 = local_438;
                  dVar210 = local_430;
                  dVar215 = local_428;
                  dVar224 = local_418;
                  dVar227 = dStack_410;
                  do {
                    dVar199 = (double)*pLVar126;
                    pdVar104 = ((Array4<double> *)(pLVar126 + -2))->p;
                    dVar231 = (double)pLVar126[-1];
                    dVar224 = dVar224 + dVar231 * (double)pLVar126[-1];
                    dVar227 = dVar227 + dVar231 * (double)*pLVar126;
                    dVar228 = dVar228 + dVar199 * dVar199;
                    dVar208 = adStack_108[lVar165];
                    dVar230 = dVar230 + (double)pdVar104 * (double)pdVar104;
                    dVar214 = dVar214 + dVar208 * (double)pdVar104;
                    dVar210 = dVar210 + dVar231 * (double)pdVar104;
                    dVar229 = dVar229 + dVar208 * dVar231;
                    dVar215 = dVar215 + dVar199 * (double)pdVar104;
                    dVar221 = dVar221 + dVar208 * dVar199;
                    lVar165 = lVar165 + 1;
                    pLVar126 = pLVar126 + 3;
                  } while (lVar165 != 0x1b);
                  dVar199 = dVar224 * dVar228 - dVar227 * dVar227;
                  dVar208 = dVar228 * dVar210 - dVar215 * dVar227;
                  dVar231 = dVar228 * dVar229 - dVar221 * dVar227;
                  dVar228 = dVar210 * dVar227 - dVar224 * dVar215;
                  local_9f8 = dVar215 * dVar228 + (dVar199 * dVar230 - dVar210 * dVar208);
                  local_878 = (dVar215 * (dVar229 * dVar227 - dVar224 * dVar221) +
                              (dVar199 * dVar214 - dVar210 * dVar231)) / local_9f8;
                  iVar176 = iVar179 - iVar153;
                  lVar165 = (long)iVar176;
                  if ((((pdVar57[lVar159 + lVar117 + lVar165] == 1.0) &&
                       (!NAN(pdVar57[lVar159 + lVar117 + lVar165]))) &&
                      (pdVar57[lVar159 + lVar117 + (iVar181 - iVar153)] == 1.0)) &&
                     (!NAN(pdVar57[lVar159 + lVar117 + (iVar181 - iVar153)]))) {
                    if ((pdVar57[lVar159 + lVar117 + ((iVar179 + 1) - iVar153)] == 1.0) &&
                       (!NAN(pdVar57[lVar159 + lVar117 + ((iVar179 + 1) - iVar153)]))) {
                      dVar200 = pdVar42[lVar155 + lVar143 + lVar116] -
                                pdVar42[lVar155 + lVar137 + lVar116];
                      dVar216 = pdVar42[lVar155 + lVar116 + (int)((iVar179 + 1) - uVar31)] -
                                pdVar42[lVar155 + lVar143 + lVar116];
                      dVar200 = dVar200 + dVar200;
                      dVar216 = dVar216 + dVar216;
                      dVar232 = (pdVar42[lVar155 + lVar116 + (int)((iVar179 + 1) - uVar31)] -
                                pdVar42[lVar155 + lVar137 + lVar116]) * 0.5;
                      dVar222 = ABS(dVar200);
                      uVar193 = -(ulong)(0.0 < dVar232);
                      dVar232 = ABS(dVar232);
                      dVar199 = ABS(dVar216);
                      if (dVar222 <= dVar232) {
                        dVar232 = dVar222;
                      }
                      if (dVar232 <= dVar199) {
                        dVar199 = dVar232;
                      }
                      uVar201 = -(ulong)(0.0 < dVar200 * dVar216) & (ulong)dVar199;
                      local_878 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                          uVar193 & uVar201);
                    }
                  }
                  dVar199 = dVar210 * dVar221 - dVar215 * dVar229;
                  local_978 = (dVar215 * dVar199 + (dVar231 * dVar230 - dVar208 * dVar214)) /
                              local_9f8;
                  if (((pdVar57[lVar117 + lVar159 + lVar165] == 1.0) &&
                      (!NAN(pdVar57[lVar117 + lVar159 + lVar165]))) &&
                     ((pdVar57[lVar117 + lVar174 + lVar165] == 1.0 &&
                      (((!NAN(pdVar57[lVar117 + lVar174 + lVar165]) &&
                        (pdVar57[lVar117 + lVar142 + lVar165] == 1.0)) &&
                       (!NAN(pdVar57[lVar117 + lVar142 + lVar165]))))))) {
                    dVar231 = pdVar42[lVar155 + lVar143 + lVar116] -
                              pdVar42[lVar116 + lVar164 + lVar143];
                    dVar232 = pdVar42[lVar116 + lVar168 + lVar143] -
                              pdVar42[lVar155 + lVar143 + lVar116];
                    dVar231 = dVar231 + dVar231;
                    dVar232 = dVar232 + dVar232;
                    dVar215 = (pdVar42[lVar116 + lVar168 + lVar143] -
                              pdVar42[lVar116 + lVar164 + lVar143]) * 0.5;
                    dVar200 = ABS(dVar231);
                    uVar193 = -(ulong)(0.0 < dVar215);
                    dVar215 = ABS(dVar215);
                    dVar208 = ABS(dVar232);
                    if (dVar200 <= dVar215) {
                      dVar215 = dVar200;
                    }
                    if (dVar215 <= dVar208) {
                      dVar208 = dVar215;
                    }
                    uVar201 = -(ulong)(0.0 < dVar231 * dVar232) & (ulong)dVar208;
                    local_978 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  local_9f8 = (dVar214 * dVar228 +
                              (dVar230 * (dVar224 * dVar221 - dVar227 * dVar229) - dVar199 * dVar210
                              )) / local_9f8;
                  if (((pdVar57[lVar159 + lVar165 + lVar117] == 1.0) &&
                      (!NAN(pdVar57[lVar159 + lVar165 + lVar117]))) &&
                     (((pdVar57[lVar159 + lVar165 + lVar173] == 1.0 &&
                       ((!NAN(pdVar57[lVar159 + lVar165 + lVar173]) &&
                        (pdVar57[lVar159 + lVar165 + lVar186] == 1.0)))) &&
                      (!NAN(pdVar57[lVar159 + lVar165 + lVar186]))))) {
                    dVar215 = pdVar42[lVar155 + lVar143 + lVar116] -
                              pdVar42[lVar155 + lVar143 + lVar115];
                    dVar224 = pdVar42[lVar155 + lVar143 + lVar133] -
                              pdVar42[lVar155 + lVar143 + lVar116];
                    dVar215 = dVar215 + dVar215;
                    dVar224 = dVar224 + dVar224;
                    dVar228 = (pdVar42[lVar155 + lVar143 + lVar133] -
                              pdVar42[lVar155 + lVar143 + lVar115]) * 0.5;
                    dVar210 = ABS(dVar215);
                    uVar193 = -(ulong)(0.0 < dVar228);
                    dVar228 = ABS(dVar228);
                    dVar230 = ABS(dVar224);
                    if (dVar210 <= dVar228) {
                      dVar228 = dVar210;
                    }
                    if (dVar228 <= dVar230) {
                      dVar230 = dVar228;
                    }
                    uVar201 = -(ulong)(0.0 < dVar215 * dVar224) & (ulong)dVar230;
                    local_9f8 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  dVar228 = dVar6;
                  if (dVar7 <= dVar6) {
                    dVar228 = dVar7;
                  }
                  uVar32 = pEVar39[lVar141 + lVar112 + lVar167].flag;
                  iVar180 = 0;
                  iVar129 = 0;
                  iVar178 = 0;
                  iVar151 = 0;
                  uVar156 = 0xffffffff;
                  do {
                    uVar132 = uVar156 + 1;
                    uVar97 = 0xffffffff;
                    iVar144 = iVar180;
                    do {
                      uVar1 = uVar97 + 1;
                      iVar190 = 5;
                      do {
                        if (((uVar32 >> (iVar144 + iVar190 & 0x1fU) & 1) != 0) &&
                           ((iVar190 != 6 || uVar97 != 0) || uVar156 != 0)) {
                          iVar129 = iVar129 + (uint)((iVar190 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar97 == 0 && uVar156 == 0));
                          iVar178 = iVar178 + (uint)((iVar190 == 6 && uVar156 == 0) &&
                                                    (uVar1 & 0xfffffffd) == 0);
                          iVar151 = iVar151 + (uint)((iVar190 == 6 && uVar97 == 0) &&
                                                    (uVar132 & 0xfffffffd) == 0);
                        }
                        iVar190 = iVar190 + 1;
                      } while (iVar190 != 8);
                      iVar144 = iVar144 + 3;
                      uVar97 = uVar1;
                    } while (uVar1 != 2);
                    iVar180 = iVar180 + 9;
                    uVar156 = uVar132;
                  } while (uVar132 != 2);
                  dVar230 = *pdVar3;
                  dVar210 = pdVar3[lVar41];
                  dVar215 = pdVar3[lVar41 * 2];
                  dVar224 = 2.0;
                  if ((uVar32 >> 0x15 & 1) != 0) {
                    dVar227 = pdVar42[lVar155 + lVar143 + lVar116];
                    lVar167 = -1;
                    cVar148 = '\b';
                    dVar214 = dVar227;
                    dVar224 = dVar227;
                    do {
                      lVar160 = 0;
                      cVar183 = cVar148;
                      do {
                        lVar177 = 0;
                        do {
                          if (((int)lVar177 != 1 || ((int)lVar160 != 0 || (int)lVar167 != 0)) &&
                             ((1 << (cVar183 + (char)lVar177 & 0x1fU) & uVar32) != 0)) {
                            dVar221 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar160) * lVar43 +
                                              (long)(iVar128 + (int)lVar177)];
                            dVar229 = dVar221;
                            if (dVar221 <= dVar224) {
                              dVar229 = dVar224;
                            }
                            dVar224 = dVar229;
                            if (dVar221 < dVar214) {
                              dVar214 = dVar221;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar160 == 0;
                        lVar160 = lVar160 + 1;
                      } while (bVar192);
                      lVar167 = lVar167 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar167 != 2);
                    dVar221 = (((pdVar49 + lVar134 + lVar121 + (iVar179 - iVar29))[lVar54] - dVar215
                               ) * local_9f8 +
                              (0.5 - dVar210) * local_978 +
                              (pdVar49[lVar134 + lVar121 + (iVar179 - iVar29)] - dVar230) *
                              local_878 + dVar227) - dVar227;
                    if (dVar221 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar221 < -1e-13) &&
                         (dVar224 = (dVar214 - dVar227) / dVar221, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar227) / dVar221;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (2.0 <= dVar224) {
                      dVar224 = 2.0;
                    }
                  }
                  dVar227 = dVar224;
                  if ((short)uVar32 < 0) {
                    dVar214 = pdVar42[lVar155 + lVar143 + lVar116];
                    lVar167 = -1;
                    cVar148 = '\x05';
                    dVar221 = dVar214;
                    dVar227 = dVar214;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = 0;
                        do {
                          if (((int)lVar177 != 1 || ((int)lVar160 != 0 || (int)lVar167 != 0)) &&
                             ((1 << (cVar183 + (char)lVar177 & 0x1fU) & uVar32) != 0)) {
                            dVar229 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar160) * lVar43 +
                                              (long)(iVar128 + (int)lVar177)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar227) {
                              dVar199 = dVar227;
                            }
                            dVar227 = dVar199;
                            if (dVar229 < dVar221) {
                              dVar221 = dVar229;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar160 != 0;
                        lVar160 = lVar160 + 1;
                      } while (bVar192);
                      lVar167 = lVar167 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar167 != 2);
                    dVar229 = (((pdVar49 + lVar134 + lVar169 + (iVar179 - iVar29))[lVar54] - dVar215
                               ) * local_9f8 +
                              -(dVar210 + 0.5) * local_978 +
                              (pdVar49[lVar134 + lVar169 + (iVar179 - iVar29)] - dVar230) *
                              local_878 + dVar214) - dVar214;
                    if (dVar229 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar227 = (dVar221 - dVar214) / dVar229, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar214) / dVar229;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar224 = dVar227;
                  if ((uVar32 >> 0x13 & 1) != 0) {
                    dVar214 = pdVar42[lVar155 + lVar143 + lVar116];
                    lVar167 = -1;
                    cVar148 = '\x06';
                    dVar221 = dVar214;
                    dVar224 = dVar214;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = 0;
                        do {
                          if ((((int)lVar160 != 0 || (int)lVar167 != 0) || (int)lVar177 != 0) &&
                             ((1 << (cVar183 + (char)lVar177 & 0x1fU) & uVar32) != 0)) {
                            dVar229 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar160) * lVar43 +
                                              (long)(iVar99 + (int)lVar177)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar224) {
                              dVar199 = dVar224;
                            }
                            dVar224 = dVar199;
                            if (dVar229 < dVar221) {
                              dVar221 = dVar229;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 == 1);
                        lVar160 = lVar160 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar160 != 2);
                      lVar167 = lVar167 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar167 != 2);
                    dVar229 = ((pdVar46[lVar147 + lVar113 + (iVar162 + 1) + lVar51] - dVar215) *
                               local_9f8 +
                              (pdVar46[lVar147 + lVar113 + (iVar162 + 1)] - dVar210) * local_978 +
                              (0.5 - dVar230) * local_878 + dVar214) - dVar214;
                    if (dVar229 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar224 = (dVar221 - dVar214) / dVar229, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar214) / dVar229;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (dVar227 <= dVar224) {
                      dVar224 = dVar227;
                    }
                  }
                  dVar227 = dVar224;
                  if ((uVar32 >> 0x11 & 1) != 0) {
                    dVar214 = pdVar42[lVar155 + lVar143 + lVar116];
                    lVar167 = -1;
                    cVar148 = '\x05';
                    dVar221 = dVar214;
                    dVar227 = dVar214;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = -1;
                        do {
                          if ((((int)lVar160 != 0 || (int)lVar167 != 0) || (int)lVar177 != 0) &&
                             ((1 << (cVar183 + (char)lVar177 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar229 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar160) * lVar43 +
                                              (long)(iVar99 + (int)lVar177)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar227) {
                              dVar199 = dVar227;
                            }
                            dVar227 = dVar199;
                            if (dVar229 < dVar221) {
                              dVar221 = dVar229;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 1);
                        lVar160 = lVar160 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar160 != 2);
                      lVar167 = lVar167 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar167 != 2);
                    dVar229 = ((pdVar2[lVar51] - dVar215) * local_9f8 +
                              (*pdVar2 - dVar210) * local_978 +
                              (dVar214 - (dVar230 + 0.5) * local_878)) - dVar214;
                    if (dVar229 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar227 = (dVar221 - dVar214) / dVar229, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar214) / dVar229;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar224 = dVar227;
                  if ((uVar32 >> 0x1b & 1) != 0) {
                    dVar214 = pdVar42[lVar155 + lVar143 + lVar116];
                    cVar148 = '\x0e';
                    lVar167 = 0;
                    dVar221 = dVar214;
                    dVar224 = dVar214;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = -1;
                        do {
                          if ((((int)lVar160 != 0 || (int)lVar167 != 0) || (int)lVar177 != 0) &&
                             ((1 << (cVar183 + (char)lVar177 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar229 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar160) * lVar43 +
                                              (long)(iVar99 + (int)lVar177)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar224) {
                              dVar199 = dVar224;
                            }
                            dVar224 = dVar199;
                            if (dVar229 < dVar221) {
                              dVar221 = dVar229;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 2);
                        lVar160 = lVar160 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar160 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar167 == 0;
                      lVar167 = lVar167 + 1;
                    } while (bVar192);
                    dVar229 = ((0.5 - dVar215) * local_9f8 +
                              ((pdVar55 + lVar158 + lVar120 + (iVar179 - iVar130))[lVar59] - dVar210
                              ) * local_978 +
                              (pdVar55[lVar158 + lVar120 + (iVar179 - iVar130)] - dVar230) *
                              local_878 + dVar214) - dVar214;
                    if (dVar229 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar224 = (dVar221 - dVar214) / dVar229, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar214) / dVar229;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (dVar227 <= dVar224) {
                      dVar224 = dVar227;
                    }
                  }
                  dVar227 = dVar224;
                  if ((uVar32 >> 9 & 1) != 0) {
                    dVar214 = pdVar42[lVar155 + lVar143 + lVar116];
                    cVar148 = '\x05';
                    lVar167 = -1;
                    dVar221 = dVar214;
                    dVar227 = dVar214;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = -1;
                        do {
                          if ((((int)lVar160 != 0 || (int)lVar167 != 0) || (int)lVar177 != 0) &&
                             ((1 << (cVar183 + (char)lVar177 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar229 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar160) * lVar43 +
                                              (long)(iVar99 + (int)lVar177)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar227) {
                              dVar199 = dVar227;
                            }
                            dVar227 = dVar199;
                            if (dVar229 < dVar221) {
                              dVar221 = dVar229;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 2);
                        lVar160 = lVar160 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar160 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar167 != 0;
                      lVar167 = lVar167 + 1;
                    } while (bVar192);
                    dVar230 = ((((pdVar55 + lVar109 + lVar120 + (iVar179 - iVar130))[lVar59] -
                                dVar210) * local_978 +
                               (pdVar55[lVar109 + lVar120 + (iVar179 - iVar130)] - dVar230) *
                               local_878 + dVar214) - (dVar215 + 0.5) * local_9f8) - dVar214;
                    if (dVar230 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar230 < -1e-13) &&
                         (dVar227 = (dVar221 - dVar214) / dVar230, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar214) / dVar230;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar230 = 0.0;
                  if (1 < iVar129) {
                    dVar230 = dVar227;
                  }
                  dVar210 = 0.0;
                  if (1 < iVar178) {
                    dVar210 = dVar227;
                  }
                  dVar215 = 0.0;
                  if (1 < iVar151) {
                    dVar215 = dVar227;
                  }
                  dVar224 = pdVar57[lVar159 + lVar165 + lVar117];
                  if ((((dVar224 == 1.0) && (!NAN(dVar224))) &&
                      (pdVar57[lVar159 + lVar117 + (iVar181 - iVar153)] == 1.0)) &&
                     (((!NAN(pdVar57[lVar159 + lVar117 + (iVar181 - iVar153)]) &&
                       (pdVar57[lVar159 + lVar117 + (iVar176 + 1)] == 1.0)) &&
                      (!NAN(pdVar57[lVar159 + lVar117 + (iVar176 + 1)]))))) {
                    dVar230 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     ((pdVar57[lVar117 + lVar135 + lVar165] == 1.0 &&
                      (((!NAN(pdVar57[lVar117 + lVar135 + lVar165]) &&
                        (pdVar57[lVar117 + lVar136 + lVar165] == 1.0)) &&
                       (!NAN(pdVar57[lVar117 + lVar136 + lVar165]))))))) {
                    dVar210 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     (((pdVar57[lVar159 + lVar165 + lVar110] == 1.0 &&
                       ((!NAN(pdVar57[lVar159 + lVar165 + lVar110]) &&
                        (pdVar57[lVar159 + lVar165 + lVar111] == 1.0)))) &&
                      (!NAN(pdVar57[lVar159 + lVar165 + lVar111]))))) {
                    dVar215 = 1.0;
                  }
                  dVar209 = (dVar7 - (dVar202 + 0.5) * local_878 * dVar230) +
                            (dVar203 - dVar209) * local_978 * dVar210 +
                            (dVar207 - dVar5) * local_9f8 * dVar215;
                  dVar202 = dVar194;
                  if (dVar209 <= dVar194) {
                    dVar202 = dVar209;
                  }
                  pdVar3 = pdVar36 + lVar152 + lVar114 + (iVar181 - iVar14);
                  dVar209 = pdVar36[lVar152 + lVar114 + (iVar181 - iVar14)];
                  dVar5 = pdVar3[lVar41];
                  dVar7 = pdVar3[lVar41 * 2];
                  lVar167 = (long)(iVar181 - iVar21);
                  uVar32 = pEVar39[lVar141 + lVar112 + lVar167].flag;
                  lVar160 = -1;
                  cVar148 = '\x05';
                  lVar177 = 0;
                  do {
                    lVar163 = -1;
                    lVar103 = lVar122;
                    lVar154 = lVar187;
                    lVar185 = lVar123;
                    cVar183 = cVar148;
                    do {
                      iVar162 = (int)lVar177;
                      ppdVar166 = &local_398.u.p + (long)iVar162 * 3;
                      lVar177 = 0;
                      do {
                        if (((int)lVar177 == 1 && ((int)lVar163 == 0 && (int)lVar160 == 0)) ||
                           ((1 << (cVar183 + (char)lVar177 & 0x1fU) & uVar32) == 0)) {
                          *ppdVar166 = (double *)0x0;
                          ppdVar166[1] = (double *)0x0;
                          ppdVar166[2] = (double *)0x0;
                        }
                        else {
                          dVar230 = *(double *)(lVar103 + lVar177 * 8);
                          *ppdVar166 = (double *)
                                       ((*(double *)(lVar154 + lVar177 * 8) +
                                        (double)((int)lVar177 + -1)) - dVar209);
                          ppdVar166[1] = (double *)((dVar230 + (double)(int)lVar163) - dVar5);
                          ppdVar166[2] = (double *)
                                         ((*(double *)(lVar185 + lVar177 * 8) + (double)(int)lVar160
                                          ) - pdVar3[lVar41 * 2]);
                        }
                        lVar177 = lVar177 + 1;
                        ppdVar166 = ppdVar166 + 3;
                      } while (lVar177 != 3);
                      lVar163 = lVar163 + 1;
                      lVar154 = lVar154 + lVar172 * 8;
                      lVar103 = lVar103 + lVar37;
                      lVar185 = lVar185 + lVar37;
                      cVar183 = cVar183 + '\x03';
                      lVar177 = (long)iVar162 + 3;
                    } while (lVar163 != 2);
                    lVar160 = lVar160 + 1;
                    lVar187 = lVar187 + lVar140 * 8;
                    lVar122 = lVar122 + lVar35;
                    lVar123 = lVar123 + lVar35;
                    cVar148 = cVar148 + '\t';
                    lVar177 = (long)iVar162 + 3;
                  } while (lVar160 != 2);
                  dVar230 = dVar228;
                  if (dVar228 <= dVar202) {
                    dVar230 = dVar202;
                  }
                  lVar122 = -1;
                  cVar148 = '\x05';
                  lVar187 = 0;
                  do {
                    lVar123 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar162 = (int)lVar187;
                      lVar187 = 0;
                      do {
                        dVar202 = 0.0;
                        if (((int)lVar187 != 1 || ((int)lVar123 != 0 || (int)lVar122 != 0)) &&
                           ((1 << (cVar183 + (char)lVar187 & 0x1fU) & uVar32) != 0)) {
                          dVar202 = pdVar42[(iVar127 + (int)lVar122) * lVar44 +
                                            (iVar146 + (int)lVar123) * lVar43 +
                                            (long)(iVar100 + (int)lVar187)] -
                                    pdVar42[lVar155 + lVar137 + lVar116];
                        }
                        adStack_108[iVar162 + lVar187] = dVar202;
                        lVar187 = lVar187 + 1;
                      } while (lVar187 != 3);
                      lVar123 = lVar123 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar187 = (long)iVar162 + 3;
                    } while (lVar123 != 2);
                    lVar122 = lVar122 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar187 = (long)iVar162 + 3;
                  } while (lVar122 != 2);
                  pdVar104 = &local_438;
                  lVar187 = 0;
                  do {
                    lVar122 = 0;
                    auVar206 = _DAT_0077bb30;
                    do {
                      auVar205 = auVar206 ^ auVar198;
                      if (auVar205._4_4_ == -0x80000000 && auVar205._0_4_ < -0x7ffffffd) {
                        *(undefined8 *)((long)pdVar104 + lVar122) = 0;
                        *(undefined8 *)((long)pdVar104 + lVar122 + 0x18) = 0;
                      }
                      lVar123 = auVar206._8_8_;
                      auVar206._0_8_ = auVar206._0_8_ + lVar182;
                      auVar206._8_8_ = lVar123 + lVar175;
                      lVar122 = lVar122 + 0x30;
                    } while (lVar122 != 0x60);
                    lVar187 = lVar187 + 1;
                    pdVar104 = pdVar104 + 1;
                  } while (lVar187 != 3);
                  dVar221 = 0.0;
                  dVar229 = 0.0;
                  dVar199 = 0.0;
                  pLVar126 = &local_398.u.kstride;
                  lVar187 = 0;
                  dVar202 = local_418;
                  dVar210 = dStack_410;
                  dVar215 = local_430;
                  dVar224 = local_3f8;
                  dVar227 = local_438;
                  dVar214 = local_428;
                  do {
                    dVar208 = (double)*pLVar126;
                    pdVar104 = ((Array4<double> *)(pLVar126 + -2))->p;
                    dVar232 = (double)pLVar126[-1];
                    dVar202 = dVar202 + dVar232 * (double)pLVar126[-1];
                    dVar210 = dVar210 + dVar232 * (double)*pLVar126;
                    dVar224 = dVar224 + dVar208 * dVar208;
                    dVar231 = adStack_108[lVar187];
                    dVar227 = dVar227 + (double)pdVar104 * (double)pdVar104;
                    dVar221 = dVar221 + dVar231 * (double)pdVar104;
                    dVar215 = dVar215 + dVar232 * (double)pdVar104;
                    dVar229 = dVar229 + dVar231 * dVar232;
                    dVar214 = dVar214 + dVar208 * (double)pdVar104;
                    dVar199 = dVar199 + dVar231 * dVar208;
                    lVar187 = lVar187 + 1;
                    pLVar126 = pLVar126 + 3;
                  } while (lVar187 != 0x1b);
                  dVar208 = dVar202 * dVar224 - dVar210 * dVar210;
                  dVar231 = dVar224 * dVar215 - dVar214 * dVar210;
                  dVar232 = dVar224 * dVar229 - dVar199 * dVar210;
                  dVar224 = dVar215 * dVar210 - dVar202 * dVar214;
                  local_a48 = dVar214 * dVar224 + (dVar208 * dVar227 - dVar215 * dVar231);
                  local_a28 = (dVar214 * (dVar229 * dVar210 - dVar202 * dVar199) +
                              (dVar208 * dVar221 - dVar215 * dVar232)) / local_a48;
                  lVar187 = (long)(iVar181 - iVar153);
                  if ((pdVar57[lVar159 + lVar117 + lVar187] == 1.0) &&
                     (!NAN(pdVar57[lVar159 + lVar117 + lVar187]))) {
                    if ((pdVar57[lVar159 + lVar117 + ((iVar179 + -2) - iVar153)] == 1.0) &&
                       (((!NAN(pdVar57[lVar159 + lVar117 + ((iVar179 + -2) - iVar153)]) &&
                         (pdVar57[lVar159 + lVar117 + lVar165] == 1.0)) &&
                        (!NAN(pdVar57[lVar159 + lVar117 + lVar165]))))) {
                      dVar222 = pdVar42[lVar155 + lVar137 + lVar116] -
                                pdVar42[lVar155 + lVar116 + (int)((iVar179 + -2) - uVar31)];
                      dVar223 = pdVar42[lVar155 + lVar143 + lVar116] -
                                pdVar42[lVar155 + lVar137 + lVar116];
                      dVar222 = dVar222 + dVar222;
                      dVar223 = dVar223 + dVar223;
                      dVar208 = (pdVar42[lVar155 + lVar143 + lVar116] -
                                pdVar42[lVar155 + lVar116 + (int)((iVar179 + -2) - uVar31)]) * 0.5;
                      dVar216 = ABS(dVar222);
                      uVar193 = -(ulong)(0.0 < dVar208);
                      dVar208 = ABS(dVar208);
                      dVar200 = ABS(dVar223);
                      if (dVar216 <= dVar208) {
                        dVar208 = dVar216;
                      }
                      if (dVar208 <= dVar200) {
                        dVar200 = dVar208;
                      }
                      uVar201 = -(ulong)(0.0 < dVar222 * dVar223) & (ulong)dVar200;
                      local_a28 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                          uVar193 & uVar201);
                    }
                  }
                  dVar208 = dVar215 * dVar199 - dVar214 * dVar229;
                  dVar214 = (dVar214 * dVar208 + (dVar232 * dVar227 - dVar231 * dVar221)) /
                            local_a48;
                  if ((((pdVar57[lVar117 + lVar159 + lVar187] == 1.0) &&
                       (!NAN(pdVar57[lVar117 + lVar159 + lVar187]))) &&
                      ((pdVar57[lVar117 + lVar174 + lVar187] == 1.0 &&
                       ((!NAN(pdVar57[lVar117 + lVar174 + lVar187]) &&
                        (pdVar57[lVar117 + lVar142 + lVar187] == 1.0)))))) &&
                     (!NAN(pdVar57[lVar117 + lVar142 + lVar187]))) {
                    dVar200 = pdVar42[lVar155 + lVar137 + lVar116] -
                              pdVar42[lVar116 + lVar164 + lVar137];
                    dVar216 = pdVar42[lVar116 + lVar168 + lVar137] -
                              pdVar42[lVar155 + lVar137 + lVar116];
                    dVar200 = dVar200 + dVar200;
                    dVar216 = dVar216 + dVar216;
                    dVar214 = (pdVar42[lVar116 + lVar168 + lVar137] -
                              pdVar42[lVar116 + lVar164 + lVar137]) * 0.5;
                    dVar232 = ABS(dVar200);
                    uVar193 = -(ulong)(0.0 < dVar214);
                    dVar214 = ABS(dVar214);
                    dVar231 = ABS(dVar216);
                    if (dVar232 <= dVar214) {
                      dVar214 = dVar232;
                    }
                    if (dVar214 <= dVar231) {
                      dVar231 = dVar214;
                    }
                    uVar201 = -(ulong)(0.0 < dVar200 * dVar216) & (ulong)dVar231;
                    dVar214 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) | uVar193 & uVar201
                                      );
                  }
                  local_a48 = (dVar221 * dVar224 +
                              (dVar227 * (dVar202 * dVar199 - dVar210 * dVar229) - dVar208 * dVar215
                              )) / local_a48;
                  if (((((pdVar57[lVar159 + lVar187 + lVar117] == 1.0) &&
                        (!NAN(pdVar57[lVar159 + lVar187 + lVar117]))) &&
                       (pdVar57[lVar159 + lVar187 + lVar173] == 1.0)) &&
                      ((!NAN(pdVar57[lVar159 + lVar187 + lVar173]) &&
                       (pdVar57[lVar159 + lVar187 + lVar186] == 1.0)))) &&
                     (!NAN(pdVar57[lVar159 + lVar187 + lVar186]))) {
                    dVar224 = pdVar42[lVar155 + lVar137 + lVar116] -
                              pdVar42[lVar155 + lVar137 + lVar115];
                    dVar227 = pdVar42[lVar155 + lVar137 + lVar133] -
                              pdVar42[lVar155 + lVar137 + lVar116];
                    dVar224 = dVar224 + dVar224;
                    dVar227 = dVar227 + dVar227;
                    dVar202 = (pdVar42[lVar155 + lVar137 + lVar133] -
                              pdVar42[lVar155 + lVar137 + lVar115]) * 0.5;
                    uVar201 = (ulong)DAT_0077e240;
                    dVar215 = (double)((ulong)dVar224 & uVar201);
                    uVar193 = -(ulong)(0.0 < dVar202);
                    dVar202 = (double)((ulong)dVar202 & uVar201);
                    dVar210 = (double)((ulong)dVar227 & uVar201);
                    if (dVar215 <= dVar202) {
                      dVar202 = dVar215;
                    }
                    if (dVar202 <= dVar210) {
                      dVar210 = dVar202;
                    }
                    uVar201 = -(ulong)(0.0 < dVar224 * dVar227) & (ulong)dVar210;
                    local_a48 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  uVar32 = pEVar39[lVar141 + lVar112 + lVar167].flag;
                  iVar129 = 0;
                  iVar162 = 0;
                  iVar151 = 0;
                  iVar180 = 0;
                  uVar156 = 0xffffffff;
                  do {
                    uVar132 = uVar156 + 1;
                    uVar97 = 0xffffffff;
                    iVar178 = iVar129;
                    do {
                      uVar1 = uVar97 + 1;
                      iVar144 = 5;
                      do {
                        if (((uVar32 >> (iVar178 + iVar144 & 0x1fU) & 1) != 0) &&
                           ((iVar144 != 6 || uVar97 != 0) || uVar156 != 0)) {
                          iVar162 = iVar162 + (uint)((iVar144 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar97 == 0 && uVar156 == 0));
                          iVar151 = iVar151 + (uint)((iVar144 == 6 && uVar156 == 0) &&
                                                    (uVar1 & 0xfffffffd) == 0);
                          iVar180 = iVar180 + (uint)((iVar144 == 6 && uVar97 == 0) &&
                                                    (uVar132 & 0xfffffffd) == 0);
                        }
                        iVar144 = iVar144 + 1;
                      } while (iVar144 != 8);
                      iVar178 = iVar178 + 3;
                      uVar97 = uVar1;
                    } while (uVar1 != 2);
                    iVar129 = iVar129 + 9;
                    uVar156 = uVar132;
                  } while (uVar132 != 2);
                  dVar202 = *pdVar3;
                  dVar210 = pdVar3[lVar41];
                  dVar215 = pdVar3[lVar41 * 2];
                  dVar224 = 2.0;
                  if ((uVar32 >> 0x15 & 1) != 0) {
                    dVar227 = pdVar42[lVar155 + lVar137 + lVar116];
                    lVar167 = -1;
                    cVar148 = '\b';
                    auVar204._8_8_ = 0;
                    auVar204._0_8_ = dVar227;
                    dVar224 = dVar227;
                    do {
                      lVar122 = 0;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        do {
                          if (((int)lVar123 != 1 || ((int)lVar122 != 0 || (int)lVar167 != 0)) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar221 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar122) * lVar43 +
                                              (long)(iVar100 + (int)lVar123)];
                            dVar229 = dVar221;
                            if (dVar221 <= dVar224) {
                              dVar229 = dVar224;
                            }
                            dVar224 = dVar229;
                            if (dVar221 < auVar204._0_8_) {
                              auVar204._8_8_ = 0;
                              auVar204._0_8_ = dVar221;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar122 == 0;
                        lVar122 = lVar122 + 1;
                      } while (bVar192);
                      lVar167 = lVar167 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar167 != 2);
                    dVar221 = (((pdVar49 + lVar134 + lVar121 + (iVar181 - iVar29))[lVar54] - dVar215
                               ) * local_a48 +
                              (0.5 - dVar210) * dVar214 +
                              (pdVar49[lVar134 + lVar121 + (iVar181 - iVar29)] - dVar202) *
                              local_a28 + dVar227) - dVar227;
                    if (dVar221 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar221 < -1e-13) &&
                         (dVar224 = (auVar204._0_8_ - dVar227) / dVar221, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar227) / dVar221;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (2.0 <= dVar224) {
                      dVar224 = 2.0;
                    }
                  }
                  dVar227 = dVar224;
                  if ((short)uVar32 < 0) {
                    dVar221 = pdVar42[lVar155 + lVar137 + lVar116];
                    lVar167 = -1;
                    cVar148 = '\x05';
                    dVar229 = dVar221;
                    dVar227 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        do {
                          if (((int)lVar123 != 1 || ((int)lVar122 != 0 || (int)lVar167 != 0)) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar199 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar122) * lVar43 +
                                              (long)(iVar100 + (int)lVar123)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar227) {
                              dVar208 = dVar227;
                            }
                            dVar227 = dVar208;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar122 != 0;
                        lVar122 = lVar122 + 1;
                      } while (bVar192);
                      lVar167 = lVar167 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar167 != 2);
                    dVar199 = (((pdVar49 + lVar134 + lVar169 + (iVar181 - iVar29))[lVar54] - dVar215
                               ) * local_a48 +
                              -(dVar210 + 0.5) * dVar214 +
                              (pdVar49[lVar134 + lVar169 + (iVar181 - iVar29)] - dVar202) *
                              local_a28 + dVar221) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar199 < -1e-13) &&
                         (dVar227 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar221) / dVar199;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar224 = dVar227;
                  if ((uVar32 >> 0x13 & 1) != 0) {
                    dVar221 = pdVar42[lVar155 + lVar137 + lVar116];
                    lVar167 = -1;
                    cVar148 = '\x06';
                    auVar211._8_8_ = 0;
                    auVar211._0_8_ = dVar221;
                    dVar224 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        do {
                          if ((((int)lVar122 != 0 || (int)lVar167 != 0) || (int)lVar123 != 0) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar229 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar122) * lVar43 +
                                              (long)(iVar128 + (int)lVar123)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar224) {
                              dVar199 = dVar224;
                            }
                            dVar224 = dVar199;
                            if (dVar229 < auVar211._0_8_) {
                              auVar211._8_8_ = 0;
                              auVar211._0_8_ = dVar229;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 == 1);
                        lVar122 = lVar122 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar122 != 2);
                      lVar167 = lVar167 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar167 != 2);
                    dVar229 = ((pdVar2[lVar51] - dVar215) * local_a48 +
                              (*pdVar2 - dVar210) * dVar214 + (0.5 - dVar202) * local_a28 + dVar221)
                              - dVar221;
                    if (dVar229 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar224 = (auVar211._0_8_ - dVar221) / dVar229, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar221) / dVar229;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (dVar227 <= dVar224) {
                      dVar224 = dVar227;
                    }
                  }
                  dVar227 = dVar224;
                  if ((uVar32 >> 0x11 & 1) != 0) {
                    dVar221 = pdVar42[lVar155 + lVar137 + lVar116];
                    lVar167 = -1;
                    cVar148 = '\x05';
                    auVar212._8_8_ = 0;
                    auVar212._0_8_ = dVar221;
                    dVar227 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        do {
                          if (((int)lVar123 != 1 || ((int)lVar122 != 0 || (int)lVar167 != 0)) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar229 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar122) * lVar43 +
                                              (long)(iVar100 + (int)lVar123)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar227) {
                              dVar199 = dVar227;
                            }
                            dVar227 = dVar199;
                            if (dVar229 < auVar212._0_8_) {
                              auVar212._8_8_ = 0;
                              auVar212._0_8_ = dVar229;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 2);
                        lVar122 = lVar122 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar122 != 2);
                      lVar167 = lVar167 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar167 != 2);
                    dVar229 = (((pdVar46 + lVar147 + lVar113 + (iVar181 - iVar24))[lVar51] - dVar215
                               ) * local_a48 +
                              (pdVar46[lVar147 + lVar113 + (iVar181 - iVar24)] - dVar210) * dVar214
                              + (dVar221 - (dVar202 + 0.5) * local_a28)) - dVar221;
                    if (dVar229 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar227 = (auVar212._0_8_ - dVar221) / dVar229, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar221) / dVar229;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar224 = dVar227;
                  if ((uVar32 >> 0x1b & 1) != 0) {
                    dVar221 = pdVar42[lVar155 + lVar137 + lVar116];
                    cVar148 = '\x0e';
                    lVar167 = 0;
                    dVar229 = dVar221;
                    dVar224 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        do {
                          if (((int)lVar123 != 1 || ((int)lVar122 != 0 || (int)lVar167 != 0)) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar199 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar122) * lVar43 +
                                              (long)(iVar100 + (int)lVar123)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar224) {
                              dVar208 = dVar224;
                            }
                            dVar224 = dVar208;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 3);
                        lVar122 = lVar122 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar122 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar167 == 0;
                      lVar167 = lVar167 + 1;
                    } while (bVar192);
                    dVar199 = ((0.5 - dVar215) * local_a48 +
                              ((pdVar55 + lVar158 + lVar120 + (iVar181 - iVar130))[lVar59] - dVar210
                              ) * dVar214 +
                              (pdVar55[lVar158 + lVar120 + (iVar181 - iVar130)] - dVar202) *
                              local_a28 + dVar221) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar199 < -1e-13) &&
                         (dVar224 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar221) / dVar199;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (dVar227 <= dVar224) {
                      dVar224 = dVar227;
                    }
                  }
                  dVar227 = dVar224;
                  if ((uVar32 >> 9 & 1) != 0) {
                    dVar221 = pdVar42[lVar155 + lVar137 + lVar116];
                    cVar148 = '\x05';
                    auVar213._8_8_ = 0;
                    auVar213._0_8_ = dVar221;
                    lVar167 = -1;
                    dVar227 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        do {
                          if (((int)lVar123 != 1 || ((int)lVar122 != 0 || (int)lVar167 != 0)) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar229 = pdVar42[(iVar127 + (int)lVar167) * lVar44 +
                                              (iVar146 + (int)lVar122) * lVar43 +
                                              (long)(iVar100 + (int)lVar123)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar227) {
                              dVar199 = dVar227;
                            }
                            dVar227 = dVar199;
                            if (dVar229 < auVar213._0_8_) {
                              auVar213._8_8_ = 0;
                              auVar213._0_8_ = dVar229;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 3);
                        lVar122 = lVar122 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar122 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar167 != 0;
                      lVar167 = lVar167 + 1;
                    } while (bVar192);
                    dVar202 = ((((pdVar55 + lVar109 + lVar120 + (iVar181 - iVar130))[lVar59] -
                                dVar210) * dVar214 +
                               (pdVar55[lVar109 + lVar120 + (iVar181 - iVar130)] - dVar202) *
                               local_a28 + dVar221) - (dVar215 + 0.5) * local_a48) - dVar221;
                    if (dVar202 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar202 < -1e-13) &&
                         (dVar227 = (auVar213._0_8_ - dVar221) / dVar202, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar221) / dVar202;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar202 = 0.0;
                  if (1 < iVar162) {
                    dVar202 = dVar227;
                  }
                  dVar210 = 0.0;
                  if (1 < iVar151) {
                    dVar210 = dVar227;
                  }
                  dVar215 = 0.0;
                  if (1 < iVar180) {
                    dVar215 = dVar227;
                  }
                  dVar224 = pdVar57[lVar159 + lVar187 + lVar117];
                  if ((((dVar224 == 1.0) && (!NAN(dVar224))) &&
                      (pdVar57[lVar159 + lVar117 + (iVar176 + -2)] == 1.0)) &&
                     (((!NAN(pdVar57[lVar159 + lVar117 + (iVar176 + -2)]) &&
                       (pdVar57[lVar159 + lVar117 + lVar165] == 1.0)) &&
                      (!NAN(pdVar57[lVar159 + lVar117 + lVar165]))))) {
                    dVar202 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     ((pdVar57[lVar117 + lVar135 + lVar187] == 1.0 &&
                      (((!NAN(pdVar57[lVar117 + lVar135 + lVar187]) &&
                        (pdVar57[lVar117 + lVar136 + lVar187] == 1.0)) &&
                       (!NAN(pdVar57[lVar117 + lVar136 + lVar187]))))))) {
                    dVar210 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     (((pdVar57[lVar159 + lVar187 + lVar110] == 1.0 &&
                       ((!NAN(pdVar57[lVar159 + lVar187 + lVar110]) &&
                        (pdVar57[lVar159 + lVar187 + lVar111] == 1.0)))) &&
                      (!NAN(pdVar57[lVar159 + lVar187 + lVar111]))))) {
                    dVar215 = 1.0;
                  }
                  dVar203 = (0.5 - dVar209) * local_a28 * dVar202 + dVar6 +
                            (dVar203 - dVar5) * dVar214 * dVar210 +
                            (dVar207 - dVar7) * local_a48 * dVar215;
                  if (dVar203 <= dVar194) {
                    dVar194 = dVar203;
                  }
                  if (dVar228 <= dVar194) {
                    dVar228 = dVar194;
                  }
                  iVar162 = d_bcrec->bc[3];
                  if (iVar189 == iVar179) {
                    switch(d_bcrec->bc[0]) {
                    case 3:
                      iVar181 = ~uVar31 + iVar189;
LAB_00463df8:
                      dVar230 = pdVar42[lVar155 + iVar181 + lVar116];
                    case 1:
                    case 2:
                    case 4:
                      dVar228 = dVar230;
                      dVar230 = dVar228;
                      break;
                    case -1:
switchD_00463d96_caseD_ffffffff:
                      dVar228 = 0.0;
                      dVar230 = 0.0;
                    }
                  }
                  else if (iVar161 == iVar179) {
                    switch(iVar162) {
                    case 1:
                    case 2:
                    case 4:
                      dVar230 = dVar228;
                      break;
                    case 3:
                      iVar181 = iVar161 - uVar31;
                      goto LAB_00463df8;
                    case -1:
                      goto switchD_00463d96_caseD_ffffffff;
                    }
                  }
                  dVar207 = dVar230;
                  if ((iVar189 == iVar179) &&
                     (((d_bcrec->bc[0] == 4 || (d_bcrec->bc[0] == 2)) &&
                      (dVar228 = 0.0, dVar207 = 0.0, dVar230 <= 0.0)))) {
                    dVar228 = dVar230;
                    dVar207 = dVar230;
                  }
                  dVar203 = dVar228;
                  if (((iVar161 == iVar179) && ((iVar162 == 4 || (iVar162 == 2)))) &&
                     (dVar203 = 0.0, dVar207 = 0.0, 0.0 <= dVar228)) {
                    dVar203 = dVar228;
                    dVar207 = dVar228;
                  }
                  auVar206 = _DAT_0077bb30;
                  if ((0.0 <= dVar203) || (dVar207 <= 0.0)) {
                    dVar202 = (dVar207 + dVar203) * 0.5;
                    if ((dVar202 < 1e-08) && (dVar203 = 0.0, dVar202 <= -1e-08)) {
                      dVar203 = dVar207;
                    }
                  }
                  else {
                    dVar203 = 0.0;
                  }
                }
                pdVar34[(lVar108 - iVar13) * lVar40 +
                        (lVar119 - iVar12) * lVar38 + ((long)iVar179 - (long)iVar149)] = dVar203;
                iVar138 = iVar138 + 1;
                iVar128 = iVar128 + 1;
                iVar99 = iVar99 + 1;
                iVar101 = iVar101 + 1;
                iVar100 = iVar100 + 1;
                bVar192 = iVar179 != iVar17;
                iVar179 = iVar179 + 1;
              } while (bVar192);
            }
            bVar192 = iVar191 != iVar18;
            iVar191 = iVar191 + 1;
          } while (bVar192);
        }
        bVar192 = iVar10 != iVar11;
        iVar10 = iVar10 + 1;
      } while (bVar192);
    }
  }
  auVar198 = _DAT_0077bb40;
  pBVar33 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((((pBVar33[1].bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar189)) ||
       ((0xfffffffd < pBVar33[1].bc[3] - 5U && (iVar98 <= (ubx->bigend).vect[0])))) ||
      (((pBVar33[1].bc[1] - 3U < 2 && ((vbx->smallend).vect[1] + -1 <= iVar150)) ||
       ((0xfffffffd < pBVar33[1].bc[4] - 5U && (iVar8 <= (vbx->bigend).vect[1])))))) ||
     (((pBVar33[1].bc[2] - 3U < 2 && ((wbx->smallend).vect[2] + -1 <= iVar9)) ||
      ((0xfffffffd < pBVar33[1].bc[5] - 5U && (iVar139 <= (wbx->bigend).vect[2])))))) {
    iVar10 = (vbx->smallend).vect[0];
    iVar11 = (vbx->smallend).vect[1];
    iVar149 = (vbx->smallend).vect[2];
    iVar12 = (vbx->bigend).vect[0];
    iVar13 = (vbx->bigend).vect[1];
    uVar60 = *(undefined8 *)&(v->begin).z;
    uVar73 = (v->end).y;
    iVar14 = (vbx->bigend).vect[2];
    local_398.u.end.y = uVar73;
    local_398.u._52_8_ = *(undefined8 *)&(v->end).z;
    local_398.u.begin.x = (v->begin).x;
    local_398.u.begin.y = (v->begin).y;
    local_398.u.begin.z = (int)uVar60;
    local_398.u.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.u.kstride = v->kstride;
    local_398.u.nstride = v->nstride;
    local_398.u.p = v->p;
    local_398.u.jstride = v->jstride;
    uVar60 = *(undefined8 *)&(vcc->begin).z;
    uVar74 = (vcc->end).y;
    local_398.vcc.end.y = uVar74;
    local_398.vcc._52_8_ = *(undefined8 *)&(vcc->end).z;
    local_398.vcc.begin.x = (vcc->begin).x;
    local_398.vcc.begin.y = (vcc->begin).y;
    local_398.vcc.begin.z = (int)uVar60;
    local_398.vcc.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.vcc.kstride = vcc->kstride;
    local_398.vcc.nstride = vcc->nstride;
    local_398.vcc.p = vcc->p;
    local_398.vcc.jstride = vcc->jstride;
    uVar75 = (flag->end).x;
    uVar76 = (flag->end).y;
    local_398.flag.p = flag->p;
    local_398.flag.jstride = flag->jstride;
    local_398.flag.kstride = flag->kstride;
    local_398.flag.nstride = flag->nstride;
    local_398.flag.begin.x = (flag->begin).x;
    local_398.flag.begin.y = (flag->begin).y;
    local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
    local_398.flag.end.x = uVar75;
    local_398.flag.end.y = uVar76;
    local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    uVar77 = (ccc->end).x;
    uVar78 = (ccc->end).y;
    local_398.ccc.p = ccc->p;
    local_398.ccc.jstride = ccc->jstride;
    local_398.ccc.kstride = ccc->kstride;
    local_398.ccc.nstride = ccc->nstride;
    local_398.ccc.begin.x = (ccc->begin).x;
    local_398.ccc.begin.y = (ccc->begin).y;
    local_398.ccc.begin.z = (int)*(undefined8 *)&(ccc->begin).z;
    local_398.ccc.end.x = uVar77;
    local_398.ccc.end.y = uVar78;
    local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    uVar79 = (vfrac->end).x;
    uVar80 = (vfrac->end).y;
    local_398.vfrac.p = vfrac->p;
    local_398.vfrac.jstride = vfrac->jstride;
    local_398.vfrac.kstride = vfrac->kstride;
    local_398.vfrac.nstride = vfrac->nstride;
    local_398.vfrac.begin.x = (vfrac->begin).x;
    local_398.vfrac.begin.y = (vfrac->begin).y;
    local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
    local_398.vfrac.end.x = uVar79;
    local_398.vfrac.end.y = uVar80;
    local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_398.d_bcrec = d_bcrec;
    uVar60 = *(undefined8 *)&(fcx->begin).z;
    uVar81 = (fcx->end).y;
    local_398.fcx.end.y = uVar81;
    local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_398.fcx.begin.x = (fcx->begin).x;
    local_398.fcx.begin.y = (fcx->begin).y;
    local_398.fcx.begin.z = (int)uVar60;
    local_398.fcx.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.fcx.kstride = fcx->kstride;
    local_398.fcx.nstride = fcx->nstride;
    local_398.fcx.p = fcx->p;
    local_398.fcx.jstride = fcx->jstride;
    uVar60 = *(undefined8 *)&(fcy->begin).z;
    uVar82 = (fcy->end).y;
    local_398.fcy.end.y = uVar82;
    local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_398.fcy.begin.x = (fcy->begin).x;
    local_398.fcy.begin.y = (fcy->begin).y;
    local_398.fcy.begin.z = (int)uVar60;
    local_398.fcy.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.fcy.kstride = fcy->kstride;
    local_398.fcy.nstride = fcy->nstride;
    local_398.fcy.p = fcy->p;
    local_398.fcy.jstride = fcy->jstride;
    auVar234._0_4_ = (fcz->begin).x;
    auVar234._4_4_ = (fcz->begin).y;
    auVar234._8_4_ = (fcz->begin).z;
    uVar83 = (fcz->end).x;
    uVar84 = (fcz->end).y;
    local_398.fcz.p = fcz->p;
    local_398.fcz.jstride = fcz->jstride;
    local_398.fcz.kstride = fcz->kstride;
    local_398.fcz.nstride = fcz->nstride;
    local_398.fcz.begin._0_8_ = auVar234._0_8_;
    local_398.fcz.begin.z = auVar234._8_4_;
    local_398.fcz.end.x = uVar83;
    local_398.fcz.end.y = uVar84;
    local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_398.domain_ilo = iVar189;
    local_398.domain_jlo = iVar150;
    local_398.domain_klo = iVar9;
    local_398.domain_ihi = iVar98;
    local_398.domain_jhi = iVar8;
    local_398.domain_khi = iVar139;
    local_398.order = 2;
    if (iVar149 <= iVar14) {
      do {
        iVar184 = iVar11;
        if (iVar11 <= iVar13) {
          do {
            iVar188 = iVar10;
            if (iVar10 <= iVar12) {
              do {
                ExtrapVelToFacesBox::anon_class_552_16_3e0d00fb::operator()
                          ((anon_class_552_16_3e0d00fb *)&local_398,iVar188,iVar184,iVar149);
                iVar188 = iVar188 + 1;
              } while (iVar12 + 1 != iVar188);
            }
            bVar192 = iVar184 != iVar13;
            iVar184 = iVar184 + 1;
          } while (bVar192);
        }
        bVar192 = iVar149 != iVar14;
        iVar149 = iVar149 + 1;
      } while (bVar192);
    }
  }
  else {
    iVar10 = (vbx->smallend).vect[2];
    iVar11 = (vbx->bigend).vect[2];
    if (iVar10 <= iVar11) {
      pdVar34 = v->p;
      lVar38 = v->jstride;
      lVar40 = v->kstride;
      iVar149 = (v->begin).x;
      iVar12 = (v->begin).y;
      iVar13 = (v->begin).z;
      pdVar36 = ccc->p;
      lVar41 = ccc->nstride;
      iVar14 = (ccc->begin).x;
      lVar172 = (long)iVar14;
      uVar26 = (vfrac->begin).x;
      uVar27 = (vfrac->begin).z;
      uVar31 = (vcc->begin).y;
      iVar131 = iVar8 + 1;
      lVar43 = vcc->jstride;
      pdVar42 = vcc->p;
      lVar44 = vcc->nstride;
      iVar184 = (vbx->smallend).vect[0];
      iVar188 = (vcc->begin).x;
      iVar15 = (ccc->begin).z;
      iVar16 = (ccc->begin).y;
      iVar17 = (vbx->smallend).vect[1];
      iVar18 = (vbx->bigend).vect[0];
      iVar19 = (vbx->bigend).vect[1];
      lVar45 = vcc->kstride;
      iVar20 = (vcc->begin).z;
      pEVar39 = flag->p;
      lVar47 = flag->jstride;
      local_3b8 = flag->kstride;
      iVar21 = (flag->begin).x;
      iVar22 = (flag->begin).y;
      local_3c0 = (ulong)(flag->begin).z;
      local_3c8 = fcx->p;
      lVar48 = fcx->jstride;
      local_3d0 = fcx->kstride;
      lVar50 = fcx->nstride;
      iVar23 = (fcx->begin).x;
      iVar24 = (fcx->begin).y;
      iVar25 = (fcx->begin).z;
      local_3d8 = fcy->p;
      lVar51 = fcy->jstride;
      local_3e0 = fcy->kstride;
      lVar52 = fcy->nstride;
      iVar28 = (fcy->begin).x;
      iVar29 = (fcy->begin).y;
      local_3e8 = (double *)(long)(fcy->begin).z;
      local_3f0 = fcz->p;
      lVar53 = fcz->jstride;
      local_3a0 = fcz->kstride;
      lVar54 = fcz->nstride;
      iVar30 = (fcz->begin).x;
      iVar157 = (fcz->begin).y;
      local_3ac = (fcz->begin).z;
      lVar56 = ccc->jstride;
      lVar58 = ccc->kstride;
      pdVar46 = vfrac->p;
      lVar59 = vfrac->jstride;
      local_3a8 = vfrac->kstride;
      iVar130 = (vfrac->begin).y;
      lVar35 = lVar58 * 8;
      lVar37 = lVar56 * 8;
      local_3b0 = iVar17 + -1;
      auVar196 = _DAT_0077bb30;
      do {
        pdVar57 = local_3c8;
        pdVar55 = local_3d8;
        pdVar49 = local_3f0;
        if (iVar17 <= iVar19) {
          lVar108 = (long)iVar10;
          lVar158 = (~(long)iVar15 + lVar108) * lVar35;
          lVar140 = (lVar108 - local_3c0) * local_3b8;
          lVar105 = (lVar108 - (long)local_3e8) * local_3e0;
          iVar161 = iVar10 - iVar15;
          lVar106 = iVar161 * lVar58;
          iVar170 = iVar10 - iVar20;
          lVar173 = iVar170 * lVar45;
          lVar115 = local_3a8 * (int)(iVar10 - uVar27);
          lVar133 = (int)((iVar10 + -1) - uVar27) * local_3a8;
          lVar134 = (int)((iVar10 + 1) - uVar27) * local_3a8;
          lVar111 = ((iVar10 + -1) - iVar20) * lVar45;
          lVar112 = ((iVar10 + 1) - iVar20) * lVar45;
          lVar113 = (iVar10 - iVar25) * local_3d0;
          lVar114 = ((iVar10 - local_3ac) + 1) * local_3a0;
          lVar109 = (iVar10 - local_3ac) * local_3a0;
          lVar110 = (int)(~uVar27 + iVar10) * local_3a8;
          lVar107 = (int)((iVar10 - uVar27) + 1) * local_3a8;
          iVar153 = iVar17;
          iVar145 = local_3b0;
          do {
            if (iVar184 <= iVar18) {
              lVar186 = ((long)iVar145 + ~(long)iVar16) * lVar37;
              lVar116 = (iVar153 - iVar22) * lVar47;
              iVar179 = iVar153 + -1;
              iVar100 = iVar153 - iVar29;
              iVar99 = iVar179 - uVar31;
              lVar141 = iVar99 * lVar43;
              iVar101 = iVar153 - uVar31;
              lVar147 = iVar101 * lVar43;
              iVar128 = iVar153 - iVar130;
              lVar152 = lVar59 * iVar128;
              lVar155 = (iVar179 - iVar130) * lVar59;
              lVar117 = (iVar153 - iVar24) * lVar48;
              lVar118 = (iVar153 - iVar157) * lVar53;
              lVar119 = (((long)iVar153 - (long)iVar16) + -1) * lVar56;
              lVar120 = (iVar179 - iVar22) * lVar47;
              lVar135 = (iVar179 - iVar24) * lVar48;
              lVar136 = (iVar179 - iVar157) * lVar53;
              iVar127 = iVar184;
              iVar191 = (iVar184 + -1) - iVar14;
              iVar171 = (iVar184 + -1) - iVar188;
              iVar138 = iVar184 - iVar188;
              do {
                lVar164 = (long)iVar127;
                lVar159 = lVar164 - iVar21;
                uVar32 = pEVar39[lVar140 + lVar116 + lVar159].flag;
                dVar203 = 0.0;
                if ((short)uVar32 < 0) {
                  lVar168 = (long)pdVar36 + lVar164 * 8 + lVar186 + lVar158 + lVar172 * -8 + -8;
                  lVar169 = (long)pdVar36 +
                            lVar164 * 8 + lVar186 + lVar158 + lVar41 * 8 + lVar172 * -8 + -8;
                  lVar174 = (long)pdVar36 +
                            lVar164 * 8 + lVar186 + lVar158 + lVar41 * 0x10 + lVar172 * -8 + -8;
                  lVar121 = lVar164 - iVar28;
                  pdVar2 = pdVar55 + lVar105 + lVar51 * iVar100 + lVar121;
                  dVar203 = *pdVar2;
                  dVar207 = pdVar2[lVar52];
                  lVar142 = lVar164 - lVar172;
                  pdVar3 = pdVar36 + lVar106 + (iVar153 - iVar16) * lVar56 + lVar142;
                  dVar202 = *pdVar3;
                  dVar209 = pdVar3[lVar41];
                  dVar5 = pdVar3[lVar41 * 2];
                  lVar124 = (long)(iVar127 - iVar188);
                  dVar6 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                  dVar7 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                  lVar187 = -1;
                  cVar148 = '\x05';
                  lVar167 = 0;
                  do {
                    iVar102 = (int)lVar187;
                    lVar122 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar146 = (int)lVar122;
                      iVar162 = (int)lVar167;
                      ppdVar166 = &local_398.u.p + (long)iVar162 * 3;
                      lVar167 = 0;
                      do {
                        iVar181 = (int)lVar167;
                        if ((iVar181 == 1 && (iVar146 == 0 && iVar102 == 0)) ||
                           ((1 << (cVar183 + (char)lVar167 & 0x1fU) & uVar32) == 0)) {
                          *ppdVar166 = (double *)0x0;
                          ppdVar166[1] = (double *)0x0;
                          ppdVar166[2] = (double *)0x0;
                        }
                        else {
                          pdVar104 = pdVar36 + (iVar161 + iVar102) * lVar58 +
                                               ((iVar153 - iVar16) + iVar146) * lVar56 +
                                               (long)(iVar191 + iVar181);
                          auVar225._0_8_ = (*pdVar104 + (double)(iVar181 + -1)) - dVar202;
                          auVar225._8_8_ = (pdVar104[lVar41] + (double)iVar146) - dVar209;
                          *(undefined1 (*) [16])ppdVar166 = auVar225;
                          ppdVar166[2] = (double *)
                                         ((pdVar104[lVar41 * 2] + (double)iVar102) - dVar5);
                        }
                        lVar167 = lVar167 + 1;
                        ppdVar166 = ppdVar166 + 3;
                      } while (lVar167 != 3);
                      lVar122 = lVar122 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar167 = (long)iVar162 + 3;
                    } while (lVar122 != 2);
                    lVar187 = lVar187 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar167 = (long)iVar162 + 3;
                  } while (lVar187 != 2);
                  lVar187 = -1;
                  cVar148 = '\x05';
                  lVar167 = 0;
                  do {
                    lVar122 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar102 = (int)lVar167;
                      lVar167 = 0;
                      do {
                        dVar194 = 0.0;
                        if (((int)lVar167 != 1 || ((int)lVar122 != 0 || (int)lVar187 != 0)) &&
                           ((1 << (cVar183 + (char)lVar167 & 0x1fU) & uVar32) != 0)) {
                          dVar194 = pdVar42[lVar44 + (iVar170 + (int)lVar187) * lVar45 +
                                                     (iVar101 + (int)lVar122) * lVar43 +
                                                     (long)(iVar171 + (int)lVar167)] - dVar7;
                        }
                        adStack_108[iVar102 + lVar167] = dVar194;
                        lVar167 = lVar167 + 1;
                      } while (lVar167 != 3);
                      lVar122 = lVar122 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar167 = (long)iVar102 + 3;
                    } while (lVar122 != 2);
                    lVar187 = lVar187 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar167 = (long)iVar102 + 3;
                  } while (lVar187 != 2);
                  pdVar104 = &local_438;
                  lVar167 = 0;
                  do {
                    lVar187 = 0;
                    auVar195 = auVar196;
                    do {
                      auVar206 = auVar195 ^ auVar198;
                      if (auVar206._4_4_ == -0x80000000 && auVar206._0_4_ < -0x7ffffffd) {
                        *(undefined8 *)((long)pdVar104 + lVar187) = 0;
                        *(undefined8 *)((long)pdVar104 + lVar187 + 0x18) = 0;
                      }
                      lVar122 = auVar195._8_8_;
                      auVar195._0_8_ = auVar195._0_8_ + 2;
                      auVar195._8_8_ = lVar122 + 2;
                      lVar187 = lVar187 + 0x30;
                    } while (lVar187 != 0x60);
                    lVar167 = lVar167 + 1;
                    pdVar104 = pdVar104 + 1;
                  } while (lVar167 != 3);
                  dVar194 = dVar6;
                  if (dVar6 <= dVar7) {
                    dVar194 = dVar7;
                  }
                  dVar221 = 0.0;
                  dVar229 = 0.0;
                  dVar214 = 0.0;
                  pLVar126 = &local_398.u.kstride;
                  lVar167 = 0;
                  dVar228 = local_3f8;
                  dVar230 = local_438;
                  dVar210 = local_428;
                  dVar215 = local_430;
                  dVar224 = local_418;
                  dVar227 = dStack_410;
                  do {
                    dVar199 = (double)*pLVar126;
                    pdVar104 = ((Array4<double> *)(pLVar126 + -2))->p;
                    dVar231 = (double)pLVar126[-1];
                    dVar224 = dVar224 + dVar231 * (double)pLVar126[-1];
                    dVar227 = dVar227 + dVar231 * (double)*pLVar126;
                    dVar228 = dVar228 + dVar199 * dVar199;
                    dVar208 = adStack_108[lVar167];
                    dVar230 = dVar230 + (double)pdVar104 * (double)pdVar104;
                    dVar221 = dVar221 + dVar208 * (double)pdVar104;
                    dVar215 = dVar215 + dVar231 * (double)pdVar104;
                    dVar229 = dVar229 + dVar208 * dVar231;
                    dVar210 = dVar210 + dVar199 * (double)pdVar104;
                    dVar214 = dVar214 + dVar208 * dVar199;
                    lVar167 = lVar167 + 1;
                    pLVar126 = pLVar126 + 3;
                  } while (lVar167 != 0x1b);
                  dVar199 = dVar224 * dVar228 - dVar227 * dVar227;
                  dVar208 = dVar228 * dVar215 - dVar210 * dVar227;
                  dVar228 = dVar228 * dVar229 - dVar214 * dVar227;
                  dVar231 = dVar215 * dVar227 - dVar224 * dVar210;
                  local_9b8 = dVar210 * dVar231 + (dVar199 * dVar230 - dVar215 * dVar208);
                  local_8d8 = (dVar210 * (dVar229 * dVar227 - dVar224 * dVar214) +
                              (dVar199 * dVar221 - dVar215 * dVar228)) / local_9b8;
                  iVar102 = iVar127 - uVar26;
                  lVar167 = (long)iVar102;
                  if ((pdVar46[lVar152 + lVar115 + lVar167] == 1.0) &&
                     (!NAN(pdVar46[lVar152 + lVar115 + lVar167]))) {
                    if ((pdVar46[lVar152 + lVar115 + (int)((iVar127 + -1) - uVar26)] == 1.0) &&
                       (!NAN(pdVar46[lVar152 + lVar115 + (int)((iVar127 + -1) - uVar26)]))) {
                      if ((pdVar46[lVar152 + lVar115 + (int)((iVar127 + 1) - uVar26)] == 1.0) &&
                         (!NAN(pdVar46[lVar152 + lVar115 + (int)((iVar127 + 1) - uVar26)]))) {
                        dVar200 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44] -
                                  pdVar42[lVar147 + lVar173 + lVar44 + ((iVar127 + -1) - iVar188)];
                        dVar216 = pdVar42[lVar147 + lVar173 + lVar44 + ((iVar127 + 1) - iVar188)] -
                                  pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                        dVar200 = dVar200 + dVar200;
                        dVar216 = dVar216 + dVar216;
                        dVar199 = (pdVar42[lVar147 + lVar173 + lVar44 + ((iVar127 + 1) - iVar188)] -
                                  pdVar42[lVar147 + lVar173 + lVar44 + ((iVar127 + -1) - iVar188)])
                                  * 0.5;
                        dVar222 = ABS(dVar200);
                        uVar193 = -(ulong)(0.0 < dVar199);
                        dVar199 = ABS(dVar199);
                        dVar232 = ABS(dVar216);
                        if (dVar222 <= dVar199) {
                          dVar199 = dVar222;
                        }
                        if (dVar199 <= dVar232) {
                          dVar232 = dVar199;
                        }
                        uVar201 = -(ulong)(0.0 < dVar200 * dVar216) & (ulong)dVar232;
                        local_8d8 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                            uVar193 & uVar201);
                      }
                    }
                  }
                  dVar199 = dVar215 * dVar214 - dVar210 * dVar229;
                  local_978 = (dVar210 * dVar199 + (dVar228 * dVar230 - dVar208 * dVar221)) /
                              local_9b8;
                  if (((((pdVar46[lVar115 + lVar152 + lVar167] == 1.0) &&
                        (!NAN(pdVar46[lVar115 + lVar152 + lVar167]))) &&
                       (pdVar46[lVar115 + lVar155 + lVar167] == 1.0)) &&
                      ((!NAN(pdVar46[lVar115 + lVar155 + lVar167]) &&
                       (pdVar46[lVar115 + ((iVar153 + 1) - iVar130) * lVar59 + lVar167] == 1.0))))
                     && (!NAN(pdVar46[lVar115 + ((iVar153 + 1) - iVar130) * lVar59 + lVar167]))) {
                    dVar232 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44] -
                              pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    dVar200 = pdVar42[lVar44 + lVar173 + (int)((iVar153 + 1) - uVar31) * lVar43 +
                                                         lVar124] -
                              pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                    dVar232 = dVar232 + dVar232;
                    dVar200 = dVar200 + dVar200;
                    dVar228 = (pdVar42[lVar44 + lVar173 + (int)((iVar153 + 1) - uVar31) * lVar43 +
                                                          lVar124] -
                              pdVar42[lVar141 + lVar124 + lVar173 + lVar44]) * 0.5;
                    dVar208 = ABS(dVar232);
                    uVar193 = -(ulong)(0.0 < dVar228);
                    dVar228 = ABS(dVar228);
                    dVar210 = ABS(dVar200);
                    if (dVar208 <= dVar228) {
                      dVar228 = dVar208;
                    }
                    if (dVar228 <= dVar210) {
                      dVar210 = dVar228;
                    }
                    uVar201 = -(ulong)(0.0 < dVar232 * dVar200) & (ulong)dVar210;
                    local_978 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  local_9b8 = (dVar221 * dVar231 +
                              (dVar230 * (dVar224 * dVar214 - dVar227 * dVar229) - dVar199 * dVar215
                              )) / local_9b8;
                  if (((pdVar46[lVar152 + lVar167 + lVar115] == 1.0) &&
                      (!NAN(pdVar46[lVar152 + lVar167 + lVar115]))) &&
                     ((pdVar46[lVar152 + lVar167 + lVar133] == 1.0 &&
                      (((!NAN(pdVar46[lVar152 + lVar167 + lVar133]) &&
                        (pdVar46[lVar152 + lVar167 + lVar134] == 1.0)) &&
                       (!NAN(pdVar46[lVar152 + lVar167 + lVar134]))))))) {
                    dVar215 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44] -
                              pdVar42[lVar147 + lVar124 + lVar111 + lVar44];
                    dVar224 = pdVar42[lVar147 + lVar124 + lVar112 + lVar44] -
                              pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                    dVar215 = dVar215 + dVar215;
                    dVar224 = dVar224 + dVar224;
                    dVar228 = (pdVar42[lVar147 + lVar124 + lVar112 + lVar44] -
                              pdVar42[lVar147 + lVar124 + lVar111 + lVar44]) * 0.5;
                    dVar210 = ABS(dVar215);
                    uVar193 = -(ulong)(0.0 < dVar228);
                    dVar228 = ABS(dVar228);
                    dVar230 = ABS(dVar224);
                    if (dVar210 <= dVar228) {
                      dVar228 = dVar210;
                    }
                    if (dVar228 <= dVar230) {
                      dVar230 = dVar228;
                    }
                    uVar201 = -(ulong)(0.0 < dVar215 * dVar224) & (ulong)dVar230;
                    local_9b8 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  dVar228 = dVar6;
                  if (dVar7 <= dVar6) {
                    dVar228 = dVar7;
                  }
                  uVar32 = pEVar39[lVar140 + lVar116 + lVar159].flag;
                  iVar162 = 0;
                  iVar181 = 0;
                  iVar176 = 0;
                  iVar146 = 0;
                  uVar156 = 0xffffffff;
                  do {
                    uVar132 = uVar156 + 1;
                    uVar97 = 0xffffffff;
                    iVar129 = iVar162;
                    do {
                      uVar1 = uVar97 + 1;
                      iVar180 = 5;
                      do {
                        if (((uVar32 >> (iVar129 + iVar180 & 0x1fU) & 1) != 0) &&
                           ((iVar180 != 6 || uVar97 != 0) || uVar156 != 0)) {
                          iVar181 = iVar181 + (uint)((iVar180 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar97 == 0 && uVar156 == 0));
                          iVar176 = iVar176 + (uint)((iVar180 == 6 && uVar156 == 0) &&
                                                    (uVar1 & 0xfffffffd) == 0);
                          iVar146 = iVar146 + (uint)((iVar180 == 6 && uVar97 == 0) &&
                                                    (uVar132 & 0xfffffffd) == 0);
                        }
                        iVar180 = iVar180 + 1;
                      } while (iVar180 != 8);
                      iVar129 = iVar129 + 3;
                      uVar97 = uVar1;
                    } while (uVar1 != 2);
                    iVar162 = iVar162 + 9;
                    uVar156 = uVar132;
                  } while (uVar132 != 2);
                  dVar230 = *pdVar3;
                  dVar210 = pdVar3[lVar41];
                  dVar215 = pdVar3[lVar41 * 2];
                  dVar224 = 2.0;
                  dVar227 = 1.0;
                  if ((uVar32 >> 0x15 & 1) != 0) {
                    dVar214 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                    lVar187 = -1;
                    cVar148 = '\b';
                    dVar224 = dVar214;
                    dVar221 = dVar214;
                    do {
                      lVar122 = 0;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        dVar229 = dVar224;
                        do {
                          dVar224 = dVar229;
                          if (((int)lVar123 != 1 || ((int)lVar122 != 0 || (int)lVar187 != 0)) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar199 = pdVar42[lVar44 + (iVar170 + (int)lVar187) * lVar45 +
                                                       (iVar101 + (int)lVar122) * lVar43 +
                                                       (long)(iVar171 + (int)lVar123)];
                            dVar224 = dVar199;
                            if (dVar199 <= dVar229) {
                              dVar224 = dVar229;
                            }
                            if (dVar199 < dVar221) {
                              dVar221 = dVar199;
                            }
                          }
                          lVar123 = lVar123 + 1;
                          dVar229 = dVar224;
                        } while (lVar123 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar122 == 0;
                        lVar122 = lVar122 + 1;
                      } while (bVar192);
                      lVar187 = lVar187 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar187 != 2);
                    dVar229 = (((pdVar55 + lVar105 + (iVar100 + 1) * lVar51 + lVar121)[lVar52] -
                               dVar215) * local_9b8 +
                              (0.5 - dVar210) * local_978 +
                              (pdVar55[lVar105 + (iVar100 + 1) * lVar51 + lVar121] - dVar230) *
                              local_8d8 + dVar214) - dVar214;
                    if (dVar229 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar224 = (dVar221 - dVar214) / dVar229, 1.0 <= dVar224)) {
                        dVar224 = dVar227;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar214) / dVar229;
                      if (1.0 <= dVar224) {
                        dVar224 = dVar227;
                      }
                    }
                    if (2.0 <= dVar224) {
                      dVar224 = 2.0;
                    }
                  }
                  dVar214 = dVar224;
                  if ((short)uVar32 < 0) {
                    dVar221 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                    lVar187 = -1;
                    cVar148 = '\x05';
                    dVar229 = dVar221;
                    dVar214 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        do {
                          if (((int)lVar123 != 1 || ((int)lVar122 != 0 || (int)lVar187 != 0)) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar199 = pdVar42[lVar44 + (iVar170 + (int)lVar187) * lVar45 +
                                                       (iVar101 + (int)lVar122) * lVar43 +
                                                       (long)(iVar171 + (int)lVar123)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar214) {
                              dVar208 = dVar214;
                            }
                            dVar214 = dVar208;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar122 != 0;
                        lVar122 = lVar122 + 1;
                      } while (bVar192);
                      lVar187 = lVar187 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar187 != 2);
                    dVar199 = ((pdVar2[lVar52] - dVar215) * local_9b8 +
                              -(dVar210 + 0.5) * local_978 +
                              (*pdVar2 - dVar230) * local_8d8 + dVar221) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar214 = dVar227;
                      if ((dVar199 < -1e-13) &&
                         (dVar214 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar214)) {
                        dVar214 = dVar227;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar221) / dVar199;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar214) {
                      dVar214 = dVar224;
                    }
                  }
                  dVar224 = dVar214;
                  if ((uVar32 >> 0x13 & 1) != 0) {
                    dVar221 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                    lVar187 = -1;
                    cVar148 = '\x06';
                    dVar224 = dVar221;
                    dVar229 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = 0;
                        do {
                          if ((((int)lVar122 != 0 || (int)lVar187 != 0) || (int)lVar123 != 0) &&
                             ((1 << (cVar183 + (char)lVar123 & 0x1fU) & uVar32) != 0)) {
                            dVar199 = pdVar42[lVar44 + (iVar170 + (int)lVar187) * lVar45 +
                                                       (iVar101 + (int)lVar122) * lVar43 +
                                                       (long)(iVar138 + (int)lVar123)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar224) {
                              dVar208 = dVar224;
                            }
                            dVar224 = dVar208;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 == 1);
                        lVar122 = lVar122 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar122 != 2);
                      lVar187 = lVar187 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar187 != 2);
                    dVar199 = (((pdVar57 + lVar113 + lVar117 + ((iVar127 - iVar23) + 1))[lVar50] -
                               dVar215) * local_9b8 +
                              (pdVar57[lVar113 + lVar117 + ((iVar127 - iVar23) + 1)] - dVar210) *
                              local_978 + (0.5 - dVar230) * local_8d8 + dVar221) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar224 = dVar227;
                      if ((dVar199 < -1e-13) &&
                         (dVar224 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar224)) {
                        dVar224 = dVar227;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar221) / dVar199;
                      if (1.0 <= dVar224) {
                        dVar224 = dVar227;
                      }
                    }
                    if (dVar214 <= dVar224) {
                      dVar224 = dVar214;
                    }
                  }
                  dVar214 = dVar224;
                  if ((uVar32 >> 0x11 & 1) != 0) {
                    dVar221 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                    lVar187 = -1;
                    cVar148 = '\x05';
                    dVar214 = dVar221;
                    dVar229 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = -1;
                        do {
                          if ((((int)lVar122 != 0 || (int)lVar187 != 0) || (int)lVar123 != 0) &&
                             ((1 << (cVar183 + (char)lVar123 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar199 = pdVar42[lVar44 + (iVar170 + (int)lVar187) * lVar45 +
                                                       (iVar101 + (int)lVar122) * lVar43 +
                                                       (long)(iVar138 + (int)lVar123)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar214) {
                              dVar208 = dVar214;
                            }
                            dVar214 = dVar208;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 1);
                        lVar122 = lVar122 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar122 != 2);
                      lVar187 = lVar187 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar187 != 2);
                    dVar199 = (((pdVar57 + lVar113 + lVar117 + (iVar127 - iVar23))[lVar50] - dVar215
                               ) * local_9b8 +
                              (pdVar57[lVar113 + lVar117 + (iVar127 - iVar23)] - dVar210) *
                              local_978 + (dVar221 - (dVar230 + 0.5) * local_8d8)) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar214 = dVar227;
                      if ((dVar199 < -1e-13) &&
                         (dVar214 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar214)) {
                        dVar214 = dVar227;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar221) / dVar199;
                      if (1.0 <= dVar214) {
                        dVar214 = dVar227;
                      }
                    }
                    if (dVar224 <= dVar214) {
                      dVar214 = dVar224;
                    }
                  }
                  dVar224 = dVar214;
                  if ((uVar32 >> 0x1b & 1) != 0) {
                    dVar221 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                    cVar148 = '\x0e';
                    lVar187 = 0;
                    dVar224 = dVar221;
                    dVar229 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = -1;
                        do {
                          if ((((int)lVar122 != 0 || (int)lVar187 != 0) || (int)lVar123 != 0) &&
                             ((1 << (cVar183 + (char)lVar123 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar199 = pdVar42[lVar44 + (iVar170 + (int)lVar187) * lVar45 +
                                                       (iVar101 + (int)lVar122) * lVar43 +
                                                       (long)(iVar138 + (int)lVar123)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar224) {
                              dVar208 = dVar224;
                            }
                            dVar224 = dVar208;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 2);
                        lVar122 = lVar122 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar122 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar187 == 0;
                      lVar187 = lVar187 + 1;
                    } while (bVar192);
                    dVar199 = ((0.5 - dVar215) * local_9b8 +
                              ((pdVar49 + lVar114 + lVar118 + (iVar127 - iVar30))[lVar54] - dVar210)
                              * local_978 +
                              (pdVar49[lVar114 + lVar118 + (iVar127 - iVar30)] - dVar230) *
                              local_8d8 + dVar221) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar224 = dVar227;
                      if ((dVar199 < -1e-13) &&
                         (dVar224 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar224)) {
                        dVar224 = dVar227;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar221) / dVar199;
                      if (1.0 <= dVar224) {
                        dVar224 = dVar227;
                      }
                    }
                    if (dVar214 <= dVar224) {
                      dVar224 = dVar214;
                    }
                  }
                  dVar214 = dVar224;
                  if ((uVar32 >> 9 & 1) != 0) {
                    dVar221 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44];
                    cVar148 = '\x05';
                    lVar187 = -1;
                    dVar229 = dVar221;
                    dVar214 = dVar221;
                    do {
                      lVar122 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar123 = -1;
                        do {
                          if ((((int)lVar122 != 0 || (int)lVar187 != 0) || (int)lVar123 != 0) &&
                             ((1 << (cVar183 + (char)lVar123 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar199 = pdVar42[lVar44 + (iVar170 + (int)lVar187) * lVar45 +
                                                       (iVar101 + (int)lVar122) * lVar43 +
                                                       (long)(iVar138 + (int)lVar123)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar214) {
                              dVar208 = dVar214;
                            }
                            dVar214 = dVar208;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar123 = lVar123 + 1;
                        } while (lVar123 != 2);
                        lVar122 = lVar122 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar122 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar187 != 0;
                      lVar187 = lVar187 + 1;
                    } while (bVar192);
                    dVar230 = ((((pdVar49 + lVar109 + lVar118 + (iVar127 - iVar30))[lVar54] -
                                dVar210) * local_978 +
                               (pdVar49[lVar109 + lVar118 + (iVar127 - iVar30)] - dVar230) *
                               local_8d8 + dVar221) - (dVar215 + 0.5) * local_9b8) - dVar221;
                    if (dVar230 <= 1e-13) {
                      dVar214 = dVar227;
                      if ((dVar230 < -1e-13) &&
                         (dVar214 = (dVar229 - dVar221) / dVar230, 1.0 <= dVar214)) {
                        dVar214 = dVar227;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar221) / dVar230;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar214) {
                      dVar214 = dVar224;
                    }
                  }
                  dVar230 = 0.0;
                  if (1 < iVar181) {
                    dVar230 = dVar214;
                  }
                  dVar210 = 0.0;
                  if (1 < iVar176) {
                    dVar210 = dVar214;
                  }
                  dVar215 = 0.0;
                  if (1 < iVar146) {
                    dVar215 = dVar214;
                  }
                  dVar224 = pdVar46[lVar152 + lVar167 + lVar115];
                  if ((((dVar224 == 1.0) && (!NAN(dVar224))) &&
                      (pdVar46[lVar152 + lVar115 + (int)(~uVar26 + iVar127)] == 1.0)) &&
                     (((!NAN(pdVar46[lVar152 + lVar115 + (int)(~uVar26 + iVar127)]) &&
                       (pdVar46[lVar152 + lVar115 + (iVar102 + 1)] == 1.0)) &&
                      (!NAN(pdVar46[lVar152 + lVar115 + (iVar102 + 1)]))))) {
                    dVar230 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     ((pdVar46[lVar115 + lVar155 + lVar167] == 1.0 &&
                      (((!NAN(pdVar46[lVar115 + lVar155 + lVar167]) &&
                        (pdVar46[lVar115 + (iVar128 + 1) * lVar59 + lVar167] == 1.0)) &&
                       (!NAN(pdVar46[lVar115 + (iVar128 + 1) * lVar59 + lVar167]))))))) {
                    dVar210 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     (((pdVar46[lVar152 + lVar167 + lVar110] == 1.0 &&
                       ((!NAN(pdVar46[lVar152 + lVar167 + lVar110]) &&
                        (pdVar46[lVar152 + lVar167 + lVar107] == 1.0)))) &&
                      (!NAN(pdVar46[lVar152 + lVar167 + lVar107]))))) {
                    dVar215 = 1.0;
                  }
                  dVar209 = (((dVar203 - dVar202) * local_8d8 * dVar230 + dVar7) -
                            (dVar209 + 0.5) * local_978 * dVar210) +
                            (dVar207 - dVar5) * local_9b8 * dVar215;
                  dVar202 = dVar194;
                  if (dVar209 <= dVar194) {
                    dVar202 = dVar209;
                  }
                  pdVar3 = pdVar36 + lVar106 + lVar119 + lVar142;
                  dVar209 = pdVar36[lVar106 + lVar119 + lVar142];
                  dVar5 = pdVar3[lVar41];
                  dVar7 = pdVar3[lVar41 * 2];
                  uVar32 = pEVar39[lVar140 + lVar120 + lVar159].flag;
                  lVar142 = -1;
                  cVar148 = '\x05';
                  lVar187 = 0;
                  do {
                    lVar143 = -1;
                    lVar122 = lVar168;
                    lVar123 = lVar174;
                    lVar137 = lVar169;
                    cVar183 = cVar148;
                    do {
                      iVar146 = (int)lVar187;
                      ppdVar166 = &local_398.u.p + (long)iVar146 * 3;
                      lVar187 = 0;
                      do {
                        if (((int)lVar187 == 1 && ((int)lVar143 == 0 && (int)lVar142 == 0)) ||
                           ((1 << (cVar183 + (char)lVar187 & 0x1fU) & uVar32) == 0)) {
                          *ppdVar166 = (double *)0x0;
                          ppdVar166[1] = (double *)0x0;
                          ppdVar166[2] = (double *)0x0;
                        }
                        else {
                          dVar230 = *(double *)(lVar137 + lVar187 * 8);
                          *ppdVar166 = (double *)
                                       ((*(double *)(lVar122 + lVar187 * 8) +
                                        (double)((int)lVar187 + -1)) - dVar209);
                          ppdVar166[1] = (double *)((dVar230 + (double)(int)lVar143) - dVar5);
                          ppdVar166[2] = (double *)
                                         ((*(double *)(lVar123 + lVar187 * 8) + (double)(int)lVar142
                                          ) - pdVar3[lVar41 * 2]);
                        }
                        lVar187 = lVar187 + 1;
                        ppdVar166 = ppdVar166 + 3;
                      } while (lVar187 != 3);
                      lVar143 = lVar143 + 1;
                      lVar122 = lVar122 + lVar56 * 8;
                      lVar137 = lVar137 + lVar37;
                      lVar123 = lVar123 + lVar37;
                      cVar183 = cVar183 + '\x03';
                      lVar187 = (long)iVar146 + 3;
                    } while (lVar143 != 2);
                    lVar142 = lVar142 + 1;
                    lVar168 = lVar168 + lVar58 * 8;
                    lVar169 = lVar169 + lVar35;
                    lVar174 = lVar174 + lVar35;
                    cVar148 = cVar148 + '\t';
                    lVar187 = (long)iVar146 + 3;
                  } while (lVar142 != 2);
                  dVar230 = dVar228;
                  if (dVar228 <= dVar202) {
                    dVar230 = dVar202;
                  }
                  lVar169 = -1;
                  cVar148 = '\x05';
                  lVar168 = 0;
                  do {
                    lVar174 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar146 = (int)lVar168;
                      lVar168 = 0;
                      do {
                        dVar202 = 0.0;
                        if (((int)lVar168 != 1 || ((int)lVar174 != 0 || (int)lVar169 != 0)) &&
                           ((1 << (cVar183 + (char)lVar168 & 0x1fU) & uVar32) != 0)) {
                          dVar202 = pdVar42[lVar44 + (iVar170 + (int)lVar169) * lVar45 +
                                                     (iVar99 + (int)lVar174) * lVar43 +
                                                     (long)(iVar171 + (int)lVar168)] -
                                    pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                        }
                        adStack_108[iVar146 + lVar168] = dVar202;
                        lVar168 = lVar168 + 1;
                      } while (lVar168 != 3);
                      lVar174 = lVar174 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar168 = (long)iVar146 + 3;
                    } while (lVar174 != 2);
                    lVar169 = lVar169 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar168 = (long)iVar146 + 3;
                  } while (lVar169 != 2);
                  pdVar104 = &local_438;
                  lVar168 = 0;
                  do {
                    lVar169 = 0;
                    auVar196 = _DAT_0077bb30;
                    do {
                      auVar206 = auVar196 ^ auVar198;
                      if (auVar206._4_4_ == -0x80000000 && auVar206._0_4_ < -0x7ffffffd) {
                        *(undefined8 *)((long)pdVar104 + lVar169) = 0;
                        *(undefined8 *)((long)pdVar104 + lVar169 + 0x18) = 0;
                      }
                      lVar174 = auVar196._8_8_;
                      auVar196._0_8_ = auVar196._0_8_ + 2;
                      auVar196._8_8_ = lVar174 + 2;
                      lVar169 = lVar169 + 0x30;
                    } while (lVar169 != 0x60);
                    lVar168 = lVar168 + 1;
                    pdVar104 = pdVar104 + 1;
                  } while (lVar168 != 3);
                  dVar229 = 0.0;
                  dVar199 = 0.0;
                  dVar221 = 0.0;
                  pLVar126 = &local_398.u.kstride;
                  lVar168 = 0;
                  dVar202 = local_438;
                  dVar210 = local_418;
                  dVar215 = dStack_410;
                  dVar224 = local_3f8;
                  dVar227 = local_428;
                  dVar214 = local_430;
                  do {
                    dVar208 = (double)*pLVar126;
                    pdVar104 = ((Array4<double> *)(pLVar126 + -2))->p;
                    dVar232 = (double)pLVar126[-1];
                    dVar210 = dVar210 + dVar232 * (double)pLVar126[-1];
                    dVar215 = dVar215 + dVar232 * (double)*pLVar126;
                    dVar224 = dVar224 + dVar208 * dVar208;
                    dVar231 = adStack_108[lVar168];
                    dVar202 = dVar202 + (double)pdVar104 * (double)pdVar104;
                    dVar229 = dVar229 + dVar231 * (double)pdVar104;
                    dVar214 = dVar214 + dVar232 * (double)pdVar104;
                    dVar199 = dVar199 + dVar231 * dVar232;
                    dVar227 = dVar227 + dVar208 * (double)pdVar104;
                    dVar221 = dVar221 + dVar231 * dVar208;
                    lVar168 = lVar168 + 1;
                    pLVar126 = pLVar126 + 3;
                  } while (lVar168 != 0x1b);
                  dVar208 = dVar210 * dVar224 - dVar215 * dVar215;
                  dVar231 = dVar224 * dVar214 - dVar227 * dVar215;
                  dVar232 = dVar224 * dVar199 - dVar221 * dVar215;
                  dVar224 = dVar214 * dVar215 - dVar210 * dVar227;
                  local_a48 = dVar227 * dVar224 + (dVar208 * dVar202 - dVar214 * dVar231);
                  local_a28 = (dVar227 * (dVar199 * dVar215 - dVar210 * dVar221) +
                              (dVar208 * dVar229 - dVar214 * dVar232)) / local_a48;
                  if ((pdVar46[lVar155 + lVar115 + lVar167] == 1.0) &&
                     (!NAN(pdVar46[lVar155 + lVar115 + lVar167]))) {
                    if ((pdVar46[lVar155 + lVar115 + (int)((iVar127 + -1) - uVar26)] == 1.0) &&
                       (!NAN(pdVar46[lVar155 + lVar115 + (int)((iVar127 + -1) - uVar26)]))) {
                      if ((pdVar46[lVar155 + lVar115 + (int)((iVar127 + 1) - uVar26)] == 1.0) &&
                         (!NAN(pdVar46[lVar155 + lVar115 + (int)((iVar127 + 1) - uVar26)]))) {
                        dVar222 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44] -
                                  pdVar42[lVar141 + lVar173 + lVar44 + ((iVar127 + -1) - iVar188)];
                        dVar223 = pdVar42[lVar141 + lVar173 + lVar44 + ((iVar127 + 1) - iVar188)] -
                                  pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                        dVar222 = dVar222 + dVar222;
                        dVar223 = dVar223 + dVar223;
                        dVar208 = (pdVar42[lVar141 + lVar173 + lVar44 + ((iVar127 + 1) - iVar188)] -
                                  pdVar42[lVar141 + lVar173 + lVar44 + ((iVar127 + -1) - iVar188)])
                                  * 0.5;
                        dVar216 = ABS(dVar222);
                        uVar193 = -(ulong)(0.0 < dVar208);
                        dVar208 = ABS(dVar208);
                        dVar200 = ABS(dVar223);
                        if (dVar216 <= dVar208) {
                          dVar208 = dVar216;
                        }
                        if (dVar208 <= dVar200) {
                          dVar200 = dVar208;
                        }
                        uVar201 = -(ulong)(0.0 < dVar222 * dVar223) & (ulong)dVar200;
                        local_a28 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                            uVar193 & uVar201);
                      }
                    }
                  }
                  dVar208 = dVar214 * dVar221 - dVar227 * dVar199;
                  dVar227 = (dVar227 * dVar208 + (dVar232 * dVar202 - dVar231 * dVar229)) /
                            local_a48;
                  if (((((pdVar46[lVar115 + lVar155 + lVar167] == 1.0) &&
                        (!NAN(pdVar46[lVar115 + lVar155 + lVar167]))) &&
                       (pdVar46[lVar115 + ((iVar153 + -2) - iVar130) * lVar59 + lVar167] == 1.0)) &&
                      ((!NAN(pdVar46[lVar115 + ((iVar153 + -2) - iVar130) * lVar59 + lVar167]) &&
                       (pdVar46[lVar115 + lVar152 + lVar167] == 1.0)))) &&
                     (!NAN(pdVar46[lVar115 + lVar152 + lVar167]))) {
                    dVar232 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44] -
                              pdVar42[lVar44 + lVar173 + (int)((iVar153 + -2) - uVar31) * lVar43 +
                                                         lVar124];
                    dVar200 = pdVar42[lVar147 + lVar124 + lVar173 + lVar44] -
                              pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    dVar232 = dVar232 + dVar232;
                    dVar200 = dVar200 + dVar200;
                    dVar227 = (pdVar42[lVar147 + lVar124 + lVar173 + lVar44] -
                              pdVar42[lVar44 + lVar173 + (int)((iVar153 + -2) - uVar31) * lVar43 +
                                                         lVar124]) * 0.5;
                    dVar216 = ABS(dVar232);
                    uVar193 = -(ulong)(0.0 < dVar227);
                    dVar227 = ABS(dVar227);
                    dVar231 = ABS(dVar200);
                    if (dVar216 <= dVar227) {
                      dVar227 = dVar216;
                    }
                    if (dVar227 <= dVar231) {
                      dVar231 = dVar227;
                    }
                    uVar201 = -(ulong)(0.0 < dVar232 * dVar200) & (ulong)dVar231;
                    dVar227 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) | uVar193 & uVar201
                                      );
                  }
                  local_a48 = (dVar229 * dVar224 +
                              (dVar202 * (dVar210 * dVar221 - dVar215 * dVar199) - dVar208 * dVar214
                              )) / local_a48;
                  if (((pdVar46[lVar155 + lVar167 + lVar115] == 1.0) &&
                      (!NAN(pdVar46[lVar155 + lVar167 + lVar115]))) &&
                     ((pdVar46[lVar155 + lVar167 + lVar133] == 1.0 &&
                      (((!NAN(pdVar46[lVar155 + lVar167 + lVar133]) &&
                        (pdVar46[lVar155 + lVar167 + lVar134] == 1.0)) &&
                       (!NAN(pdVar46[lVar155 + lVar167 + lVar134]))))))) {
                    dVar224 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44] -
                              pdVar42[lVar141 + lVar124 + lVar111 + lVar44];
                    dVar214 = pdVar42[lVar141 + lVar124 + lVar112 + lVar44] -
                              pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    dVar224 = dVar224 + dVar224;
                    dVar214 = dVar214 + dVar214;
                    dVar210 = (pdVar42[lVar141 + lVar124 + lVar112 + lVar44] -
                              pdVar42[lVar141 + lVar124 + lVar111 + lVar44]) * 0.5;
                    dVar215 = ABS(dVar224);
                    uVar193 = -(ulong)(0.0 < dVar210);
                    dVar210 = ABS(dVar210);
                    dVar202 = ABS(dVar214);
                    if (dVar215 <= dVar210) {
                      dVar210 = dVar215;
                    }
                    if (dVar210 <= dVar202) {
                      dVar202 = dVar210;
                    }
                    uVar201 = -(ulong)(0.0 < dVar224 * dVar214) & (ulong)dVar202;
                    local_a48 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  uVar32 = pEVar39[lVar140 + lVar120 + lVar159].flag;
                  iVar162 = 0;
                  iVar181 = 0;
                  iVar176 = 0;
                  iVar146 = 0;
                  uVar156 = 0xffffffff;
                  do {
                    uVar132 = uVar156 + 1;
                    uVar97 = 0xffffffff;
                    iVar129 = iVar162;
                    do {
                      uVar1 = uVar97 + 1;
                      iVar180 = 5;
                      do {
                        if (((uVar32 >> (iVar129 + iVar180 & 0x1fU) & 1) != 0) &&
                           ((iVar180 != 6 || uVar97 != 0) || uVar156 != 0)) {
                          iVar181 = iVar181 + (uint)((iVar180 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar97 == 0 && uVar156 == 0));
                          iVar176 = iVar176 + (uint)((iVar180 == 6 && uVar156 == 0) &&
                                                    (uVar1 & 0xfffffffd) == 0);
                          iVar146 = iVar146 + (uint)((iVar180 == 6 && uVar97 == 0) &&
                                                    (uVar132 & 0xfffffffd) == 0);
                        }
                        iVar180 = iVar180 + 1;
                      } while (iVar180 != 8);
                      iVar129 = iVar129 + 3;
                      uVar97 = uVar1;
                    } while (uVar1 != 2);
                    iVar162 = iVar162 + 9;
                    uVar156 = uVar132;
                  } while (uVar132 != 2);
                  dVar202 = *pdVar3;
                  dVar210 = pdVar3[lVar41];
                  dVar215 = pdVar3[lVar41 * 2];
                  dVar224 = 2.0;
                  if ((uVar32 >> 0x15 & 1) != 0) {
                    dVar214 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    lVar159 = -1;
                    cVar148 = '\b';
                    auVar217._8_8_ = 0;
                    auVar217._0_8_ = dVar214;
                    dVar224 = dVar214;
                    do {
                      lVar168 = 0;
                      cVar183 = cVar148;
                      do {
                        lVar169 = -1;
                        do {
                          if ((((int)lVar168 != 0 || (int)lVar159 != 0) || (int)lVar169 != 0) &&
                             ((1 << (cVar183 + (char)lVar169 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar221 = pdVar42[lVar44 + (iVar170 + (int)lVar159) * lVar45 +
                                                       (iVar99 + (int)lVar168) * lVar43 +
                                                       (long)(iVar138 + (int)lVar169)];
                            dVar229 = dVar221;
                            if (dVar221 <= dVar224) {
                              dVar229 = dVar224;
                            }
                            dVar224 = dVar229;
                            if (dVar221 < auVar217._0_8_) {
                              auVar217._8_8_ = 0;
                              auVar217._0_8_ = dVar221;
                            }
                          }
                          lVar169 = lVar169 + 1;
                        } while (lVar169 != 2);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar168 == 0;
                        lVar168 = lVar168 + 1;
                      } while (bVar192);
                      lVar159 = lVar159 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar159 != 2);
                    dVar221 = ((pdVar2[lVar52] - dVar215) * local_a48 +
                              (0.5 - dVar210) * dVar227 + (*pdVar2 - dVar202) * local_a28 + dVar214)
                              - dVar214;
                    if (dVar221 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar221 < -1e-13) &&
                         (dVar224 = (auVar217._0_8_ - dVar214) / dVar221, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar214) / dVar221;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (2.0 <= dVar224) {
                      dVar224 = 2.0;
                    }
                  }
                  dVar214 = dVar224;
                  if ((short)uVar32 < 0) {
                    dVar221 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    lVar159 = -1;
                    cVar148 = '\x05';
                    dVar229 = dVar221;
                    dVar214 = dVar221;
                    do {
                      lVar168 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar169 = -1;
                        dVar199 = dVar214;
                        do {
                          dVar214 = dVar199;
                          if ((((int)lVar168 != 0 || (int)lVar159 != 0) || (int)lVar169 != 0) &&
                             ((1 << (cVar183 + (char)lVar169 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar208 = pdVar42[lVar44 + (iVar170 + (int)lVar159) * lVar45 +
                                                       (iVar99 + (int)lVar168) * lVar43 +
                                                       (long)(iVar138 + (int)lVar169)];
                            dVar214 = dVar208;
                            if (dVar208 <= dVar199) {
                              dVar214 = dVar199;
                            }
                            if (dVar208 < dVar229) {
                              dVar229 = dVar208;
                            }
                          }
                          lVar169 = lVar169 + 1;
                          dVar199 = dVar214;
                        } while (lVar169 != 2);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar168 != 0;
                        lVar168 = lVar168 + 1;
                      } while (bVar192);
                      lVar159 = lVar159 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar159 != 2);
                    dVar199 = (((pdVar55 + lVar105 + (iVar179 - iVar29) * lVar51 + lVar121)[lVar52]
                               - dVar215) * local_a48 +
                              -(dVar210 + 0.5) * dVar227 +
                              (pdVar55[lVar105 + (iVar179 - iVar29) * lVar51 + lVar121] - dVar202) *
                              local_a28 + dVar221) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar214 = 1.0;
                      if ((dVar199 < -1e-13) &&
                         (dVar214 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar214)) {
                        dVar214 = 1.0;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar221) / dVar199;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar214) {
                      dVar214 = dVar224;
                    }
                  }
                  dVar224 = dVar214;
                  if ((uVar32 >> 0x13 & 1) != 0) {
                    dVar221 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    lVar159 = -1;
                    cVar148 = '\x06';
                    auVar218._8_8_ = 0;
                    auVar218._0_8_ = dVar221;
                    dVar224 = dVar221;
                    do {
                      lVar168 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar169 = 0;
                        do {
                          if ((((int)lVar168 != 0 || (int)lVar159 != 0) || (int)lVar169 != 0) &&
                             ((1 << (cVar183 + (char)lVar169 & 0x1fU) & uVar32) != 0)) {
                            dVar229 = pdVar42[lVar44 + (iVar170 + (int)lVar159) * lVar45 +
                                                       (iVar99 + (int)lVar168) * lVar43 +
                                                       (long)(iVar138 + (int)lVar169)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar224) {
                              dVar199 = dVar224;
                            }
                            dVar224 = dVar199;
                            if (dVar229 < auVar218._0_8_) {
                              auVar218._8_8_ = 0;
                              auVar218._0_8_ = dVar229;
                            }
                          }
                          lVar169 = lVar169 + 1;
                        } while (lVar169 == 1);
                        lVar168 = lVar168 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar168 != 2);
                      lVar159 = lVar159 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar159 != 2);
                    dVar229 = (((pdVar57 + lVar113 + lVar135 + ((iVar127 - iVar23) + 1))[lVar50] -
                               dVar215) * local_a48 +
                              (pdVar57[lVar113 + lVar135 + ((iVar127 - iVar23) + 1)] - dVar210) *
                              dVar227 + (0.5 - dVar202) * local_a28 + dVar221) - dVar221;
                    if (dVar229 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar224 = (auVar218._0_8_ - dVar221) / dVar229, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar221) / dVar229;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (dVar214 <= dVar224) {
                      dVar224 = dVar214;
                    }
                  }
                  dVar214 = dVar224;
                  if ((uVar32 >> 0x11 & 1) != 0) {
                    dVar221 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    lVar159 = -1;
                    cVar148 = '\x05';
                    auVar219._8_8_ = 0;
                    auVar219._0_8_ = dVar221;
                    dVar214 = dVar221;
                    do {
                      lVar168 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar169 = -1;
                        do {
                          if ((((int)lVar168 != 0 || (int)lVar159 != 0) || (int)lVar169 != 0) &&
                             ((1 << (cVar183 + (char)lVar169 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar229 = pdVar42[lVar44 + (iVar170 + (int)lVar159) * lVar45 +
                                                       (iVar99 + (int)lVar168) * lVar43 +
                                                       (long)(iVar138 + (int)lVar169)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar214) {
                              dVar199 = dVar214;
                            }
                            dVar214 = dVar199;
                            if (dVar229 < auVar219._0_8_) {
                              auVar219._8_8_ = 0;
                              auVar219._0_8_ = dVar229;
                            }
                          }
                          lVar169 = lVar169 + 1;
                        } while (lVar169 != 1);
                        lVar168 = lVar168 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar168 != 2);
                      lVar159 = lVar159 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar159 != 2);
                    dVar229 = (((pdVar57 + lVar113 + lVar135 + (iVar127 - iVar23))[lVar50] - dVar215
                               ) * local_a48 +
                              (pdVar57[lVar113 + lVar135 + (iVar127 - iVar23)] - dVar210) * dVar227
                              + (dVar221 - (dVar202 + 0.5) * local_a28)) - dVar221;
                    if (dVar229 <= 1e-13) {
                      dVar214 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar214 = (auVar219._0_8_ - dVar221) / dVar229, 1.0 <= dVar214)) {
                        dVar214 = 1.0;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar221) / dVar229;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar214) {
                      dVar214 = dVar224;
                    }
                  }
                  dVar221 = 1.0;
                  dVar224 = dVar214;
                  if ((uVar32 >> 0x1b & 1) != 0) {
                    dVar229 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    cVar148 = '\x0e';
                    lVar159 = 0;
                    dVar199 = dVar229;
                    dVar224 = dVar229;
                    do {
                      lVar168 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar169 = -1;
                        do {
                          if ((((int)lVar168 != 0 || (int)lVar159 != 0) || (int)lVar169 != 0) &&
                             ((1 << (cVar183 + (char)lVar169 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar208 = pdVar42[lVar44 + (iVar170 + (int)lVar159) * lVar45 +
                                                       (iVar99 + (int)lVar168) * lVar43 +
                                                       (long)(iVar138 + (int)lVar169)];
                            dVar231 = dVar208;
                            if (dVar208 <= dVar224) {
                              dVar231 = dVar224;
                            }
                            dVar224 = dVar231;
                            if (dVar208 < dVar199) {
                              dVar199 = dVar208;
                            }
                          }
                          lVar169 = lVar169 + 1;
                        } while (lVar169 != 2);
                        lVar168 = lVar168 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar168 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar159 == 0;
                      lVar159 = lVar159 + 1;
                    } while (bVar192);
                    dVar208 = ((0.5 - dVar215) * local_a48 +
                              ((pdVar49 + lVar114 + lVar136 + (iVar127 - iVar30))[lVar54] - dVar210)
                              * dVar227 +
                              (pdVar49[lVar114 + lVar136 + (iVar127 - iVar30)] - dVar202) *
                              local_a28 + dVar229) - dVar229;
                    if (dVar208 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar208 < -1e-13) &&
                         (dVar224 = (dVar199 - dVar229) / dVar208, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar229) / dVar208;
                      if (1.0 <= dVar224) {
                        dVar224 = dVar221;
                      }
                    }
                    if (dVar214 <= dVar224) {
                      dVar224 = dVar214;
                    }
                  }
                  dVar214 = dVar224;
                  if ((uVar32 >> 9 & 1) != 0) {
                    dVar229 = pdVar42[lVar141 + lVar124 + lVar173 + lVar44];
                    cVar148 = '\x05';
                    auVar220._8_8_ = 0;
                    auVar220._0_8_ = dVar229;
                    lVar159 = -1;
                    dVar214 = dVar229;
                    do {
                      lVar168 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar169 = -1;
                        do {
                          if ((((int)lVar168 != 0 || (int)lVar159 != 0) || (int)lVar169 != 0) &&
                             ((1 << (cVar183 + (char)lVar169 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar199 = pdVar42[lVar44 + (iVar170 + (int)lVar159) * lVar45 +
                                                       (iVar99 + (int)lVar168) * lVar43 +
                                                       (long)(iVar138 + (int)lVar169)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar214) {
                              dVar208 = dVar214;
                            }
                            dVar214 = dVar208;
                            if (dVar199 < auVar220._0_8_) {
                              auVar220._8_8_ = 0;
                              auVar220._0_8_ = dVar199;
                            }
                          }
                          lVar169 = lVar169 + 1;
                        } while (lVar169 != 2);
                        lVar168 = lVar168 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar168 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar159 != 0;
                      lVar159 = lVar159 + 1;
                    } while (bVar192);
                    dVar202 = ((((pdVar49 + lVar109 + lVar136 + (iVar127 - iVar30))[lVar54] -
                                dVar210) * dVar227 +
                               (pdVar49[lVar109 + lVar136 + (iVar127 - iVar30)] - dVar202) *
                               local_a28 + dVar229) - (dVar215 + 0.5) * local_a48) - dVar229;
                    if (dVar202 <= 1e-13) {
                      dVar214 = dVar221;
                      if ((dVar202 < -1e-13) &&
                         (dVar214 = (auVar220._0_8_ - dVar229) / dVar202, 1.0 <= dVar214)) {
                        dVar214 = dVar221;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar229) / dVar202;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar214) {
                      dVar214 = dVar224;
                    }
                  }
                  dVar202 = 0.0;
                  if (1 < iVar181) {
                    dVar202 = dVar214;
                  }
                  dVar210 = 0.0;
                  if (1 < iVar176) {
                    dVar210 = dVar214;
                  }
                  dVar215 = 0.0;
                  if (1 < iVar146) {
                    dVar215 = dVar214;
                  }
                  dVar224 = pdVar46[lVar155 + lVar167 + lVar115];
                  if ((((dVar224 == 1.0) && (!NAN(dVar224))) &&
                      (pdVar46[lVar155 + lVar115 + (int)(~uVar26 + iVar127)] == 1.0)) &&
                     (((!NAN(pdVar46[lVar155 + lVar115 + (int)(~uVar26 + iVar127)]) &&
                       (pdVar46[lVar155 + lVar115 + (iVar102 + 1)] == 1.0)) &&
                      (!NAN(pdVar46[lVar155 + lVar115 + (iVar102 + 1)]))))) {
                    dVar202 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     ((pdVar46[lVar115 + (iVar128 + -2) * lVar59 + lVar167] == 1.0 &&
                      (((!NAN(pdVar46[lVar115 + (iVar128 + -2) * lVar59 + lVar167]) &&
                        (pdVar46[lVar115 + lVar152 + lVar167] == 1.0)) &&
                       (!NAN(pdVar46[lVar115 + lVar152 + lVar167]))))))) {
                    dVar210 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     (((pdVar46[lVar155 + lVar167 + lVar110] == 1.0 &&
                       ((!NAN(pdVar46[lVar155 + lVar167 + lVar110]) &&
                        (pdVar46[lVar155 + lVar167 + lVar107] == 1.0)))) &&
                      (!NAN(pdVar46[lVar155 + lVar167 + lVar107]))))) {
                    dVar215 = 1.0;
                  }
                  dVar203 = (dVar203 - dVar209) * local_a28 * dVar202 + dVar6 +
                            (0.5 - dVar5) * dVar227 * dVar210 +
                            (dVar207 - dVar7) * local_a48 * dVar215;
                  if (dVar203 <= dVar194) {
                    dVar194 = dVar203;
                  }
                  if (dVar228 <= dVar194) {
                    dVar228 = dVar194;
                  }
                  iVar102 = d_bcrec[1].bc[4];
                  if (iVar150 == iVar153) {
                    switch(d_bcrec[1].bc[1]) {
                    case 0:
                      break;
                    case 3:
                      iVar146 = ~uVar31 + iVar150;
LAB_00467a72:
                      dVar230 = (pdVar42 + lVar44 + iVar146 * lVar43 + lVar173)[lVar124];
                    case 1:
                    case 2:
                    case 4:
                      dVar228 = dVar230;
                      dVar230 = dVar228;
                      break;
                    case -1:
switchD_00467a1a_caseD_ffffffff:
                      dVar228 = 0.0;
                      dVar230 = 0.0;
                      break;
                    default:
                      goto switchD_00467a1a_default;
                    }
switchD_00467a1a_caseD_0:
                  }
                  else if (iVar131 == iVar153) {
                    switch(iVar102) {
                    case 0:
                      break;
                    case 1:
                    case 2:
                    case 4:
                      dVar230 = dVar228;
                      break;
                    case 3:
                      iVar146 = iVar131 - uVar31;
                      goto LAB_00467a72;
                    case -1:
                      goto switchD_00467a1a_caseD_ffffffff;
                    default:
                      goto switchD_00467a1a_default;
                    }
                    goto switchD_00467a1a_caseD_0;
                  }
switchD_00467a1a_default:
                  dVar207 = dVar230;
                  if ((iVar150 == iVar153) &&
                     (((d_bcrec[1].bc[1] == 4 || (d_bcrec[1].bc[1] == 2)) &&
                      (dVar228 = 0.0, dVar207 = 0.0, dVar230 <= 0.0)))) {
                    dVar228 = dVar230;
                    dVar207 = dVar230;
                  }
                  dVar203 = dVar228;
                  if (((iVar131 == iVar153) && ((iVar102 == 4 || (iVar102 == 2)))) &&
                     (dVar203 = 0.0, dVar207 = 0.0, 0.0 <= dVar228)) {
                    dVar203 = dVar228;
                    dVar207 = dVar228;
                  }
                  auVar196 = _DAT_0077bb30;
                  if ((0.0 <= dVar203) || (dVar207 <= 0.0)) {
                    dVar202 = (dVar207 + dVar203) * 0.5;
                    if ((dVar202 < 1e-08) && (dVar203 = 0.0, dVar202 <= -1e-08)) {
                      dVar203 = dVar207;
                    }
                  }
                  else {
                    dVar203 = 0.0;
                  }
                }
                pdVar34[(lVar108 - iVar13) * lVar40 +
                        ((long)iVar153 - (long)iVar12) * lVar38 + (lVar164 - iVar149)] = dVar203;
                iVar191 = iVar191 + 1;
                iVar171 = iVar171 + 1;
                iVar138 = iVar138 + 1;
                bVar192 = iVar127 != iVar18;
                iVar127 = iVar127 + 1;
              } while (bVar192);
            }
            iVar145 = iVar145 + 1;
            bVar192 = iVar153 != iVar19;
            iVar153 = iVar153 + 1;
          } while (bVar192);
        }
        bVar192 = iVar10 != iVar11;
        iVar10 = iVar10 + 1;
      } while (bVar192);
    }
  }
  pBVar33 = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((((((pBVar33[2].bc[0] - 3U < 2) && ((ubx->smallend).vect[0] + -1 <= iVar189)) ||
        ((0xfffffffd < pBVar33[2].bc[3] - 5U && (iVar98 <= (ubx->bigend).vect[0])))) ||
       ((pBVar33[2].bc[1] - 3U < 2 && ((vbx->smallend).vect[1] + -1 <= iVar150)))) ||
      ((0xfffffffd < pBVar33[2].bc[4] - 5U && (iVar8 <= (vbx->bigend).vect[1])))) ||
     (((pBVar33[2].bc[2] - 3U < 2 && ((wbx->smallend).vect[2] + -1 <= iVar9)) ||
      ((0xfffffffd < pBVar33[2].bc[5] - 5U && (iVar139 <= (wbx->bigend).vect[2])))))) {
    local_398.u.p = w->p;
    local_398.u.jstride = w->jstride;
    local_398.u.kstride = w->kstride;
    local_398.u.nstride = w->nstride;
    local_398.u.begin.x = (w->begin).x;
    local_398.u.begin.y = (w->begin).y;
    uVar60 = *(undefined8 *)&(w->begin).z;
    uVar85 = (w->end).y;
    local_398.u._52_8_ = *(undefined8 *)&(w->end).z;
    iVar10 = (wbx->smallend).vect[0];
    iVar11 = (wbx->smallend).vect[1];
    iVar149 = (wbx->smallend).vect[2];
    iVar12 = (wbx->bigend).vect[0];
    iVar13 = (wbx->bigend).vect[1];
    iVar14 = (wbx->bigend).vect[2];
    local_398.u.begin.z = (int)uVar60;
    local_398.u.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.vcc.p = vcc->p;
    local_398.vcc.jstride = vcc->jstride;
    local_398.vcc.kstride = vcc->kstride;
    local_398.vcc.nstride = vcc->nstride;
    local_398.vcc.begin.x = (vcc->begin).x;
    local_398.vcc.begin.y = (vcc->begin).y;
    uVar60 = *(undefined8 *)&(vcc->begin).z;
    uVar86 = (vcc->end).y;
    local_398.vcc._52_8_ = *(undefined8 *)&(vcc->end).z;
    local_398.vcc.begin.z = (int)uVar60;
    local_398.vcc.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.flag.p = flag->p;
    local_398.flag.jstride = flag->jstride;
    local_398.flag.kstride = flag->kstride;
    local_398.flag.nstride = flag->nstride;
    local_398.flag.begin.x = (flag->begin).x;
    local_398.flag.begin.y = (flag->begin).y;
    uVar87 = (flag->end).x;
    uVar88 = (flag->end).y;
    local_398.flag._52_8_ = *(undefined8 *)&(flag->end).z;
    local_398.flag.begin.z = (int)*(undefined8 *)&(flag->begin).z;
    local_398.ccc.p = ccc->p;
    local_398.ccc.jstride = ccc->jstride;
    local_398.ccc.kstride = ccc->kstride;
    local_398.ccc.nstride = ccc->nstride;
    local_398.ccc.begin.x = (ccc->begin).x;
    local_398.ccc.begin.y = (ccc->begin).y;
    uVar89 = (ccc->end).x;
    uVar90 = (ccc->end).y;
    local_398.ccc._52_8_ = *(undefined8 *)&(ccc->end).z;
    local_398.ccc.begin.z = (int)*(undefined8 *)&(ccc->begin).z;
    local_398.vfrac.p = vfrac->p;
    local_398.vfrac.jstride = vfrac->jstride;
    local_398.vfrac.kstride = vfrac->kstride;
    local_398.vfrac.nstride = vfrac->nstride;
    local_398.vfrac.begin.x = (vfrac->begin).x;
    local_398.vfrac.begin.y = (vfrac->begin).y;
    uVar91 = (vfrac->end).x;
    uVar92 = (vfrac->end).y;
    local_398.vfrac._52_8_ = *(undefined8 *)&(vfrac->end).z;
    local_398.vfrac.begin.z = (int)*(undefined8 *)&(vfrac->begin).z;
    local_398.d_bcrec = d_bcrec;
    local_398.fcx.p = fcx->p;
    local_398.fcx.jstride = fcx->jstride;
    local_398.fcx.kstride = fcx->kstride;
    local_398.fcx.nstride = fcx->nstride;
    local_398.fcx.begin.x = (fcx->begin).x;
    local_398.fcx.begin.y = (fcx->begin).y;
    uVar60 = *(undefined8 *)&(fcx->begin).z;
    uVar93 = (fcx->end).y;
    local_398.fcx._52_8_ = *(undefined8 *)&(fcx->end).z;
    local_398.fcx.begin.z = (int)uVar60;
    local_398.fcx.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.fcy.p = fcy->p;
    local_398.fcy.jstride = fcy->jstride;
    local_398.fcy.kstride = fcy->kstride;
    local_398.fcy.nstride = fcy->nstride;
    local_398.fcy.begin.x = (fcy->begin).x;
    local_398.fcy.begin.y = (fcy->begin).y;
    uVar60 = *(undefined8 *)&(fcy->begin).z;
    uVar94 = (fcy->end).y;
    local_398.fcy._52_8_ = *(undefined8 *)&(fcy->end).z;
    local_398.fcy.begin.z = (int)uVar60;
    local_398.fcy.end.x = (int)((ulong)uVar60 >> 0x20);
    local_398.fcz.p = fcz->p;
    local_398.fcz.jstride = fcz->jstride;
    local_398.fcz.kstride = fcz->kstride;
    local_398.fcz.nstride = fcz->nstride;
    local_398.fcz.begin.x = (fcz->begin).x;
    local_398.fcz.begin.y = (fcz->begin).y;
    uVar95 = (fcz->end).x;
    uVar96 = (fcz->end).y;
    local_398.fcz._52_8_ = *(undefined8 *)&(fcz->end).z;
    local_398.fcz.begin.z = (int)*(undefined8 *)&(fcz->begin).z;
    local_398.order = 2;
    if (iVar149 <= iVar14) {
      local_398.u.end.y = uVar85;
      local_398.vcc.end.y = uVar86;
      local_398.flag.end.x = uVar87;
      local_398.flag.end.y = uVar88;
      local_398.ccc.end.x = uVar89;
      local_398.ccc.end.y = uVar90;
      local_398.vfrac.end.x = uVar91;
      local_398.vfrac.end.y = uVar92;
      local_398.fcx.end.y = uVar93;
      local_398.fcy.end.y = uVar94;
      local_398.fcz.end.x = uVar95;
      local_398.fcz.end.y = uVar96;
      local_398.domain_ilo = iVar189;
      local_398.domain_jlo = iVar98;
      local_398.domain_klo = iVar150;
      local_398.domain_ihi = iVar8;
      local_398.domain_jhi = iVar9;
      local_398.domain_khi = iVar139;
      do {
        iVar189 = iVar11;
        if (iVar11 <= iVar13) {
          do {
            iVar150 = iVar10;
            if (iVar10 <= iVar12) {
              do {
                ExtrapVelToFacesBox::anon_class_552_16_a6c64e1e::operator()
                          ((anon_class_552_16_a6c64e1e *)&local_398,iVar150,iVar189,iVar149);
                iVar150 = iVar150 + 1;
              } while (iVar12 + 1 != iVar150);
            }
            bVar192 = iVar189 != iVar13;
            iVar189 = iVar189 + 1;
          } while (bVar192);
        }
        bVar192 = iVar149 != iVar14;
        iVar149 = iVar149 + 1;
      } while (bVar192);
    }
  }
  else {
    iVar189 = (wbx->smallend).vect[2];
    iVar150 = (wbx->bigend).vect[2];
    if (iVar189 <= iVar150) {
      pdVar34 = ccc->p;
      lVar35 = ccc->nstride;
      iVar8 = (ccc->begin).x;
      lVar140 = (long)iVar8;
      iVar10 = (wbx->smallend).vect[0];
      iVar11 = (wbx->smallend).vect[1];
      iVar149 = (wbx->bigend).vect[0];
      iVar12 = (wbx->bigend).vect[1];
      pdVar36 = w->p;
      lVar37 = w->jstride;
      lVar38 = w->kstride;
      iVar13 = (w->begin).x;
      iVar14 = (w->begin).y;
      iVar184 = (w->begin).z;
      pEVar39 = flag->p;
      lVar40 = flag->jstride;
      lVar41 = flag->kstride;
      iVar188 = (flag->begin).x;
      iVar15 = (flag->begin).y;
      iVar16 = (flag->begin).z;
      pdVar42 = fcx->p;
      lVar43 = fcx->jstride;
      lVar44 = fcx->kstride;
      lVar45 = fcx->nstride;
      iVar17 = (fcx->begin).x;
      iVar18 = (fcx->begin).y;
      iVar19 = (fcx->begin).z;
      pdVar46 = fcy->p;
      lVar47 = fcy->jstride;
      local_3b8 = fcy->kstride;
      lVar48 = fcy->nstride;
      iVar20 = (fcy->begin).x;
      iVar21 = (fcy->begin).y;
      local_3c0 = (ulong)(uint)(fcy->begin).z;
      pdVar49 = fcz->p;
      lVar50 = fcz->jstride;
      lVar51 = fcz->kstride;
      lVar52 = fcz->nstride;
      iVar22 = (fcz->begin).x;
      iVar23 = (fcz->begin).y;
      iVar24 = (fcz->begin).z;
      lVar53 = ccc->jstride;
      lVar54 = ccc->kstride;
      iVar25 = (ccc->begin).y;
      local_3c8 = (double *)(long)(ccc->begin).z;
      pdVar55 = vfrac->p;
      lVar56 = vfrac->jstride;
      local_3d0 = vfrac->kstride;
      uVar26 = (vfrac->begin).x;
      uVar27 = (vfrac->begin).y;
      iVar28 = (vfrac->begin).z;
      pdVar57 = vcc->p;
      lVar58 = vcc->jstride;
      lVar59 = vcc->kstride;
      iVar29 = (vcc->begin).x;
      iVar30 = (vcc->begin).y;
      uVar31 = (vcc->begin).z;
      lVar172 = vcc->nstride;
      iVar139 = iVar139 + 1;
      local_3d8 = (double *)(ulong)uVar31;
      local_3e0 = ~(ulong)local_3c8;
      local_3e8 = pdVar34 + ((lVar35 + -1) - lVar140);
      local_3f0 = pdVar34 + ((lVar35 * 2 + -1) - lVar140);
      iVar98 = iVar189 + -1;
      auVar198 = _DAT_0077bb40;
      do {
        pdVar3 = local_3e8;
        pdVar2 = local_3f0;
        if (iVar11 <= iVar12) {
          lVar105 = ((long)iVar98 + local_3e0) * lVar54 * 8;
          lVar106 = (iVar189 - iVar16) * lVar41;
          iVar170 = iVar189 + -1;
          iVar153 = iVar189 - iVar24;
          iVar130 = iVar189 - (int)local_3c8;
          iVar131 = iVar170 - (int)local_3d8;
          lVar133 = iVar131 * lVar59;
          iVar161 = iVar189 - (int)local_3d8;
          lVar134 = iVar161 * lVar59;
          iVar157 = iVar189 - iVar28;
          lVar186 = local_3d0 * iVar157;
          lVar173 = (iVar170 - iVar28) * local_3d0;
          lVar158 = ((iVar189 + 1) - iVar28) * local_3d0;
          iVar191 = (iVar189 + 1) - (int)local_3d8;
          lVar107 = (iVar189 - (int)local_3c0) * local_3b8;
          lVar108 = (iVar189 - iVar19) * lVar44;
          lVar109 = (iVar157 + 1) * local_3d0;
          lVar110 = (((long)iVar189 - (long)local_3c8) + -1) * lVar54;
          lVar111 = (iVar170 - iVar16) * lVar41;
          lVar112 = ((iVar189 + -2) - iVar28) * local_3d0;
          iVar145 = (iVar189 + -2) - (int)local_3d8;
          lVar113 = (iVar170 - (int)local_3c0) * local_3b8;
          lVar114 = (iVar170 - iVar19) * lVar44;
          lVar115 = (iVar157 + -2) * local_3d0;
          iVar157 = iVar11;
          do {
            if (iVar10 <= iVar149) {
              lVar135 = (long)iVar157;
              lVar152 = (~(long)iVar25 + lVar135) * lVar53 * 8;
              lVar116 = (lVar135 - iVar15) * lVar40;
              lVar117 = (lVar135 - iVar23) * lVar50;
              iVar99 = iVar157 - iVar25;
              lVar118 = iVar99 * lVar53;
              iVar100 = iVar157 - iVar30;
              lVar119 = iVar100 * lVar58;
              lVar120 = lVar56 * (int)(iVar157 - uVar27);
              lVar155 = (int)((iVar157 + -1) - uVar27) * lVar56;
              lVar159 = (int)((iVar157 + 1) - uVar27) * lVar56;
              lVar164 = ((iVar157 + -1) - iVar30) * lVar58;
              lVar168 = ((iVar157 + 1) - iVar30) * lVar58;
              iVar171 = iVar157 - iVar21;
              lVar169 = (iVar171 + 1) * lVar47;
              lVar174 = iVar171 * lVar47;
              lVar136 = (iVar157 - iVar18) * lVar43;
              lVar147 = (int)(~uVar27 + iVar157) * lVar56;
              lVar141 = (int)((iVar157 - uVar27) + 1) * lVar56;
              iVar128 = iVar10;
              iVar138 = iVar10 - iVar29;
              iVar171 = (iVar10 + -1) - iVar8;
              iVar127 = (iVar10 + -1) - iVar29;
              do {
                lVar142 = (long)iVar128;
                lVar121 = lVar142 - iVar188;
                uVar32 = pEVar39[lVar116 + lVar121 + lVar106].flag;
                dVar203 = 0.0;
                if ((uVar32 >> 9 & 1) != 0) {
                  lVar124 = (long)pdVar34 + lVar142 * 8 + lVar152 + lVar105 + lVar140 * -8 + -8;
                  lVar167 = (long)pdVar3 + lVar142 * 8 + lVar152 + lVar105;
                  lVar187 = (long)pdVar2 + lVar142 * 8 + lVar152 + lVar105;
                  lVar122 = lVar142 - iVar22;
                  pdVar104 = pdVar49 + lVar117 + lVar122 + lVar51 * iVar153;
                  dVar203 = *pdVar104;
                  dVar207 = pdVar104[lVar52];
                  lVar123 = lVar142 - lVar140;
                  pdVar4 = pdVar34 + lVar118 + lVar123 + iVar130 * lVar54;
                  dVar202 = *pdVar4;
                  dVar209 = pdVar4[lVar35];
                  dVar5 = pdVar4[lVar35 * 2];
                  lVar137 = (long)(iVar128 - iVar29);
                  dVar6 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                  dVar7 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                  lVar165 = -1;
                  cVar148 = '\x05';
                  lVar143 = 0;
                  do {
                    iVar101 = (int)lVar165;
                    lVar160 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar179 = (int)lVar160;
                      iVar102 = (int)lVar143;
                      ppdVar166 = &local_398.u.p + (long)iVar102 * 3;
                      lVar143 = 0;
                      do {
                        iVar146 = (int)lVar143;
                        if ((iVar146 == 1 && (iVar179 == 0 && iVar101 == 0)) ||
                           ((1 << (cVar183 + (char)lVar143 & 0x1fU) & uVar32) == 0)) {
                          *ppdVar166 = (double *)0x0;
                          ppdVar166[1] = (double *)0x0;
                          ppdVar166[2] = (double *)0x0;
                        }
                        else {
                          pdVar125 = pdVar34 + (iVar130 + iVar101) * lVar54 +
                                               (iVar99 + iVar179) * lVar53 +
                                               (long)(iVar171 + iVar146);
                          auVar226._0_8_ = (*pdVar125 + (double)(iVar146 + -1)) - dVar202;
                          auVar226._8_8_ = (pdVar125[lVar35] + (double)iVar179) - dVar209;
                          *(undefined1 (*) [16])ppdVar166 = auVar226;
                          ppdVar166[2] = (double *)
                                         ((pdVar125[lVar35 * 2] + (double)iVar101) - dVar5);
                        }
                        lVar143 = lVar143 + 1;
                        ppdVar166 = ppdVar166 + 3;
                      } while (lVar143 != 3);
                      lVar160 = lVar160 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar143 = (long)iVar102 + 3;
                    } while (lVar160 != 2);
                    lVar165 = lVar165 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar143 = (long)iVar102 + 3;
                  } while (lVar165 != 2);
                  lVar165 = -1;
                  cVar148 = '\x05';
                  lVar143 = 0;
                  do {
                    lVar160 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar101 = (int)lVar143;
                      lVar143 = 0;
                      do {
                        dVar194 = 0.0;
                        if (((int)lVar143 != 1 || ((int)lVar160 != 0 || (int)lVar165 != 0)) &&
                           ((1 << (cVar183 + (char)lVar143 & 0x1fU) & uVar32) != 0)) {
                          dVar194 = pdVar57[lVar172 * 2 +
                                            (iVar161 + (int)lVar165) * lVar59 +
                                            (iVar100 + (int)lVar160) * lVar58 +
                                            (long)(iVar127 + (int)lVar143)] - dVar7;
                        }
                        adStack_108[iVar101 + lVar143] = dVar194;
                        lVar143 = lVar143 + 1;
                      } while (lVar143 != 3);
                      lVar160 = lVar160 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar143 = (long)iVar101 + 3;
                    } while (lVar160 != 2);
                    lVar165 = lVar165 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar143 = (long)iVar101 + 3;
                  } while (lVar165 != 2);
                  pdVar125 = &local_438;
                  lVar143 = 0;
                  do {
                    lVar165 = 0;
                    auVar197 = _DAT_0077bb30;
                    do {
                      if (SUB164(auVar197 ^ auVar198,4) == -0x80000000 &&
                          SUB164(auVar197 ^ auVar198,0) < -0x7ffffffd) {
                        *(undefined8 *)((long)pdVar125 + lVar165) = 0;
                        *(undefined8 *)((long)pdVar125 + lVar165 + 0x18) = 0;
                      }
                      lVar160 = auVar197._8_8_;
                      auVar197._0_8_ = auVar197._0_8_ + 2;
                      auVar197._8_8_ = lVar160 + 2;
                      lVar165 = lVar165 + 0x30;
                    } while (lVar165 != 0x60);
                    lVar143 = lVar143 + 1;
                    pdVar125 = pdVar125 + 1;
                  } while (lVar143 != 3);
                  dVar194 = dVar6;
                  if (dVar6 <= dVar7) {
                    dVar194 = dVar7;
                  }
                  dVar214 = 0.0;
                  dVar229 = 0.0;
                  dVar221 = 0.0;
                  pLVar126 = &local_398.u.kstride;
                  lVar143 = 0;
                  dVar228 = local_430;
                  dVar230 = local_3f8;
                  dVar210 = local_438;
                  dVar215 = local_428;
                  dVar224 = local_418;
                  dVar227 = dStack_410;
                  do {
                    dVar199 = (double)*pLVar126;
                    pdVar125 = ((Array4<double> *)(pLVar126 + -2))->p;
                    dVar231 = (double)pLVar126[-1];
                    dVar224 = dVar224 + dVar231 * (double)pLVar126[-1];
                    dVar227 = dVar227 + dVar231 * (double)*pLVar126;
                    dVar230 = dVar230 + dVar199 * dVar199;
                    dVar208 = adStack_108[lVar143];
                    dVar210 = dVar210 + (double)pdVar125 * (double)pdVar125;
                    dVar214 = dVar214 + dVar208 * (double)pdVar125;
                    dVar228 = dVar228 + dVar231 * (double)pdVar125;
                    dVar229 = dVar229 + dVar208 * dVar231;
                    dVar215 = dVar215 + dVar199 * (double)pdVar125;
                    dVar221 = dVar221 + dVar208 * dVar199;
                    lVar143 = lVar143 + 1;
                    pLVar126 = pLVar126 + 3;
                  } while (lVar143 != 0x1b);
                  dVar199 = dVar224 * dVar230 - dVar227 * dVar227;
                  dVar231 = dVar230 * dVar228 - dVar215 * dVar227;
                  dVar232 = dVar230 * dVar229 - dVar221 * dVar227;
                  dVar208 = dVar228 * dVar227 - dVar224 * dVar215;
                  local_9b8 = dVar215 * dVar208 + (dVar199 * dVar210 - dVar228 * dVar231);
                  dVar230 = (dVar215 * (dVar229 * dVar227 - dVar224 * dVar221) +
                            (dVar199 * dVar214 - dVar228 * dVar232)) / local_9b8;
                  iVar101 = iVar128 - uVar26;
                  lVar143 = (long)iVar101;
                  if ((pdVar55[lVar120 + lVar186 + lVar143] == 1.0) &&
                     (!NAN(pdVar55[lVar120 + lVar186 + lVar143]))) {
                    if ((pdVar55[lVar120 + lVar186 + (int)((iVar128 + -1) - uVar26)] == 1.0) &&
                       (!NAN(pdVar55[lVar120 + lVar186 + (int)((iVar128 + -1) - uVar26)]))) {
                      if ((pdVar55[lVar120 + lVar186 + (int)((iVar128 + 1) - uVar26)] == 1.0) &&
                         (!NAN(pdVar55[lVar120 + lVar186 + (int)((iVar128 + 1) - uVar26)]))) {
                        dVar216 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2] -
                                  pdVar57[lVar119 + lVar134 + lVar172 * 2 +
                                                              (long)((iVar128 + -1) - iVar29)];
                        dVar222 = pdVar57[lVar119 + lVar134 + lVar172 * 2 +
                                                              (long)((iVar128 + 1) - iVar29)] -
                                  pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                        dVar216 = dVar216 + dVar216;
                        dVar222 = dVar222 + dVar222;
                        dVar230 = (pdVar57[lVar119 + lVar134 + lVar172 * 2 +
                                                               (long)((iVar128 + 1) - iVar29)] -
                                  pdVar57[lVar119 + lVar134 + lVar172 * 2 +
                                                              (long)((iVar128 + -1) - iVar29)]) *
                                  0.5;
                        dVar200 = ABS(dVar216);
                        uVar193 = -(ulong)(0.0 < dVar230);
                        dVar230 = ABS(dVar230);
                        dVar199 = ABS(dVar222);
                        if (dVar200 <= dVar230) {
                          dVar230 = dVar200;
                        }
                        if (dVar230 <= dVar199) {
                          dVar199 = dVar230;
                        }
                        uVar201 = -(ulong)(0.0 < dVar216 * dVar222) & (ulong)dVar199;
                        dVar230 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                          uVar193 & uVar201);
                      }
                    }
                  }
                  dVar199 = dVar228 * dVar221 - dVar215 * dVar229;
                  dVar215 = (dVar215 * dVar199 + (dVar232 * dVar210 - dVar231 * dVar214)) /
                            local_9b8;
                  if (((((pdVar55[lVar186 + lVar120 + lVar143] == 1.0) &&
                        (!NAN(pdVar55[lVar186 + lVar120 + lVar143]))) &&
                       (pdVar55[lVar186 + lVar155 + lVar143] == 1.0)) &&
                      ((!NAN(pdVar55[lVar186 + lVar155 + lVar143]) &&
                       (pdVar55[lVar186 + lVar159 + lVar143] == 1.0)))) &&
                     (!NAN(pdVar55[lVar186 + lVar159 + lVar143]))) {
                    dVar200 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2] -
                              pdVar57[lVar172 * 2 + lVar134 + lVar164 + lVar137];
                    dVar216 = pdVar57[lVar172 * 2 + lVar134 + lVar168 + lVar137] -
                              pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                    dVar200 = dVar200 + dVar200;
                    dVar216 = dVar216 + dVar216;
                    dVar215 = (pdVar57[lVar172 * 2 + lVar134 + lVar168 + lVar137] -
                              pdVar57[lVar172 * 2 + lVar134 + lVar164 + lVar137]) * 0.5;
                    dVar232 = ABS(dVar200);
                    uVar193 = -(ulong)(0.0 < dVar215);
                    dVar215 = ABS(dVar215);
                    dVar231 = ABS(dVar216);
                    if (dVar232 <= dVar215) {
                      dVar215 = dVar232;
                    }
                    if (dVar215 <= dVar231) {
                      dVar231 = dVar215;
                    }
                    uVar201 = -(ulong)(0.0 < dVar200 * dVar216) & (ulong)dVar231;
                    dVar215 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) | uVar193 & uVar201
                                      );
                  }
                  local_9b8 = (dVar214 * dVar208 +
                              (dVar210 * (dVar224 * dVar221 - dVar227 * dVar229) - dVar199 * dVar228
                              )) / local_9b8;
                  if (((pdVar55[lVar120 + lVar143 + lVar186] == 1.0) &&
                      (!NAN(pdVar55[lVar120 + lVar143 + lVar186]))) &&
                     ((pdVar55[lVar120 + lVar143 + lVar173] == 1.0 &&
                      (((!NAN(pdVar55[lVar120 + lVar143 + lVar173]) &&
                        (pdVar55[lVar120 + lVar143 + lVar158] == 1.0)) &&
                       (!NAN(pdVar55[lVar120 + lVar143 + lVar158]))))))) {
                    dVar227 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2] -
                              pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    dVar214 = pdVar57[lVar119 + lVar137 + iVar191 * lVar59 + lVar172 * 2] -
                              pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                    dVar227 = dVar227 + dVar227;
                    dVar214 = dVar214 + dVar214;
                    dVar228 = (pdVar57[lVar119 + lVar137 + iVar191 * lVar59 + lVar172 * 2] -
                              pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2]) * 0.5;
                    dVar224 = ABS(dVar227);
                    uVar193 = -(ulong)(0.0 < dVar228);
                    dVar228 = ABS(dVar228);
                    dVar210 = ABS(dVar214);
                    if (dVar224 <= dVar228) {
                      dVar228 = dVar224;
                    }
                    if (dVar228 <= dVar210) {
                      dVar210 = dVar228;
                    }
                    uVar201 = -(ulong)(0.0 < dVar227 * dVar214) & (ulong)dVar210;
                    local_9b8 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  dVar228 = dVar6;
                  if (dVar7 <= dVar6) {
                    dVar228 = dVar7;
                  }
                  uVar32 = pEVar39[lVar116 + lVar121 + lVar106].flag;
                  iVar102 = 0;
                  iVar162 = 0;
                  iVar146 = 0;
                  iVar179 = 0;
                  uVar156 = 0xffffffff;
                  do {
                    uVar132 = uVar156 + 1;
                    uVar97 = 0xffffffff;
                    iVar181 = iVar102;
                    do {
                      uVar1 = uVar97 + 1;
                      iVar176 = 5;
                      do {
                        if (((uVar32 >> (iVar176 + iVar181 & 0x1fU) & 1) != 0) &&
                           ((iVar176 != 6 || uVar97 != 0) || uVar156 != 0)) {
                          iVar162 = iVar162 + (uint)((iVar176 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar97 == 0 && uVar156 == 0));
                          iVar146 = iVar146 + (uint)((iVar176 == 6 && uVar156 == 0) &&
                                                    (uVar1 & 0xfffffffd) == 0);
                          iVar179 = iVar179 + (uint)((iVar176 == 6 && uVar97 == 0) &&
                                                    (uVar132 & 0xfffffffd) == 0);
                        }
                        iVar176 = iVar176 + 1;
                      } while (iVar176 != 8);
                      iVar181 = iVar181 + 3;
                      uVar97 = uVar1;
                    } while (uVar1 != 2);
                    iVar102 = iVar102 + 9;
                    uVar156 = uVar132;
                  } while (uVar132 != 2);
                  dVar210 = *pdVar4;
                  dVar224 = pdVar4[lVar35];
                  dVar227 = pdVar4[lVar35 * 2];
                  dVar214 = 2.0;
                  if ((uVar32 >> 0x15 & 1) != 0) {
                    dVar221 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                    lVar165 = -1;
                    cVar148 = '\b';
                    dVar229 = dVar221;
                    dVar214 = dVar221;
                    do {
                      lVar160 = 0;
                      cVar183 = cVar148;
                      do {
                        lVar177 = 0;
                        do {
                          if (((int)lVar177 != 1 || ((int)lVar160 != 0 || (int)lVar165 != 0)) &&
                             ((1 << (cVar183 + (char)lVar177 & 0x1fU) & uVar32) != 0)) {
                            dVar199 = pdVar57[lVar172 * 2 +
                                              ((int)lVar165 + iVar161) * lVar59 +
                                              (iVar100 + (int)lVar160) * lVar58 +
                                              (long)(iVar127 + (int)lVar177)];
                            dVar208 = dVar199;
                            if (dVar199 <= dVar214) {
                              dVar208 = dVar214;
                            }
                            dVar214 = dVar208;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar160 == 0;
                        lVar160 = lVar160 + 1;
                      } while (bVar192);
                      lVar165 = lVar165 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar165 != 2);
                    dVar199 = (((pdVar46 + lVar107 + lVar169 + (iVar128 - iVar20))[lVar48] - dVar227
                               ) * local_9b8 +
                              (0.5 - dVar224) * dVar215 +
                              (pdVar46[lVar107 + lVar169 + (iVar128 - iVar20)] - dVar210) * dVar230
                              + dVar221) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar214 = 1.0;
                      if ((dVar199 < -1e-13) &&
                         (dVar214 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar214)) {
                        dVar214 = 1.0;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar221) / dVar199;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (2.0 <= dVar214) {
                      dVar214 = 2.0;
                    }
                  }
                  dVar221 = dVar214;
                  if ((short)uVar32 < 0) {
                    dVar229 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                    lVar165 = -1;
                    cVar148 = '\x05';
                    dVar199 = dVar229;
                    dVar221 = dVar229;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = 0;
                        do {
                          if (((int)lVar177 != 1 || ((int)lVar160 != 0 || (int)lVar165 != 0)) &&
                             ((1 << (cVar183 + (char)lVar177 & 0x1fU) & uVar32) != 0)) {
                            dVar208 = pdVar57[lVar172 * 2 +
                                              ((int)lVar165 + iVar161) * lVar59 +
                                              (iVar100 + (int)lVar160) * lVar58 +
                                              (long)(iVar127 + (int)lVar177)];
                            dVar231 = dVar208;
                            if (dVar208 <= dVar221) {
                              dVar231 = dVar221;
                            }
                            dVar221 = dVar231;
                            if (dVar208 < dVar199) {
                              dVar199 = dVar208;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 3);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar160 != 0;
                        lVar160 = lVar160 + 1;
                      } while (bVar192);
                      lVar165 = lVar165 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar165 != 2);
                    dVar208 = (((pdVar46 + lVar107 + lVar174 + (iVar128 - iVar20))[lVar48] - dVar227
                               ) * local_9b8 +
                              -(dVar224 + 0.5) * dVar215 +
                              (pdVar46[lVar107 + lVar174 + (iVar128 - iVar20)] - dVar210) * dVar230
                              + dVar229) - dVar229;
                    if (dVar208 <= 1e-13) {
                      dVar221 = 1.0;
                      if ((dVar208 < -1e-13) &&
                         (dVar221 = (dVar199 - dVar229) / dVar208, 1.0 <= dVar221)) {
                        dVar221 = 1.0;
                      }
                    }
                    else {
                      dVar221 = (dVar221 - dVar229) / dVar208;
                      if (1.0 <= dVar221) {
                        dVar221 = 1.0;
                      }
                    }
                    if (dVar214 <= dVar221) {
                      dVar221 = dVar214;
                    }
                  }
                  dVar214 = dVar221;
                  if ((uVar32 >> 0x13 & 1) != 0) {
                    dVar229 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                    lVar165 = -1;
                    cVar148 = '\x06';
                    dVar199 = dVar229;
                    dVar214 = dVar229;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = 0;
                        do {
                          if ((((int)lVar160 != 0 || (int)lVar165 != 0) || (int)lVar177 != 0) &&
                             ((1 << (cVar183 + (char)lVar177 & 0x1fU) & uVar32) != 0)) {
                            dVar208 = pdVar57[lVar172 * 2 +
                                              ((int)lVar165 + iVar161) * lVar59 +
                                              (iVar100 + (int)lVar160) * lVar58 +
                                              (long)(iVar138 + (int)lVar177)];
                            dVar231 = dVar208;
                            if (dVar208 <= dVar214) {
                              dVar231 = dVar214;
                            }
                            dVar214 = dVar231;
                            if (dVar208 < dVar199) {
                              dVar199 = dVar208;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 == 1);
                        lVar160 = lVar160 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar160 != 2);
                      lVar165 = lVar165 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar165 != 2);
                    dVar208 = (((pdVar42 + lVar108 + lVar136 + ((iVar128 - iVar17) + 1))[lVar45] -
                               dVar227) * local_9b8 +
                              (pdVar42[lVar108 + lVar136 + ((iVar128 - iVar17) + 1)] - dVar224) *
                              dVar215 + (0.5 - dVar210) * dVar230 + dVar229) - dVar229;
                    if (dVar208 <= 1e-13) {
                      dVar214 = 1.0;
                      if ((dVar208 < -1e-13) &&
                         (dVar214 = (dVar199 - dVar229) / dVar208, 1.0 <= dVar214)) {
                        dVar214 = 1.0;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar229) / dVar208;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (dVar221 <= dVar214) {
                      dVar214 = dVar221;
                    }
                  }
                  dVar221 = dVar214;
                  if ((uVar32 >> 0x11 & 1) != 0) {
                    dVar229 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                    lVar165 = -1;
                    cVar148 = '\x05';
                    dVar199 = dVar229;
                    dVar221 = dVar229;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = -1;
                        do {
                          if ((((int)lVar160 != 0 || (int)lVar165 != 0) || (int)lVar177 != 0) &&
                             ((1 << (cVar183 + (char)lVar177 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar208 = pdVar57[lVar172 * 2 +
                                              ((int)lVar165 + iVar161) * lVar59 +
                                              (iVar100 + (int)lVar160) * lVar58 +
                                              (long)(iVar138 + (int)lVar177)];
                            dVar231 = dVar208;
                            if (dVar208 <= dVar221) {
                              dVar231 = dVar221;
                            }
                            dVar221 = dVar231;
                            if (dVar208 < dVar199) {
                              dVar199 = dVar208;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 1);
                        lVar160 = lVar160 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar160 != 2);
                      lVar165 = lVar165 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar165 != 2);
                    dVar208 = (((pdVar42 + lVar108 + lVar136 + (iVar128 - iVar17))[lVar45] - dVar227
                               ) * local_9b8 +
                              (pdVar42[lVar108 + lVar136 + (iVar128 - iVar17)] - dVar224) * dVar215
                              + (dVar229 - (dVar210 + 0.5) * dVar230)) - dVar229;
                    if (dVar208 <= 1e-13) {
                      dVar221 = 1.0;
                      if ((dVar208 < -1e-13) &&
                         (dVar221 = (dVar199 - dVar229) / dVar208, 1.0 <= dVar221)) {
                        dVar221 = 1.0;
                      }
                    }
                    else {
                      dVar221 = (dVar221 - dVar229) / dVar208;
                      if (1.0 <= dVar221) {
                        dVar221 = 1.0;
                      }
                    }
                    if (dVar214 <= dVar221) {
                      dVar221 = dVar214;
                    }
                  }
                  dVar214 = dVar221;
                  if ((uVar32 >> 0x1b & 1) != 0) {
                    dVar229 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                    cVar148 = '\x0e';
                    lVar165 = 0;
                    dVar199 = dVar229;
                    dVar214 = dVar229;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = -1;
                        do {
                          if ((((int)lVar160 != 0 || (int)lVar165 != 0) || (int)lVar177 != 0) &&
                             ((1 << (cVar183 + (char)lVar177 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar208 = pdVar57[lVar172 * 2 +
                                              ((int)lVar165 + iVar161) * lVar59 +
                                              (iVar100 + (int)lVar160) * lVar58 +
                                              (long)(iVar138 + (int)lVar177)];
                            dVar231 = dVar208;
                            if (dVar208 <= dVar214) {
                              dVar231 = dVar214;
                            }
                            dVar214 = dVar231;
                            if (dVar208 < dVar199) {
                              dVar199 = dVar208;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 2);
                        lVar160 = lVar160 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar160 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar165 == 0;
                      lVar165 = lVar165 + 1;
                    } while (bVar192);
                    dVar208 = ((0.5 - dVar227) * local_9b8 +
                              ((pdVar49 + lVar117 + lVar122 + (iVar153 + 1) * lVar51)[lVar52] -
                              dVar224) * dVar215 +
                              (pdVar49[lVar117 + lVar122 + (iVar153 + 1) * lVar51] - dVar210) *
                              dVar230 + dVar229) - dVar229;
                    if (dVar208 <= 1e-13) {
                      dVar214 = 1.0;
                      if ((dVar208 < -1e-13) &&
                         (dVar214 = (dVar199 - dVar229) / dVar208, 1.0 <= dVar214)) {
                        dVar214 = 1.0;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar229) / dVar208;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (dVar221 <= dVar214) {
                      dVar214 = dVar221;
                    }
                  }
                  dVar221 = dVar214;
                  if ((uVar32 >> 9 & 1) != 0) {
                    dVar229 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2];
                    cVar148 = '\x05';
                    lVar165 = -1;
                    dVar199 = dVar229;
                    dVar221 = dVar229;
                    do {
                      lVar160 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar177 = -1;
                        do {
                          if ((((int)lVar160 != 0 || (int)lVar165 != 0) || (int)lVar177 != 0) &&
                             ((1 << (cVar183 + (char)lVar177 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar208 = pdVar57[lVar172 * 2 +
                                              ((int)lVar165 + iVar161) * lVar59 +
                                              (iVar100 + (int)lVar160) * lVar58 +
                                              (long)(iVar138 + (int)lVar177)];
                            dVar231 = dVar208;
                            if (dVar208 <= dVar221) {
                              dVar231 = dVar221;
                            }
                            dVar221 = dVar231;
                            if (dVar208 < dVar199) {
                              dVar199 = dVar208;
                            }
                          }
                          lVar177 = lVar177 + 1;
                        } while (lVar177 != 2);
                        lVar160 = lVar160 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar160 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar165 != 0;
                      lVar165 = lVar165 + 1;
                    } while (bVar192);
                    dVar210 = (((pdVar104[lVar52] - dVar224) * dVar215 +
                               (*pdVar104 - dVar210) * dVar230 + dVar229) -
                              (dVar227 + 0.5) * local_9b8) - dVar229;
                    if (dVar210 <= 1e-13) {
                      dVar221 = 1.0;
                      if ((dVar210 < -1e-13) &&
                         (dVar221 = (dVar199 - dVar229) / dVar210, 1.0 <= dVar221)) {
                        dVar221 = 1.0;
                      }
                    }
                    else {
                      dVar221 = (dVar221 - dVar229) / dVar210;
                      if (1.0 <= dVar221) {
                        dVar221 = 1.0;
                      }
                    }
                    if (dVar214 <= dVar221) {
                      dVar221 = dVar214;
                    }
                  }
                  dVar210 = 0.0;
                  if (1 < iVar162) {
                    dVar210 = dVar221;
                  }
                  dVar224 = 0.0;
                  if (1 < iVar146) {
                    dVar224 = dVar221;
                  }
                  dVar227 = 0.0;
                  if (1 < iVar179) {
                    dVar227 = dVar221;
                  }
                  dVar214 = pdVar55[lVar120 + lVar143 + lVar186];
                  if ((((dVar214 == 1.0) && (!NAN(dVar214))) &&
                      (pdVar55[lVar120 + lVar186 + (int)(~uVar26 + iVar128)] == 1.0)) &&
                     (((!NAN(pdVar55[lVar120 + lVar186 + (int)(~uVar26 + iVar128)]) &&
                       (pdVar55[lVar120 + lVar186 + (iVar101 + 1)] == 1.0)) &&
                      (!NAN(pdVar55[lVar120 + lVar186 + (iVar101 + 1)]))))) {
                    dVar210 = 1.0;
                  }
                  if (((dVar214 == 1.0) && (!NAN(dVar214))) &&
                     ((pdVar55[lVar186 + lVar147 + lVar143] == 1.0 &&
                      (((!NAN(pdVar55[lVar186 + lVar147 + lVar143]) &&
                        (pdVar55[lVar186 + lVar141 + lVar143] == 1.0)) &&
                       (!NAN(pdVar55[lVar186 + lVar141 + lVar143]))))))) {
                    dVar224 = 1.0;
                  }
                  if (((dVar214 == 1.0) && (!NAN(dVar214))) &&
                     (((pdVar55[lVar120 + lVar143 + lVar173] == 1.0 &&
                       ((!NAN(pdVar55[lVar120 + lVar143 + lVar173]) &&
                        (pdVar55[lVar120 + lVar143 + lVar109] == 1.0)))) &&
                      (!NAN(pdVar55[lVar120 + lVar143 + lVar109]))))) {
                    dVar227 = 1.0;
                  }
                  dVar209 = ((dVar203 - dVar202) * dVar230 * dVar210 + dVar7 +
                            (dVar207 - dVar209) * dVar215 * dVar224) -
                            (dVar5 + 0.5) * local_9b8 * dVar227;
                  dVar202 = dVar194;
                  if (dVar209 <= dVar194) {
                    dVar202 = dVar209;
                  }
                  pdVar4 = pdVar34 + lVar118 + lVar123 + lVar110;
                  dVar209 = pdVar34[lVar118 + lVar123 + lVar110];
                  dVar5 = pdVar4[lVar35];
                  dVar7 = pdVar4[lVar35 * 2];
                  uVar32 = pEVar39[lVar116 + lVar121 + lVar111].flag;
                  lVar123 = -1;
                  cVar148 = '\x05';
                  lVar165 = 0;
                  do {
                    lVar175 = -1;
                    lVar160 = lVar167;
                    lVar177 = lVar124;
                    lVar182 = lVar187;
                    cVar183 = cVar148;
                    do {
                      iVar179 = (int)lVar165;
                      ppdVar166 = &local_398.u.p + (long)iVar179 * 3;
                      lVar165 = 0;
                      do {
                        if (((int)lVar165 == 1 && ((int)lVar175 == 0 && (int)lVar123 == 0)) ||
                           ((1 << (cVar183 + (char)lVar165 & 0x1fU) & uVar32) == 0)) {
                          *ppdVar166 = (double *)0x0;
                          ppdVar166[1] = (double *)0x0;
                          ppdVar166[2] = (double *)0x0;
                        }
                        else {
                          dVar230 = *(double *)(lVar160 + lVar165 * 8);
                          *ppdVar166 = (double *)
                                       ((*(double *)(lVar177 + lVar165 * 8) +
                                        (double)((int)lVar165 + -1)) - dVar209);
                          ppdVar166[1] = (double *)((dVar230 + (double)(int)lVar175) - dVar5);
                          ppdVar166[2] = (double *)
                                         ((*(double *)(lVar182 + lVar165 * 8) + (double)(int)lVar123
                                          ) - pdVar4[lVar35 * 2]);
                        }
                        lVar165 = lVar165 + 1;
                        ppdVar166 = ppdVar166 + 3;
                      } while (lVar165 != 3);
                      lVar175 = lVar175 + 1;
                      lVar177 = lVar177 + lVar53 * 8;
                      lVar160 = lVar160 + lVar53 * 8;
                      lVar182 = lVar182 + lVar53 * 8;
                      cVar183 = cVar183 + '\x03';
                      lVar165 = (long)iVar179 + 3;
                    } while (lVar175 != 2);
                    lVar123 = lVar123 + 1;
                    lVar124 = lVar124 + lVar54 * 8;
                    lVar167 = lVar167 + lVar54 * 8;
                    lVar187 = lVar187 + lVar54 * 8;
                    cVar148 = cVar148 + '\t';
                    lVar165 = (long)iVar179 + 3;
                  } while (lVar123 != 2);
                  dVar230 = dVar228;
                  if (dVar228 <= dVar202) {
                    dVar230 = dVar202;
                  }
                  lVar167 = -1;
                  cVar148 = '\x05';
                  lVar124 = 0;
                  do {
                    lVar187 = -1;
                    cVar183 = cVar148;
                    do {
                      iVar179 = (int)lVar124;
                      lVar124 = 0;
                      do {
                        dVar202 = 0.0;
                        if (((int)lVar124 != 1 || ((int)lVar187 != 0 || (int)lVar167 != 0)) &&
                           ((1 << (cVar183 + (char)lVar124 & 0x1fU) & uVar32) != 0)) {
                          dVar202 = pdVar57[lVar172 * 2 +
                                            (iVar131 + (int)lVar167) * lVar59 +
                                            (iVar100 + (int)lVar187) * lVar58 +
                                            (long)(iVar127 + (int)lVar124)] -
                                    pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                        }
                        adStack_108[iVar179 + lVar124] = dVar202;
                        lVar124 = lVar124 + 1;
                      } while (lVar124 != 3);
                      lVar187 = lVar187 + 1;
                      cVar183 = cVar183 + '\x03';
                      lVar124 = (long)iVar179 + 3;
                    } while (lVar187 != 2);
                    lVar167 = lVar167 + 1;
                    cVar148 = cVar148 + '\t';
                    lVar124 = (long)iVar179 + 3;
                  } while (lVar167 != 2);
                  pdVar125 = &local_438;
                  lVar124 = 0;
                  do {
                    lVar167 = 0;
                    auVar198 = _DAT_0077bb30;
                    do {
                      if (SUB164(auVar198 ^ _DAT_0077bb40,4) == -0x80000000 &&
                          SUB164(auVar198 ^ _DAT_0077bb40,0) < -0x7ffffffd) {
                        *(undefined8 *)((long)pdVar125 + lVar167) = 0;
                        *(undefined8 *)((long)pdVar125 + lVar167 + 0x18) = 0;
                      }
                      lVar187 = auVar198._8_8_;
                      auVar198._0_8_ = auVar198._0_8_ + 2;
                      auVar198._8_8_ = lVar187 + 2;
                      lVar167 = lVar167 + 0x30;
                    } while (lVar167 != 0x60);
                    lVar124 = lVar124 + 1;
                    pdVar125 = pdVar125 + 1;
                  } while (lVar124 != 3);
                  dVar229 = 0.0;
                  dVar199 = 0.0;
                  dVar221 = 0.0;
                  pLVar126 = &local_398.u.kstride;
                  lVar124 = 0;
                  dVar202 = local_418;
                  dVar210 = dStack_410;
                  dVar215 = local_430;
                  dVar224 = local_3f8;
                  dVar227 = local_438;
                  dVar214 = local_428;
                  do {
                    dVar208 = (double)*pLVar126;
                    pdVar125 = ((Array4<double> *)(pLVar126 + -2))->p;
                    dVar232 = (double)pLVar126[-1];
                    dVar202 = dVar202 + dVar232 * (double)pLVar126[-1];
                    dVar210 = dVar210 + dVar232 * (double)*pLVar126;
                    dVar224 = dVar224 + dVar208 * dVar208;
                    dVar231 = adStack_108[lVar124];
                    dVar227 = dVar227 + (double)pdVar125 * (double)pdVar125;
                    dVar229 = dVar229 + dVar231 * (double)pdVar125;
                    dVar215 = dVar215 + dVar232 * (double)pdVar125;
                    dVar199 = dVar199 + dVar231 * dVar232;
                    dVar214 = dVar214 + dVar208 * (double)pdVar125;
                    dVar221 = dVar221 + dVar231 * dVar208;
                    lVar124 = lVar124 + 1;
                    pLVar126 = pLVar126 + 3;
                  } while (lVar124 != 0x1b);
                  dVar208 = dVar202 * dVar224 - dVar210 * dVar210;
                  dVar231 = dVar224 * dVar215 - dVar214 * dVar210;
                  dVar232 = dVar224 * dVar199 - dVar221 * dVar210;
                  dVar224 = dVar215 * dVar210 - dVar202 * dVar214;
                  local_a28 = dVar214 * dVar224 + (dVar208 * dVar227 - dVar215 * dVar231);
                  dVar208 = (dVar214 * (dVar199 * dVar210 - dVar202 * dVar221) +
                            (dVar208 * dVar229 - dVar215 * dVar232)) / local_a28;
                  if ((pdVar55[lVar120 + lVar173 + lVar143] == 1.0) &&
                     (!NAN(pdVar55[lVar120 + lVar173 + lVar143]))) {
                    if ((pdVar55[lVar120 + lVar173 + (int)((iVar128 + -1) - uVar26)] == 1.0) &&
                       (!NAN(pdVar55[lVar120 + lVar173 + (int)((iVar128 + -1) - uVar26)]))) {
                      if ((pdVar55[lVar120 + lVar173 + (int)((iVar128 + 1) - uVar26)] == 1.0) &&
                         (!NAN(pdVar55[lVar120 + lVar173 + (int)((iVar128 + 1) - uVar26)]))) {
                        dVar222 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2] -
                                  pdVar57[lVar119 + lVar133 + lVar172 * 2 +
                                                              (long)((iVar128 + -1) - iVar29)];
                        dVar223 = pdVar57[lVar119 + lVar133 + lVar172 * 2 +
                                                              (long)((iVar128 + 1) - iVar29)] -
                                  pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                        dVar222 = dVar222 + dVar222;
                        dVar223 = dVar223 + dVar223;
                        dVar208 = (pdVar57[lVar119 + lVar133 + lVar172 * 2 +
                                                               (long)((iVar128 + 1) - iVar29)] -
                                  pdVar57[lVar119 + lVar133 + lVar172 * 2 +
                                                              (long)((iVar128 + -1) - iVar29)]) *
                                  0.5;
                        dVar216 = ABS(dVar222);
                        uVar193 = -(ulong)(0.0 < dVar208);
                        dVar208 = ABS(dVar208);
                        dVar200 = ABS(dVar223);
                        if (dVar216 <= dVar208) {
                          dVar208 = dVar216;
                        }
                        if (dVar208 <= dVar200) {
                          dVar200 = dVar208;
                        }
                        uVar201 = -(ulong)(0.0 < dVar222 * dVar223) & (ulong)dVar200;
                        dVar208 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                          uVar193 & uVar201);
                      }
                    }
                  }
                  dVar200 = dVar215 * dVar221 - dVar214 * dVar199;
                  local_a48 = (dVar214 * dVar200 + (dVar232 * dVar227 - dVar231 * dVar229)) /
                              local_a28;
                  if (((((pdVar55[lVar173 + lVar120 + lVar143] == 1.0) &&
                        (!NAN(pdVar55[lVar173 + lVar120 + lVar143]))) &&
                       (pdVar55[lVar173 + lVar155 + lVar143] == 1.0)) &&
                      ((!NAN(pdVar55[lVar173 + lVar155 + lVar143]) &&
                       (pdVar55[lVar173 + lVar159 + lVar143] == 1.0)))) &&
                     (!NAN(pdVar55[lVar173 + lVar159 + lVar143]))) {
                    dVar216 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2] -
                              pdVar57[lVar172 * 2 + lVar133 + lVar164 + lVar137];
                    dVar222 = pdVar57[lVar172 * 2 + lVar133 + lVar168 + lVar137] -
                              pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    dVar216 = dVar216 + dVar216;
                    dVar222 = dVar222 + dVar222;
                    dVar214 = (pdVar57[lVar172 * 2 + lVar133 + lVar168 + lVar137] -
                              pdVar57[lVar172 * 2 + lVar133 + lVar164 + lVar137]) * 0.5;
                    dVar232 = ABS(dVar216);
                    uVar193 = -(ulong)(0.0 < dVar214);
                    dVar214 = ABS(dVar214);
                    dVar231 = ABS(dVar222);
                    if (dVar232 <= dVar214) {
                      dVar214 = dVar232;
                    }
                    if (dVar214 <= dVar231) {
                      dVar231 = dVar214;
                    }
                    uVar201 = -(ulong)(0.0 < dVar216 * dVar222) & (ulong)dVar231;
                    local_a48 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  local_a28 = (dVar229 * dVar224 +
                              (dVar227 * (dVar202 * dVar221 - dVar210 * dVar199) - dVar200 * dVar215
                              )) / local_a28;
                  if (((pdVar55[lVar120 + lVar143 + lVar173] == 1.0) &&
                      (!NAN(pdVar55[lVar120 + lVar143 + lVar173]))) &&
                     ((pdVar55[lVar120 + lVar143 + lVar112] == 1.0 &&
                      (((!NAN(pdVar55[lVar120 + lVar143 + lVar112]) &&
                        (pdVar55[lVar120 + lVar143 + lVar186] == 1.0)) &&
                       (!NAN(pdVar55[lVar120 + lVar143 + lVar186]))))))) {
                    dVar224 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2] -
                              pdVar57[lVar119 + lVar137 + iVar145 * lVar59 + lVar172 * 2];
                    dVar227 = pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2] -
                              pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    dVar224 = dVar224 + dVar224;
                    dVar227 = dVar227 + dVar227;
                    dVar202 = (pdVar57[lVar119 + lVar137 + lVar134 + lVar172 * 2] -
                              pdVar57[lVar119 + lVar137 + iVar145 * lVar59 + lVar172 * 2]) * 0.5;
                    dVar215 = ABS(dVar224);
                    uVar193 = -(ulong)(0.0 < dVar202);
                    dVar202 = ABS(dVar202);
                    dVar210 = ABS(dVar227);
                    if (dVar215 <= dVar202) {
                      dVar202 = dVar215;
                    }
                    if (dVar202 <= dVar210) {
                      dVar210 = dVar202;
                    }
                    uVar201 = -(ulong)(0.0 < dVar224 * dVar227) & (ulong)dVar210;
                    local_a28 = (double)(~uVar193 & (uVar201 ^ 0x8000000000000000) |
                                        uVar193 & uVar201);
                  }
                  uVar32 = pEVar39[lVar116 + lVar121 + lVar111].flag;
                  iVar102 = 0;
                  iVar179 = 0;
                  iVar162 = 0;
                  iVar146 = 0;
                  uVar156 = 0xffffffff;
                  do {
                    uVar132 = uVar156 + 1;
                    uVar97 = 0xffffffff;
                    iVar181 = iVar102;
                    do {
                      uVar1 = uVar97 + 1;
                      iVar176 = 5;
                      do {
                        if (((uVar32 >> (iVar181 + iVar176 & 0x1fU) & 1) != 0) &&
                           ((iVar176 != 6 || uVar97 != 0) || uVar156 != 0)) {
                          iVar179 = iVar179 + (uint)((iVar176 - 5U & 0xfffffffd) == 0 &&
                                                    (uVar97 == 0 && uVar156 == 0));
                          iVar162 = iVar162 + (uint)((iVar176 == 6 && uVar156 == 0) &&
                                                    (uVar1 & 0xfffffffd) == 0);
                          iVar146 = iVar146 + (uint)((iVar176 == 6 && uVar97 == 0) &&
                                                    (uVar132 & 0xfffffffd) == 0);
                        }
                        iVar176 = iVar176 + 1;
                      } while (iVar176 != 8);
                      iVar181 = iVar181 + 3;
                      uVar97 = uVar1;
                    } while (uVar1 != 2);
                    iVar102 = iVar102 + 9;
                    uVar156 = uVar132;
                  } while (uVar132 != 2);
                  dVar202 = *pdVar4;
                  dVar210 = pdVar4[lVar35];
                  dVar215 = pdVar4[lVar35 * 2];
                  dVar224 = 2.0;
                  if ((uVar32 >> 0x15 & 1) != 0) {
                    dVar227 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    lVar121 = -1;
                    cVar148 = '\b';
                    dVar214 = dVar227;
                    dVar224 = dVar227;
                    do {
                      lVar124 = 0;
                      cVar183 = cVar148;
                      do {
                        lVar167 = -1;
                        do {
                          if ((((int)lVar124 != 0 || (int)lVar121 != 0) || (int)lVar167 != 0) &&
                             ((1 << (cVar183 + (char)lVar167 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar221 = pdVar57[lVar172 * 2 +
                                              (iVar131 + (int)lVar121) * lVar59 +
                                              (iVar100 + (int)lVar124) * lVar58 +
                                              (long)(iVar138 + (int)lVar167)];
                            dVar229 = dVar221;
                            if (dVar221 <= dVar224) {
                              dVar229 = dVar224;
                            }
                            dVar224 = dVar229;
                            if (dVar221 < dVar214) {
                              dVar214 = dVar221;
                            }
                          }
                          lVar167 = lVar167 + 1;
                        } while (lVar167 != 2);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar124 == 0;
                        lVar124 = lVar124 + 1;
                      } while (bVar192);
                      lVar121 = lVar121 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar121 != 2);
                    dVar221 = (((pdVar46 + lVar113 + lVar169 + (iVar128 - iVar20))[lVar48] - dVar215
                               ) * local_a28 +
                              (0.5 - dVar210) * local_a48 +
                              (pdVar46[lVar113 + lVar169 + (iVar128 - iVar20)] - dVar202) * dVar208
                              + dVar227) - dVar227;
                    if (dVar221 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar221 < -1e-13) &&
                         (dVar224 = (dVar214 - dVar227) / dVar221, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar227) / dVar221;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (2.0 <= dVar224) {
                      dVar224 = 2.0;
                    }
                  }
                  dVar227 = dVar224;
                  if ((short)uVar32 < 0) {
                    dVar214 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    lVar121 = -1;
                    cVar148 = '\x05';
                    dVar221 = dVar214;
                    dVar227 = dVar214;
                    do {
                      lVar124 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar167 = -1;
                        dVar229 = dVar227;
                        do {
                          dVar227 = dVar229;
                          if ((((int)lVar124 != 0 || (int)lVar121 != 0) || (int)lVar167 != 0) &&
                             ((1 << (cVar183 + (char)lVar167 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar199 = pdVar57[lVar172 * 2 +
                                              (iVar131 + (int)lVar121) * lVar59 +
                                              (iVar100 + (int)lVar124) * lVar58 +
                                              (long)(iVar138 + (int)lVar167)];
                            dVar227 = dVar199;
                            if (dVar199 <= dVar229) {
                              dVar227 = dVar229;
                            }
                            if (dVar199 < dVar221) {
                              dVar221 = dVar199;
                            }
                          }
                          lVar167 = lVar167 + 1;
                          dVar229 = dVar227;
                        } while (lVar167 != 2);
                        cVar183 = cVar183 + '\x03';
                        bVar192 = lVar124 != 0;
                        lVar124 = lVar124 + 1;
                      } while (bVar192);
                      lVar121 = lVar121 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar121 != 2);
                    dVar229 = (((pdVar46 + lVar113 + lVar174 + (iVar128 - iVar20))[lVar48] - dVar215
                               ) * local_a28 +
                              -(dVar210 + 0.5) * local_a48 +
                              (pdVar46[lVar113 + lVar174 + (iVar128 - iVar20)] - dVar202) * dVar208
                              + dVar214) - dVar214;
                    if (dVar229 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar227 = (dVar221 - dVar214) / dVar229, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar214) / dVar229;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar224 = dVar227;
                  if ((uVar32 >> 0x13 & 1) != 0) {
                    dVar214 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    lVar121 = -1;
                    cVar148 = '\x06';
                    dVar221 = dVar214;
                    dVar224 = dVar214;
                    do {
                      lVar124 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar167 = 0;
                        do {
                          if ((((int)lVar124 != 0 || (int)lVar121 != 0) || (int)lVar167 != 0) &&
                             ((1 << (cVar183 + (char)lVar167 & 0x1fU) & uVar32) != 0)) {
                            dVar229 = pdVar57[lVar172 * 2 +
                                              (iVar131 + (int)lVar121) * lVar59 +
                                              (iVar100 + (int)lVar124) * lVar58 +
                                              (long)(iVar138 + (int)lVar167)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar224) {
                              dVar199 = dVar224;
                            }
                            dVar224 = dVar199;
                            if (dVar229 < dVar221) {
                              dVar221 = dVar229;
                            }
                          }
                          lVar167 = lVar167 + 1;
                        } while (lVar167 == 1);
                        lVar124 = lVar124 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar124 != 2);
                      lVar121 = lVar121 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar121 != 2);
                    dVar229 = (((pdVar42 + lVar114 + lVar136 + ((iVar128 - iVar17) + 1))[lVar45] -
                               dVar215) * local_a28 +
                              (pdVar42[lVar114 + lVar136 + ((iVar128 - iVar17) + 1)] - dVar210) *
                              local_a48 + (0.5 - dVar202) * dVar208 + dVar214) - dVar214;
                    if (dVar229 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar224 = (dVar221 - dVar214) / dVar229, 1.0 <= dVar224)) {
                        dVar224 = 1.0;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar214) / dVar229;
                      if (1.0 <= dVar224) {
                        dVar224 = 1.0;
                      }
                    }
                    if (dVar227 <= dVar224) {
                      dVar224 = dVar227;
                    }
                  }
                  dVar227 = dVar224;
                  if ((uVar32 >> 0x11 & 1) != 0) {
                    dVar214 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    lVar121 = -1;
                    cVar148 = '\x05';
                    dVar221 = dVar214;
                    dVar227 = dVar214;
                    do {
                      lVar124 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar167 = -1;
                        do {
                          if ((((int)lVar124 != 0 || (int)lVar121 != 0) || (int)lVar167 != 0) &&
                             ((1 << (cVar183 + (char)lVar167 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar229 = pdVar57[lVar172 * 2 +
                                              (iVar131 + (int)lVar121) * lVar59 +
                                              (iVar100 + (int)lVar124) * lVar58 +
                                              (long)(iVar138 + (int)lVar167)];
                            dVar199 = dVar229;
                            if (dVar229 <= dVar227) {
                              dVar199 = dVar227;
                            }
                            dVar227 = dVar199;
                            if (dVar229 < dVar221) {
                              dVar221 = dVar229;
                            }
                          }
                          lVar167 = lVar167 + 1;
                        } while (lVar167 != 1);
                        lVar124 = lVar124 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar124 != 2);
                      lVar121 = lVar121 + 1;
                      cVar148 = cVar148 + '\t';
                    } while (lVar121 != 2);
                    dVar229 = (((pdVar42 + lVar114 + lVar136 + (iVar128 - iVar17))[lVar45] - dVar215
                               ) * local_a28 +
                              (pdVar42[lVar114 + lVar136 + (iVar128 - iVar17)] - dVar210) *
                              local_a48 + (dVar214 - (dVar202 + 0.5) * dVar208)) - dVar214;
                    if (dVar229 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar229 < -1e-13) &&
                         (dVar227 = (dVar221 - dVar214) / dVar229, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar214) / dVar229;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar214 = 1.0;
                  dVar224 = dVar227;
                  if ((uVar32 >> 0x1b & 1) != 0) {
                    dVar221 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    cVar148 = '\x0e';
                    lVar121 = 0;
                    dVar229 = dVar221;
                    dVar224 = dVar221;
                    do {
                      lVar124 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar167 = -1;
                        do {
                          if ((((int)lVar124 != 0 || (int)lVar121 != 0) || (int)lVar167 != 0) &&
                             ((1 << (cVar183 + (char)lVar167 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar199 = pdVar57[lVar172 * 2 +
                                              (iVar131 + (int)lVar121) * lVar59 +
                                              (iVar100 + (int)lVar124) * lVar58 +
                                              (long)(iVar138 + (int)lVar167)];
                            dVar231 = dVar199;
                            if (dVar199 <= dVar224) {
                              dVar231 = dVar224;
                            }
                            dVar224 = dVar231;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar167 = lVar167 + 1;
                        } while (lVar167 != 2);
                        lVar124 = lVar124 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar124 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar121 == 0;
                      lVar121 = lVar121 + 1;
                    } while (bVar192);
                    dVar199 = ((0.5 - dVar215) * local_a28 +
                              (pdVar104[lVar52] - dVar210) * local_a48 +
                              (*pdVar104 - dVar202) * dVar208 + dVar221) - dVar221;
                    if (dVar199 <= 1e-13) {
                      dVar224 = 1.0;
                      if ((dVar199 < -1e-13) &&
                         (dVar224 = (dVar229 - dVar221) / dVar199, 1.0 <= dVar224)) {
                        dVar224 = dVar214;
                      }
                    }
                    else {
                      dVar224 = (dVar224 - dVar221) / dVar199;
                      if (1.0 <= dVar224) {
                        dVar224 = dVar214;
                      }
                    }
                    if (dVar227 <= dVar224) {
                      dVar224 = dVar227;
                    }
                  }
                  dVar227 = dVar224;
                  if ((uVar32 >> 9 & 1) != 0) {
                    dVar221 = pdVar57[lVar119 + lVar137 + lVar133 + lVar172 * 2];
                    cVar148 = '\x05';
                    lVar121 = -1;
                    dVar227 = dVar221;
                    dVar229 = dVar221;
                    do {
                      lVar124 = -1;
                      cVar183 = cVar148;
                      do {
                        lVar167 = -1;
                        do {
                          if ((((int)lVar124 != 0 || (int)lVar121 != 0) || (int)lVar167 != 0) &&
                             ((1 << (cVar183 + (char)lVar167 + 1U & 0x1f) & uVar32) != 0)) {
                            dVar199 = pdVar57[lVar172 * 2 +
                                              (iVar131 + (int)lVar121) * lVar59 +
                                              (iVar100 + (int)lVar124) * lVar58 +
                                              (long)(iVar138 + (int)lVar167)];
                            dVar231 = dVar199;
                            if (dVar199 <= dVar227) {
                              dVar231 = dVar227;
                            }
                            dVar227 = dVar231;
                            if (dVar199 < dVar229) {
                              dVar229 = dVar199;
                            }
                          }
                          lVar167 = lVar167 + 1;
                        } while (lVar167 != 2);
                        lVar124 = lVar124 + 1;
                        cVar183 = cVar183 + '\x03';
                      } while (lVar124 != 2);
                      cVar148 = cVar148 + '\t';
                      bVar192 = lVar121 != 0;
                      lVar121 = lVar121 + 1;
                    } while (bVar192);
                    dVar202 = ((((pdVar49 + lVar117 + lVar122 + (iVar170 - iVar24) * lVar51)[lVar52]
                                - dVar210) * local_a48 +
                               (pdVar49[lVar117 + lVar122 + (iVar170 - iVar24) * lVar51] - dVar202)
                               * dVar208 + dVar221) - (dVar215 + 0.5) * local_a28) - dVar221;
                    if (dVar202 <= 1e-13) {
                      dVar227 = dVar214;
                      if ((dVar202 < -1e-13) &&
                         (dVar227 = (dVar229 - dVar221) / dVar202, 1.0 <= dVar227)) {
                        dVar227 = dVar214;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar221) / dVar202;
                      if (1.0 <= dVar227) {
                        dVar227 = dVar214;
                      }
                    }
                    if (dVar224 <= dVar227) {
                      dVar227 = dVar224;
                    }
                  }
                  dVar202 = 0.0;
                  if (1 < iVar179) {
                    dVar202 = dVar227;
                  }
                  dVar210 = 0.0;
                  if (1 < iVar162) {
                    dVar210 = dVar227;
                  }
                  dVar215 = 0.0;
                  if (1 < iVar146) {
                    dVar215 = dVar227;
                  }
                  dVar224 = pdVar55[lVar120 + lVar143 + lVar173];
                  if ((((dVar224 == 1.0) && (!NAN(dVar224))) &&
                      (pdVar55[lVar120 + lVar173 + (int)(~uVar26 + iVar128)] == 1.0)) &&
                     (((!NAN(pdVar55[lVar120 + lVar173 + (int)(~uVar26 + iVar128)]) &&
                       (pdVar55[lVar120 + lVar173 + (iVar101 + 1)] == 1.0)) &&
                      (!NAN(pdVar55[lVar120 + lVar173 + (iVar101 + 1)]))))) {
                    dVar202 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     ((pdVar55[lVar173 + lVar147 + lVar143] == 1.0 &&
                      (((!NAN(pdVar55[lVar173 + lVar147 + lVar143]) &&
                        (pdVar55[lVar173 + lVar141 + lVar143] == 1.0)) &&
                       (!NAN(pdVar55[lVar173 + lVar141 + lVar143]))))))) {
                    dVar210 = 1.0;
                  }
                  if (((dVar224 == 1.0) && (!NAN(dVar224))) &&
                     (((pdVar55[lVar120 + lVar143 + lVar115] == 1.0 &&
                       ((!NAN(pdVar55[lVar120 + lVar143 + lVar115]) &&
                        (pdVar55[lVar120 + lVar143 + lVar186] == 1.0)))) &&
                      (!NAN(pdVar55[lVar120 + lVar143 + lVar186]))))) {
                    dVar215 = 1.0;
                  }
                  dVar203 = (dVar203 - dVar209) * dVar208 * dVar202 + dVar6 +
                            (dVar207 - dVar5) * local_a48 * dVar210 +
                            (0.5 - dVar7) * local_a28 * dVar215;
                  if (dVar203 <= dVar194) {
                    dVar194 = dVar203;
                  }
                  if (dVar228 <= dVar194) {
                    dVar228 = dVar194;
                  }
                  iVar101 = d_bcrec[2].bc[5];
                  if (iVar9 == iVar189) {
                    switch(d_bcrec[2].bc[2]) {
                    case 3:
                      iVar179 = ~uVar31 + iVar9;
LAB_0046b6c0:
                      dVar230 = pdVar57[lVar119 + lVar137 + iVar179 * lVar59 + lVar172 * 2];
                    case 1:
                    case 2:
                    case 4:
                      dVar228 = dVar230;
                      dVar230 = dVar228;
                      break;
                    case -1:
switchD_0046b672_caseD_ffffffff:
                      dVar228 = 0.0;
                      dVar230 = 0.0;
                    }
                  }
                  else if (iVar139 == iVar189) {
                    switch(iVar101) {
                    case 1:
                    case 2:
                    case 4:
                      dVar230 = dVar228;
                      break;
                    case 3:
                      iVar179 = iVar139 - uVar31;
                      goto LAB_0046b6c0;
                    case -1:
                      goto switchD_0046b672_caseD_ffffffff;
                    }
                  }
                  dVar207 = dVar230;
                  if ((iVar9 == iVar189) &&
                     (((d_bcrec[2].bc[2] == 4 || (d_bcrec[2].bc[2] == 2)) &&
                      (dVar228 = 0.0, dVar207 = 0.0, dVar230 <= 0.0)))) {
                    dVar228 = dVar230;
                    dVar207 = dVar230;
                  }
                  dVar203 = dVar228;
                  if (((iVar139 == iVar189) && ((iVar101 == 4 || (iVar101 == 2)))) &&
                     (dVar203 = 0.0, dVar207 = 0.0, 0.0 <= dVar228)) {
                    dVar203 = dVar228;
                    dVar207 = dVar228;
                  }
                  auVar198 = _DAT_0077bb40;
                  if ((0.0 <= dVar203) || (dVar207 <= 0.0)) {
                    dVar202 = (dVar207 + dVar203) * 0.5;
                    if ((dVar202 < 1e-08) && (dVar203 = 0.0, dVar202 <= -1e-08)) {
                      dVar203 = dVar207;
                    }
                  }
                  else {
                    dVar203 = 0.0;
                  }
                }
                pdVar36[((long)iVar189 - (long)iVar184) * lVar38 +
                        (lVar135 - iVar14) * lVar37 + (lVar142 - iVar13)] = dVar203;
                iVar171 = iVar171 + 1;
                iVar127 = iVar127 + 1;
                iVar138 = iVar138 + 1;
                bVar192 = iVar128 != iVar149;
                iVar128 = iVar128 + 1;
              } while (bVar192);
            }
            bVar192 = iVar157 != iVar12;
            iVar157 = iVar157 + 1;
          } while (bVar192);
        }
        iVar98 = iVar98 + 1;
        bVar192 = iVar189 != iVar150;
        iVar189 = iVar189 + 1;
      } while (bVar192);
    }
  }
  return;
}

Assistant:

void
EBMOL::ExtrapVelToFacesBox ( AMREX_D_DECL( Box const& ubx,
                                           Box const& vbx,
                                           Box const& wbx ),
                             AMREX_D_DECL( Array4<Real> const& u,
                                           Array4<Real> const& v,
                                           Array4<Real> const& w ),
                             Array4<Real const> const& vcc,
                             Array4<EBCellFlag const> const& flag,
                             AMREX_D_DECL( Array4<Real const> const& fcx,
                                           Array4<Real const> const& fcy,
                                           Array4<Real const> const& fcz ),
                             Array4<Real const> const& ccc,
                             Array4<Real const> const& vfrac,
                             const Geometry&  geom,
                             Vector<BCRec> const& h_bcrec,
                             const BCRec* d_bcrec )
{

    const Box& domain_box = geom.Domain();
    AMREX_D_TERM(
        const int domain_ilo = domain_box.smallEnd(0);
        const int domain_ihi = domain_box.bigEnd(0);,
        const int domain_jlo = domain_box.smallEnd(1);
        const int domain_jhi = domain_box.bigEnd(1);,
        const int domain_klo = domain_box.smallEnd(2);
        const int domain_khi = domain_box.bigEnd(2););

    int order = 2;

    // ****************************************************************************
    // Decide whether the stencil at each cell might need to see values that
    //     live on face centroids rather than cell centroids, i.e.
    //     are at a domain boundary with ext_dir or hoextrap boundary conditions
    // ****************************************************************************


    int n_for_xbc = 0;

    auto extdir_lohi_x_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_u = extdir_lohi_x_for_u.first;
    bool has_extdir_or_ho_hi_x_for_u = extdir_lohi_x_for_u.second;

    auto extdir_lohi_y_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_u = extdir_lohi_y_for_u.first;
    bool has_extdir_or_ho_hi_y_for_u = extdir_lohi_y_for_u.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_u = has_extdir_or_ho(h_bcrec.data(), n_for_xbc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_u = extdir_lohi_z_for_u.first;
    bool has_extdir_or_ho_hi_z_for_u = extdir_lohi_z_for_u.second;
#endif



    // ****************************************************************************
    // Predict to x-faces
    // ****************************************************************************
    if ((has_extdir_or_ho_lo_x_for_u && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_u && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_u && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_u && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_u && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_u && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(ubx),
        [u,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
         AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real u_val(0);

            AMREX_D_TERM(bool extdir_or_ho_ilo = (d_bcrec[0].lo(0) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jlo = (d_bcrec[0].lo(1) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(1) == BCType::hoextrap);,
                         bool extdir_or_ho_klo = (d_bcrec[0].lo(2) == BCType::ext_dir) ||
                                                 (d_bcrec[0].lo(2) == BCType::hoextrap););

            AMREX_D_TERM(bool extdir_or_ho_ihi = (d_bcrec[0].hi(0) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jhi = (d_bcrec[0].hi(1) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(1) == BCType::hoextrap);,
                         bool extdir_or_ho_khi = (d_bcrec[0].hi(2) == BCType::ext_dir) ||
                                                 (d_bcrec[0].hi(2) == BCType::hoextrap););

            if (flag(i,j,k).isConnected(-1,0,0))
            {
               Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcx(i,j,k,1);
#endif
               AMREX_D_TERM(Real delta_x = 0.5 + ccc(i,j,k,0);,
                            Real delta_y = yf  - ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               Real vcc_mns = vcc(i-1,j,k,0);
               Real vcc_pls = vcc(i,j,k,0);

               Real cc_umax = amrex::max(vcc_pls, vcc_mns);
               Real cc_umin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,0,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1];
#endif
               upls = amrex::max(amrex::min(upls, cc_umax), cc_umin);

               AMREX_D_TERM(delta_x = 0.5 - ccc(i-1,j,k,0);,
                            delta_y = yf  - ccc(i-1,j,k,1);,
                            delta_z = zf  - ccc(i-1,j,k,2););

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i-1,j,k,0,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif
               umns = amrex::max(amrex::min(umns, cc_umax), cc_umin);

               HydroBC::SetXEdgeBCs(i, j, k, 0, vcc, umns, upls, d_bcrec[0].lo(0), domain_ilo, d_bcrec[0].hi(0), domain_ihi, true);

               if ( (i==domain_ilo) && (d_bcrec[0].lo(0) == BCType::foextrap || d_bcrec[0].lo(0) == BCType::hoextrap) )
               {
                   upls = amrex::min(upls,0.0_rt);
                   umns = upls;
               }
               if ( (i==domain_ihi+1) && (d_bcrec[0].hi(0) == BCType::foextrap || d_bcrec[0].hi(0) == BCType::hoextrap) )
               {
                    umns = amrex::max(umns,0.0_rt);
                    upls = umns;
               }

               if ( umns >= 0.0 || upls <= 0.0 ) {
                  Real avg = 0.5 * ( upls + umns );

                  if (avg >= small_vel) {
                    u_val = umns;
                  }
                  else if (avg <= -small_vel) {
                    u_val = upls;
                  }
               }

               if (i == domain_ilo && (d_bcrec[0].lo(0) == BCType::ext_dir)) {
                   u_val = vcc_mns;
               } else if (i == domain_ihi+1 && (d_bcrec[0].hi(0) == BCType::ext_dir)) {
                   u_val = vcc_pls;
               }
            }

            u(i,j,k) = u_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(ubx),
        [u,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_ilo,domain_ihi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real u_val(0);

            if (flag(i,j,k).isConnected(-1,0,0))
            {
               Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcx(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = 0.5 + ccc(i,j,k,0);,
                            Real delta_y = yf  - ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i-1,j,k,0);
               const Real vcc_pls = vcc(i,j,k,0);

               Real cc_umax = amrex::max(vcc_pls, vcc_mns);
               Real cc_umin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "0" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,0,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real upls = vcc_pls - delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1];
#endif
               upls = amrex::max(amrex::min(upls, cc_umax), cc_umin);

               AMREX_D_TERM(delta_x = 0.5 - ccc(i-1,j,k,0);,
                            delta_y = yf  - ccc(i-1,j,k,1);,
                            delta_z = zf  - ccc(i-1,j,k,2););

               // Compute slopes of component "0" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i-1,j,k,0,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real umns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif
               umns = amrex::max(amrex::min(umns, cc_umax), cc_umin);

               HydroBC::SetXEdgeBCs(i, j, k, 0, vcc, umns, upls, d_bcrec[0].lo(0), domain_ilo, d_bcrec[0].hi(0), domain_ihi, true);

               if ( (i==domain_ilo) && (d_bcrec[0].lo(0) == BCType::foextrap || d_bcrec[0].lo(0) == BCType::hoextrap) )
               {
                   upls = amrex::min(upls,0.0_rt);
                   umns = upls;
               }
               if ( (i==domain_ihi+1) && (d_bcrec[0].hi(0) == BCType::foextrap || d_bcrec[0].hi(0) == BCType::hoextrap) )
               {
                    umns = amrex::max(umns,0.0_rt);
                    upls = umns;
               }

               if ( umns >= 0.0 || upls <= 0.0 ) {
                  Real avg = 0.5 * ( upls + umns );

                  if (avg >= small_vel) {
                    u_val = umns;
                  }
                  else if (avg <= -small_vel) {
                    u_val = upls;
                  }
               }
            }

            u(i,j,k) = u_val;
        });
    }

    // ****************************************************************************
    // Predict to y-faces
    // ****************************************************************************

    int n_for_ybc = 1;

    auto extdir_lohi_x_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_v = extdir_lohi_x_for_v.first;
    bool has_extdir_or_ho_hi_x_for_v = extdir_lohi_x_for_v.second;

    auto extdir_lohi_y_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_v = extdir_lohi_y_for_v.first;
    bool has_extdir_or_ho_hi_y_for_v = extdir_lohi_y_for_v.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_v = has_extdir_or_ho(h_bcrec.data(), n_for_ybc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_v = extdir_lohi_z_for_v.first;
    bool has_extdir_or_ho_hi_z_for_v = extdir_lohi_z_for_v.second;
#endif

    if ((has_extdir_or_ho_lo_x_for_v && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_v && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_v && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_v && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_v && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_v && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(vbx),
        [v,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
         AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real v_val(0);

            AMREX_D_TERM(bool extdir_or_ho_ilo = (d_bcrec[1].lo(0) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jlo = (d_bcrec[1].lo(1) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(1) == BCType::hoextrap);,
                         bool extdir_or_ho_klo = (d_bcrec[1].lo(2) == BCType::ext_dir) ||
                                                 (d_bcrec[1].lo(2) == BCType::hoextrap););

            AMREX_D_TERM(bool extdir_or_ho_ihi = (d_bcrec[1].hi(0) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(0) == BCType::hoextrap);,
                         bool extdir_or_ho_jhi = (d_bcrec[1].hi(1) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(1) == BCType::hoextrap);,
                         bool extdir_or_ho_khi = (d_bcrec[1].hi(2) == BCType::ext_dir) ||
                                                 (d_bcrec[1].hi(2) == BCType::hoextrap););

            if (flag(i,j,k).isConnected(0,-1,0))
            {
               Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcy(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = xf  - ccc(i,j,k,0);,
                            Real delta_y = 0.5 + ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i,j-1,k,1);
               const Real vcc_pls = vcc(i,j,k,1);

               Real cc_vmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_vmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,1,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1];
#endif

               vpls = amrex::max(amrex::min(vpls, cc_vmax), cc_vmin);

               AMREX_D_TERM(delta_x = xf  - ccc(i,j-1,k,0);,
                            delta_y = 0.5 - ccc(i,j-1,k,1);,
                            delta_z = zf  - ccc(i,j-1,k,2););

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,1,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

#if (AMREX_SPACEDIM == 3)
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif

               vmns = amrex::max(amrex::min(vmns, cc_vmax), cc_vmin);

               HydroBC::SetYEdgeBCs(i, j, k, 1, vcc, vmns, vpls, d_bcrec[1].lo(1), domain_jlo, d_bcrec[1].hi(1), domain_jhi, true);

               if ( (j==domain_jlo) && (d_bcrec[1].lo(1) == BCType::foextrap || d_bcrec[1].lo(1) == BCType::hoextrap) )
               {
                   vpls = amrex::min(vpls,0.0_rt);
                   vmns = vpls;
               }
               if ( (j==domain_jhi+1) && (d_bcrec[1].hi(1) == BCType::foextrap || d_bcrec[1].hi(1) == BCType::hoextrap) )
               {
                    vmns = amrex::max(vmns,0.0_rt);
                    vpls = vmns;
               }

               if ( vmns >= 0.0 || vpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( vpls + vmns );

                  if (avg >= small_vel) {
                    v_val = vmns;
                  }
                  else if (avg <= -small_vel) {
                    v_val = vpls;
                  }
               }

               if (j == domain_jlo && (d_bcrec[1].lo(1) == BCType::ext_dir)) {
                   v_val = vcc_mns;
               }
               else if (j == domain_jhi+1 && (d_bcrec[1].hi(1) == BCType::ext_dir)) {
                   v_val = vcc_pls;
               }
            }

            v(i,j,k) = v_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(vbx),
        [v,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_jlo,domain_jhi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real v_val(0);

            if (flag(i,j,k).isConnected(0,-1,0))
            {
               Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
               Real zf = fcy(i,j,k,1);
#endif

               AMREX_D_TERM(Real delta_x = xf  - ccc(i,j,k,0);,
                            Real delta_y = 0.5 + ccc(i,j,k,1);,
                            Real delta_z = zf  - ccc(i,j,k,2););

               const Real vcc_mns = vcc(i,j-1,k,1);
               const Real vcc_pls = vcc(i,j,k,1);

               Real cc_vmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_vmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "1" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,1,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1]
                                   + delta_z * slopes_eb_hi[2];
#else
               Real vpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   - delta_y * slopes_eb_hi[1];
#endif

               vpls = amrex::max(amrex::min(vpls, cc_vmax), cc_vmin);

               AMREX_D_TERM(delta_x = xf  - ccc(i,j-1,k,0);,
                            delta_y = 0.5 - ccc(i,j-1,k,1);,
                            delta_z = zf  - ccc(i,j-1,k,2););

               // Compute slopes of component "1" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,1,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

#if (AMREX_SPACEDIM == 3)
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];
#else
               Real vmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1];
#endif

               vmns = amrex::max(amrex::min(vmns, cc_vmax), cc_vmin);

               HydroBC::SetYEdgeBCs(i, j, k, 1, vcc, vmns, vpls, d_bcrec[1].lo(1), domain_jlo, d_bcrec[1].hi(1), domain_jhi, true);

               if ( (j==domain_jlo) && (d_bcrec[1].lo(1) == BCType::foextrap || d_bcrec[1].lo(1) == BCType::hoextrap) )
               {
                   vpls = amrex::min(vpls,0.0_rt);
                   vmns = vpls;
               }
               if ( (j==domain_jhi+1) && (d_bcrec[1].hi(1) == BCType::foextrap || d_bcrec[1].hi(1) == BCType::hoextrap) )
               {
                    vmns = amrex::max(vmns,0.0_rt);
                    vpls = vmns;
               }

               if ( vmns >= 0.0 || vpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( vpls + vmns );

                  if (avg >= small_vel) {
                    v_val = vmns;
                  }
                  else if (avg <= -small_vel) {
                    v_val = vpls;
                  }
               }
            }

            v(i,j,k) = v_val;
        });
    }

#if (AMREX_SPACEDIM == 3)
    // ****************************************************************************
    // Predict to z-faces
    // ****************************************************************************

    int n_for_zbc = 2;

    auto extdir_lohi_x_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x_for_w = extdir_lohi_x_for_w.first;
    bool has_extdir_or_ho_hi_x_for_w = extdir_lohi_x_for_w.second;

    auto extdir_lohi_y_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y_for_w = extdir_lohi_y_for_w.first;
    bool has_extdir_or_ho_hi_y_for_w = extdir_lohi_y_for_w.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z_for_w = has_extdir_or_ho(h_bcrec.data(), n_for_zbc, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z_for_w = extdir_lohi_z_for_w.first;
    bool has_extdir_or_ho_hi_z_for_w = extdir_lohi_z_for_w.second;
#endif

    if ((has_extdir_or_ho_lo_x_for_w && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x_for_w && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y_for_w && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y_for_w && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z_for_w && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z_for_w && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {
        amrex::ParallelFor(Box(wbx),
        [w,vcc,flag,ccc,vfrac,d_bcrec,
         AMREX_D_DECL(fcx,fcy,fcz),
         domain_ilo,domain_ihi,domain_jlo,domain_jhi,domain_klo,domain_khi,
         order]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real w_val(0);

            bool extdir_or_ho_ilo = (d_bcrec[2].lo(0) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(0) == BCType::hoextrap);
            bool extdir_or_ho_ihi = (d_bcrec[2].hi(0) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(0) == BCType::hoextrap);

            bool extdir_or_ho_jlo = (d_bcrec[2].lo(1) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(1) == BCType::hoextrap);
            bool extdir_or_ho_jhi = (d_bcrec[2].hi(1) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(1) == BCType::hoextrap);

            bool extdir_or_ho_klo = (d_bcrec[2].lo(2) == BCType::ext_dir) ||
                                    (d_bcrec[2].lo(2) == BCType::hoextrap);
            bool extdir_or_ho_khi = (d_bcrec[2].hi(2) == BCType::ext_dir) ||
                                    (d_bcrec[2].hi(2) == BCType::hoextrap);

            if (flag(i,j,k).isConnected(0,0,-1))
            {
               Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
               Real yf = fcz(i,j,k,1);

               Real delta_x = xf  - ccc(i,j,k,0);
               Real delta_y = yf  - ccc(i,j,k,1);
               Real delta_z = 0.5 + ccc(i,j,k,2);

               const Real vcc_mns = vcc(i,j,k-1,2);
               const Real vcc_pls = vcc(i,j,k,2);

               Real cc_wmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_wmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,2,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

               Real wpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   - delta_z * slopes_eb_hi[2];

               wpls = amrex::max(amrex::min(wpls, cc_wmax), cc_wmin);

               delta_x = xf  - ccc(i,j,k-1,0);
               delta_y = yf  - ccc(i,j,k-1,1);
               delta_z = 0.5 - ccc(i,j,k-1,2);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j,k-1,2,vcc,ccc,vfrac,
                                          AMREX_D_DECL(fcx,fcy,fcz), flag,
                                          AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                          AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                          AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                          AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                          order);

               Real wmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];

               wmns = amrex::max(amrex::min(wmns, cc_wmax), cc_wmin);

               HydroBC::SetZEdgeBCs(i, j, k, 2, vcc, wmns, wpls, d_bcrec[2].lo(2), domain_klo, d_bcrec[2].hi(2), domain_khi, true);

               if ( (k==domain_klo) && (d_bcrec[2].lo(2) == BCType::foextrap || d_bcrec[2].lo(2) == BCType::hoextrap) )
               {
                   wpls = amrex::min(wpls,0.0_rt);
                   wmns = wpls;
               }
               if ( (k==domain_khi+1) && (d_bcrec[2].hi(2) == BCType::foextrap || d_bcrec[2].hi(2) == BCType::hoextrap) )
               {
                    wmns = amrex::max(wmns,0.0_rt);
                    wpls = wmns;
               }

               if ( wmns >= 0.0 || wpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( wpls + wmns );

                  if (avg >= small_vel) {
                    w_val = wmns;
                  }
                  else if (avg <= -small_vel) {
                    w_val = wpls;
                  }
               }

                if (k == domain_klo && (d_bcrec[2].lo(2) == BCType::ext_dir)) {
                    w_val = vcc_mns;
                }
                else if (k == domain_khi+1 && (d_bcrec[2].hi(2) == BCType::ext_dir)) {
                    w_val = vcc_pls;
                }
            }

            w(i,j,k) = w_val;
        });
    }
    else
    {
        amrex::ParallelFor(Box(wbx),
        [w,vcc,flag,AMREX_D_DECL(fcx,fcy,fcz),ccc,vfrac,order,d_bcrec,domain_klo,domain_khi]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real w_val(0);

            if (flag(i,j,k).isConnected(0,0,-1))
            {
               Real xf = fcz(i,j,k,0); // local (x,y) of centroid of z-face we are extrapolating to
               Real yf = fcz(i,j,k,1);

               Real delta_x = xf  - ccc(i,j,k,0);
               Real delta_y = yf  - ccc(i,j,k,1);
               Real delta_z = 0.5 + ccc(i,j,k,2);

               const Real vcc_mns = vcc(i,j,k-1,2);
               const Real vcc_pls = vcc(i,j,k,2);

               Real cc_wmax = amrex::max(vcc_pls, vcc_mns);
               Real cc_wmin = amrex::min(vcc_pls, vcc_mns);

               // Compute slopes of component "2" of vcc
               const auto slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,2,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

               Real wpls = vcc_pls + delta_x * slopes_eb_hi[0]
                                   + delta_y * slopes_eb_hi[1]
                                   - delta_z * slopes_eb_hi[2];

               wpls = amrex::max(amrex::min(wpls, cc_wmax), cc_wmin);

               delta_x = xf  - ccc(i,j,k-1,0);
               delta_y = yf  - ccc(i,j,k-1,1);
               delta_z = 0.5 - ccc(i,j,k-1,2);

               // Compute slopes of component "2" of vcc
               const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j,k-1,2,vcc,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz),flag,order);

               Real wmns = vcc_mns + delta_x * slopes_eb_lo[0]
                                   + delta_y * slopes_eb_lo[1]
                                   + delta_z * slopes_eb_lo[2];

               wmns = amrex::max(amrex::min(wmns, cc_wmax), cc_wmin);

               HydroBC::SetZEdgeBCs(i, j, k, 2, vcc, wmns, wpls, d_bcrec[2].lo(2), domain_klo, d_bcrec[2].hi(2), domain_khi, true);

               if ( (k==domain_klo) && (d_bcrec[2].lo(2) == BCType::foextrap || d_bcrec[2].lo(2) == BCType::hoextrap) )
               {
                   wpls = amrex::min(wpls,0.0_rt);
                   wmns = wpls;
               }
               if ( (k==domain_khi+1) && (d_bcrec[2].hi(2) == BCType::foextrap || d_bcrec[2].hi(2) == BCType::hoextrap) )
               {
                    wmns = amrex::max(wmns,0.0_rt);
                    wpls = wmns;
               }

               if ( wmns >= 0.0 || wpls <= 0.0_rt ) {
                  Real avg = 0.5 * ( wpls + wmns );

                  if (avg >= small_vel) {
                    w_val = wmns;
                  }
                  else if (avg <= -small_vel) {
                    w_val = wpls;
                  }
               }
            }

            w(i,j,k) = w_val;
        });
    }
#endif
}